

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2-template-64.h
# Opt level: O0

void fill_block(__m256i *s,block *ref_block,block *next_block,int with_xor)

{
  undefined1 (*pauVar1) [24];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  __m256i y;
  __m256i y_00;
  __m256i y_01;
  __m256i y_02;
  __m256i y_03;
  __m256i y_04;
  __m256i y_05;
  __m256i y_06;
  __m256i y_07;
  __m256i y_08;
  __m256i y_09;
  __m256i y_10;
  __m256i y_11;
  __m256i y_12;
  __m256i y_13;
  __m256i y_14;
  __m256i y_15;
  __m256i y_16;
  __m256i y_17;
  __m256i y_18;
  __m256i y_19;
  __m256i y_20;
  __m256i y_21;
  __m256i y_22;
  __m256i y_23;
  __m256i y_24;
  __m256i y_25;
  __m256i y_26;
  __m256i y_27;
  __m256i y_28;
  __m256i y_29;
  __m256i y_30;
  __m256i x;
  __m256i x_00;
  __m256i x_01;
  __m256i x_02;
  __m256i x_03;
  __m256i x_04;
  __m256i x_05;
  __m256i x_06;
  __m256i x_07;
  __m256i x_08;
  __m256i x_09;
  __m256i x_10;
  __m256i x_11;
  __m256i x_12;
  __m256i x_13;
  __m256i x_14;
  __m256i x_15;
  __m256i x_16;
  __m256i x_17;
  __m256i x_18;
  __m256i x_19;
  __m256i x_20;
  __m256i x_21;
  __m256i x_22;
  __m256i x_23;
  __m256i x_24;
  __m256i x_25;
  __m256i x_26;
  __m256i x_27;
  __m256i x_28;
  __m256i x_29;
  __m256i x_30;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [24];
  ulong *puVar26;
  undefined8 *puVar27;
  undefined1 (*pauVar28) [32];
  undefined1 (*pauVar29) [32];
  ulong *puVar30;
  int in_ECX;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  undefined8 *puVar34;
  long in_RDX;
  undefined1 in_SIL;
  undefined7 in_register_00000031;
  undefined1 in_DIL;
  undefined7 in_register_00000039;
  undefined8 uVar35;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  __m256i tmp2_1;
  __m256i tmp1_1;
  __m256i tmp2;
  __m256i tmp1;
  uint i;
  __m256i block_XY [32];
  undefined1 in_stack_ffffffffffffe058;
  undefined1 in_stack_ffffffffffffe059;
  undefined1 in_stack_ffffffffffffe05a;
  undefined1 in_stack_ffffffffffffe05b;
  undefined1 in_stack_ffffffffffffe05c;
  undefined1 in_stack_ffffffffffffe05d;
  undefined1 in_stack_ffffffffffffe05e;
  undefined1 in_stack_ffffffffffffe05f;
  undefined1 in_stack_ffffffffffffe060;
  undefined1 in_stack_ffffffffffffe061;
  undefined1 in_stack_ffffffffffffe062;
  undefined1 in_stack_ffffffffffffe063;
  undefined1 in_stack_ffffffffffffe064;
  undefined1 in_stack_ffffffffffffe065;
  undefined1 in_stack_ffffffffffffe066;
  undefined1 in_stack_ffffffffffffe067;
  undefined1 in_stack_ffffffffffffe068;
  undefined1 in_stack_ffffffffffffe069;
  undefined1 in_stack_ffffffffffffe06a;
  undefined1 in_stack_ffffffffffffe06b;
  undefined1 in_stack_ffffffffffffe06c;
  undefined1 in_stack_ffffffffffffe06d;
  undefined1 in_stack_ffffffffffffe06e;
  undefined1 in_stack_ffffffffffffe06f;
  undefined1 in_stack_ffffffffffffe070;
  undefined1 in_stack_ffffffffffffe071;
  undefined1 in_stack_ffffffffffffe072;
  undefined1 in_stack_ffffffffffffe073;
  undefined1 in_stack_ffffffffffffe074;
  undefined1 in_stack_ffffffffffffe075;
  undefined1 in_stack_ffffffffffffe076;
  undefined1 in_stack_ffffffffffffe077;
  undefined1 in_stack_ffffffffffffe078;
  undefined1 in_stack_ffffffffffffe079;
  undefined1 in_stack_ffffffffffffe07a;
  undefined1 in_stack_ffffffffffffe07b;
  undefined1 in_stack_ffffffffffffe07c;
  undefined1 in_stack_ffffffffffffe07d;
  undefined1 in_stack_ffffffffffffe07e;
  undefined1 in_stack_ffffffffffffe07f;
  undefined1 in_stack_ffffffffffffe080;
  undefined1 in_stack_ffffffffffffe081;
  undefined1 in_stack_ffffffffffffe082;
  undefined1 in_stack_ffffffffffffe083;
  undefined1 in_stack_ffffffffffffe084;
  undefined1 in_stack_ffffffffffffe085;
  undefined1 in_stack_ffffffffffffe086;
  undefined1 in_stack_ffffffffffffe087;
  undefined1 in_stack_ffffffffffffe088;
  undefined1 in_stack_ffffffffffffe089;
  undefined1 in_stack_ffffffffffffe08a;
  undefined1 in_stack_ffffffffffffe08b;
  undefined1 in_stack_ffffffffffffe08c;
  undefined1 in_stack_ffffffffffffe08d;
  undefined1 in_stack_ffffffffffffe08e;
  undefined1 in_stack_ffffffffffffe08f;
  undefined1 in_stack_ffffffffffffe090;
  undefined1 in_stack_ffffffffffffe091;
  undefined1 in_stack_ffffffffffffe092;
  undefined1 in_stack_ffffffffffffe093;
  undefined1 in_stack_ffffffffffffe094;
  undefined1 in_stack_ffffffffffffe095;
  undefined1 in_stack_ffffffffffffe096;
  undefined1 in_stack_ffffffffffffe097;
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  uint local_1de4;
  ulong local_1de0 [131];
  long local_19c8;
  undefined1 local_1980 [32];
  undefined1 local_1960 [32];
  undefined1 local_1940 [32];
  undefined1 local_1920 [32];
  ulong local_1900;
  ulong uStack_18f8;
  ulong uStack_18f0;
  ulong uStack_18e8;
  ulong local_18e0;
  ulong uStack_18d8;
  ulong uStack_18d0;
  ulong uStack_18c8;
  ulong local_18c0;
  ulong uStack_18b8;
  ulong uStack_18b0;
  ulong uStack_18a8;
  ulong local_18a0;
  ulong uStack_1898;
  ulong uStack_1890;
  ulong uStack_1888;
  ulong local_1880;
  ulong uStack_1878;
  ulong uStack_1870;
  ulong uStack_1868;
  ulong local_1860;
  ulong uStack_1858;
  ulong uStack_1850;
  ulong uStack_1848;
  ulong local_1840;
  ulong uStack_1838;
  ulong uStack_1830;
  ulong uStack_1828;
  ulong local_1820;
  ulong uStack_1818;
  ulong uStack_1810;
  ulong uStack_1808;
  ulong local_1800;
  ulong uStack_17f8;
  ulong uStack_17f0;
  ulong uStack_17e8;
  ulong local_17e0;
  ulong uStack_17d8;
  ulong uStack_17d0;
  ulong uStack_17c8;
  ulong local_17c0;
  ulong uStack_17b8;
  ulong uStack_17b0;
  ulong uStack_17a8;
  ulong local_17a0;
  ulong uStack_1798;
  ulong uStack_1790;
  ulong uStack_1788;
  ulong local_1780;
  ulong uStack_1778;
  ulong uStack_1770;
  ulong uStack_1768;
  ulong local_1760;
  ulong uStack_1758;
  ulong uStack_1750;
  ulong uStack_1748;
  ulong local_1740;
  ulong uStack_1738;
  ulong uStack_1730;
  ulong uStack_1728;
  ulong local_1720;
  ulong uStack_1718;
  ulong uStack_1710;
  ulong uStack_1708;
  undefined1 local_1700 [32];
  undefined1 local_16e0 [32];
  undefined1 local_16c0 [32];
  undefined1 local_16a0 [32];
  ulong local_1680;
  ulong uStack_1678;
  ulong uStack_1670;
  ulong uStack_1668;
  ulong local_1660;
  ulong uStack_1658;
  ulong uStack_1650;
  ulong uStack_1648;
  ulong local_1640;
  ulong uStack_1638;
  ulong uStack_1630;
  ulong uStack_1628;
  ulong local_1620;
  ulong uStack_1618;
  ulong uStack_1610;
  ulong uStack_1608;
  ulong local_1600;
  ulong uStack_15f8;
  ulong uStack_15f0;
  ulong uStack_15e8;
  ulong local_15e0;
  ulong uStack_15d8;
  ulong uStack_15d0;
  ulong uStack_15c8;
  ulong local_15c0;
  ulong uStack_15b8;
  ulong uStack_15b0;
  ulong uStack_15a8;
  ulong local_15a0;
  ulong uStack_1598;
  ulong uStack_1590;
  ulong uStack_1588;
  ulong local_1580;
  ulong uStack_1578;
  ulong uStack_1570;
  ulong uStack_1568;
  ulong local_1560;
  ulong uStack_1558;
  ulong uStack_1550;
  ulong uStack_1548;
  ulong local_1540;
  ulong uStack_1538;
  ulong uStack_1530;
  ulong uStack_1528;
  ulong local_1520;
  ulong uStack_1518;
  ulong uStack_1510;
  ulong uStack_1508;
  ulong local_1500;
  ulong uStack_14f8;
  ulong uStack_14f0;
  ulong uStack_14e8;
  ulong local_14e0;
  ulong uStack_14d8;
  ulong uStack_14d0;
  ulong uStack_14c8;
  ulong local_14c0;
  ulong uStack_14b8;
  ulong uStack_14b0;
  ulong uStack_14a8;
  ulong local_14a0;
  ulong uStack_1498;
  ulong uStack_1490;
  ulong uStack_1488;
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  ulong local_1400;
  ulong uStack_13f8;
  ulong uStack_13f0;
  ulong uStack_13e8;
  ulong local_13e0;
  ulong uStack_13d8;
  ulong uStack_13d0;
  ulong uStack_13c8;
  ulong local_13c0;
  ulong uStack_13b8;
  ulong uStack_13b0;
  ulong uStack_13a8;
  ulong local_13a0;
  ulong uStack_1398;
  ulong uStack_1390;
  ulong uStack_1388;
  ulong local_1380;
  ulong uStack_1378;
  ulong uStack_1370;
  ulong uStack_1368;
  ulong local_1360;
  ulong uStack_1358;
  ulong uStack_1350;
  ulong uStack_1348;
  ulong local_1340;
  ulong uStack_1338;
  ulong uStack_1330;
  ulong uStack_1328;
  ulong local_1320;
  ulong uStack_1318;
  ulong uStack_1310;
  ulong uStack_1308;
  ulong local_1300;
  ulong uStack_12f8;
  ulong uStack_12f0;
  ulong uStack_12e8;
  ulong local_12e0;
  ulong uStack_12d8;
  ulong uStack_12d0;
  ulong uStack_12c8;
  ulong local_12c0;
  ulong uStack_12b8;
  ulong uStack_12b0;
  ulong uStack_12a8;
  ulong local_12a0;
  ulong uStack_1298;
  ulong uStack_1290;
  ulong uStack_1288;
  ulong local_1280;
  ulong uStack_1278;
  ulong uStack_1270;
  ulong uStack_1268;
  ulong local_1260;
  ulong uStack_1258;
  ulong uStack_1250;
  ulong uStack_1248;
  ulong local_1240;
  ulong uStack_1238;
  ulong uStack_1230;
  ulong uStack_1228;
  ulong local_1220;
  ulong uStack_1218;
  ulong uStack_1210;
  ulong uStack_1208;
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  ulong local_1180;
  ulong uStack_1178;
  ulong uStack_1170;
  ulong uStack_1168;
  ulong local_1160;
  ulong uStack_1158;
  ulong uStack_1150;
  ulong uStack_1148;
  ulong local_1140;
  ulong uStack_1138;
  ulong uStack_1130;
  ulong uStack_1128;
  ulong local_1120;
  ulong uStack_1118;
  ulong uStack_1110;
  ulong uStack_1108;
  ulong local_1100;
  ulong uStack_10f8;
  ulong uStack_10f0;
  ulong uStack_10e8;
  ulong local_10e0;
  ulong uStack_10d8;
  ulong uStack_10d0;
  ulong uStack_10c8;
  ulong local_10c0;
  ulong uStack_10b8;
  ulong uStack_10b0;
  ulong uStack_10a8;
  ulong local_10a0;
  ulong uStack_1098;
  ulong uStack_1090;
  ulong uStack_1088;
  ulong local_1080;
  ulong uStack_1078;
  ulong uStack_1070;
  ulong uStack_1068;
  ulong local_1060;
  ulong uStack_1058;
  ulong uStack_1050;
  ulong uStack_1048;
  ulong local_1040;
  ulong uStack_1038;
  ulong uStack_1030;
  ulong uStack_1028;
  ulong local_1020;
  ulong uStack_1018;
  ulong uStack_1010;
  ulong uStack_1008;
  ulong local_1000;
  ulong uStack_ff8;
  ulong uStack_ff0;
  ulong uStack_fe8;
  ulong local_fe0;
  ulong uStack_fd8;
  ulong uStack_fd0;
  ulong uStack_fc8;
  ulong local_fc0;
  ulong uStack_fb8;
  ulong uStack_fb0;
  ulong uStack_fa8;
  ulong local_fa0;
  ulong uStack_f98;
  ulong uStack_f90;
  ulong uStack_f88;
  ulong local_f80;
  ulong uStack_f78;
  ulong uStack_f70;
  ulong uStack_f68;
  ulong local_f60;
  ulong uStack_f58;
  ulong uStack_f50;
  ulong uStack_f48;
  ulong local_f40;
  ulong uStack_f38;
  ulong uStack_f30;
  ulong uStack_f28;
  ulong local_f20;
  ulong uStack_f18;
  ulong uStack_f10;
  ulong uStack_f08;
  ulong local_f00;
  ulong uStack_ef8;
  ulong uStack_ef0;
  ulong uStack_ee8;
  ulong local_ee0;
  ulong uStack_ed8;
  ulong uStack_ed0;
  ulong uStack_ec8;
  ulong *local_eb8;
  ulong *local_eb0;
  ulong *local_ea8;
  undefined1 local_ea0 [16];
  undefined1 auStack_e90 [16];
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined1 local_e20 [16];
  undefined1 auStack_e10 [16];
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined1 local_da0 [16];
  undefined1 auStack_d90 [16];
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined1 local_d20 [16];
  undefined1 auStack_d10 [16];
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined1 local_ca0 [16];
  undefined1 auStack_c90 [16];
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined1 local_c20 [16];
  undefined1 auStack_c10 [16];
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined1 local_ba0 [16];
  undefined1 auStack_b90 [16];
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined1 local_b20 [16];
  undefined1 auStack_b10 [16];
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined1 local_a84;
  undefined1 local_a83;
  undefined1 local_a82;
  undefined1 local_a81;
  undefined1 local_a80;
  undefined1 local_a7f;
  undefined1 local_a7e;
  undefined1 local_a7d;
  undefined1 local_a7c;
  undefined1 local_a7b;
  undefined1 local_a7a;
  undefined1 local_a79;
  undefined1 local_a78;
  undefined1 local_a77;
  undefined1 local_a76;
  undefined1 local_a75;
  undefined1 local_a74;
  undefined1 local_a73;
  undefined1 local_a72;
  undefined1 local_a71;
  undefined1 local_a70;
  undefined1 local_a6f;
  undefined1 local_a6e;
  undefined1 local_a6d;
  undefined1 local_a6c;
  undefined1 local_a6b;
  undefined1 local_a6a;
  undefined1 local_a69;
  undefined1 local_a68;
  undefined1 local_a67;
  undefined1 local_a66;
  undefined1 local_a65;
  undefined1 local_a64;
  undefined1 local_a63;
  undefined1 local_a62;
  undefined1 local_a61;
  undefined1 local_a60;
  undefined1 local_a5f;
  undefined1 local_a5e;
  undefined1 local_a5d;
  undefined1 local_a5c;
  undefined1 local_a5b;
  undefined1 local_a5a;
  undefined1 local_a59;
  undefined1 local_a58;
  undefined1 local_a57;
  undefined1 local_a56;
  undefined1 local_a55;
  undefined1 local_a54;
  undefined1 local_a53;
  undefined1 local_a52;
  undefined1 local_a51;
  undefined1 local_a50;
  undefined1 local_a4f;
  undefined1 local_a4e;
  undefined1 local_a4d;
  undefined1 local_a4c;
  undefined1 local_a4b;
  undefined1 local_a4a;
  undefined1 local_a49;
  undefined1 local_a48;
  undefined1 local_a47;
  undefined1 local_a46;
  undefined1 local_a45;
  undefined1 local_a44;
  undefined1 local_a43;
  undefined1 local_a42;
  undefined1 local_a41;
  undefined1 local_a40;
  undefined1 local_a3f;
  undefined1 local_a3e;
  undefined1 local_a3d;
  undefined1 local_a3c;
  undefined1 local_a3b;
  undefined1 local_a3a;
  undefined1 local_a39;
  undefined1 local_a38;
  undefined1 local_a37;
  undefined1 local_a36;
  undefined1 local_a35;
  undefined1 local_a34;
  undefined1 local_a33;
  undefined1 local_a32;
  undefined1 local_a31;
  undefined1 local_a30;
  undefined1 local_a2f;
  undefined1 local_a2e;
  undefined1 local_a2d;
  undefined1 local_a2c;
  undefined1 local_a2b;
  undefined1 local_a2a;
  undefined1 local_a29;
  undefined1 local_a28;
  undefined1 local_a27;
  undefined1 local_a26;
  undefined1 local_a25;
  undefined1 local_a24;
  undefined1 local_a23;
  undefined1 local_a22;
  undefined1 local_a21;
  undefined1 local_a20;
  undefined1 local_a1f;
  undefined1 local_a1e;
  undefined1 local_a1d;
  undefined1 local_a1c;
  undefined1 local_a1b;
  undefined1 local_a1a;
  undefined1 local_a19;
  undefined1 local_a18;
  undefined1 local_a17;
  undefined1 local_a16;
  undefined1 local_a15;
  undefined1 local_a14;
  undefined1 local_a13;
  undefined1 local_a12;
  undefined1 local_a11;
  undefined1 local_a10;
  undefined1 local_a0f;
  undefined1 local_a0e;
  undefined1 local_a0d;
  undefined1 local_a0c;
  undefined1 local_a0b;
  undefined1 local_a0a;
  undefined1 local_a09;
  undefined1 local_a08;
  undefined1 local_a07;
  undefined1 local_a06;
  undefined1 local_a05;
  undefined1 local_a04;
  undefined1 local_a03;
  undefined1 local_a02;
  undefined1 local_a01;
  undefined1 local_a00;
  undefined1 local_9ff;
  undefined1 local_9fe;
  undefined1 local_9fd;
  undefined1 local_9fc;
  undefined1 local_9fb;
  undefined1 local_9fa;
  undefined1 local_9f9;
  undefined1 local_9f8;
  undefined1 local_9f7;
  undefined1 local_9f6;
  undefined1 local_9f5;
  undefined1 local_9f4;
  undefined1 local_9f3;
  undefined1 local_9f2;
  undefined1 local_9f1;
  undefined1 local_9f0;
  undefined1 local_9ef;
  undefined1 local_9ee;
  undefined1 local_9ed;
  undefined1 local_9ec;
  undefined1 local_9eb;
  undefined1 local_9ea;
  undefined1 local_9e9;
  undefined1 local_9e8;
  undefined1 local_9e7;
  undefined1 local_9e6;
  undefined1 local_9e5;
  undefined1 local_9e4;
  undefined1 local_9e3;
  undefined1 local_9e2;
  undefined1 local_9e1;
  undefined1 local_9e0;
  undefined1 local_9df;
  undefined1 local_9de;
  undefined1 local_9dd;
  undefined1 local_9dc;
  undefined1 local_9db;
  undefined1 local_9da;
  undefined1 local_9d9;
  undefined1 local_9d8;
  undefined1 local_9d7;
  undefined1 local_9d6;
  undefined1 local_9d5;
  undefined1 local_9d4;
  undefined1 local_9d3;
  undefined1 local_9d2;
  undefined1 local_9d1;
  undefined1 local_9d0;
  undefined1 local_9cf;
  undefined1 local_9ce;
  undefined1 local_9cd;
  undefined1 local_9cc;
  undefined1 local_9cb;
  undefined1 local_9ca;
  undefined1 local_9c9;
  undefined1 local_9c8;
  undefined1 local_9c7;
  undefined1 local_9c6;
  undefined1 local_9c5;
  undefined1 local_9c4;
  undefined1 local_9c3;
  undefined1 local_9c2;
  undefined1 local_9c1;
  undefined1 local_9c0;
  undefined1 local_9bf;
  undefined1 local_9be;
  undefined1 local_9bd;
  undefined1 local_9bc;
  undefined1 local_9bb;
  undefined1 local_9ba;
  undefined1 local_9b9;
  undefined1 local_9b8;
  undefined1 local_9b7;
  undefined1 local_9b6;
  undefined1 local_9b5;
  undefined1 local_9b4;
  undefined1 local_9b3;
  undefined1 local_9b2;
  undefined1 local_9b1;
  undefined1 local_9b0;
  undefined1 local_9af;
  undefined1 local_9ae;
  undefined1 local_9ad;
  undefined1 local_9ac;
  undefined1 local_9ab;
  undefined1 local_9aa;
  undefined1 local_9a9;
  undefined1 local_9a8;
  undefined1 local_9a7;
  undefined1 local_9a6;
  undefined1 local_9a5;
  undefined1 local_9a4;
  undefined1 local_9a3;
  undefined1 local_9a2;
  undefined1 local_9a1;
  undefined1 local_9a0;
  undefined1 local_99f;
  undefined1 local_99e;
  undefined1 local_99d;
  undefined1 local_99c;
  undefined1 local_99b;
  undefined1 local_99a;
  undefined1 local_999;
  undefined1 local_998;
  undefined1 local_997;
  undefined1 local_996;
  undefined1 local_995;
  undefined1 local_994;
  undefined1 local_993;
  undefined1 local_992;
  undefined1 local_991;
  undefined1 local_990;
  undefined1 local_98f;
  undefined1 local_98e;
  undefined1 local_98d;
  undefined1 local_98c;
  undefined1 local_98b;
  undefined1 local_98a;
  undefined1 local_989;
  undefined1 local_988;
  undefined1 local_987;
  undefined1 local_986;
  undefined1 local_985;
  undefined1 local_984;
  undefined1 local_983;
  undefined1 local_982;
  undefined1 local_981;
  undefined1 local_980;
  undefined1 local_97f;
  undefined1 local_97e;
  undefined1 local_97d;
  undefined1 local_97c;
  undefined1 local_97b;
  undefined1 local_97a;
  undefined1 local_979;
  undefined1 local_978;
  undefined1 local_977;
  undefined1 local_976;
  undefined1 local_975;
  undefined1 local_974;
  undefined1 local_973;
  undefined1 local_972;
  undefined1 local_971;
  undefined1 local_970;
  undefined1 local_96f;
  undefined1 local_96e;
  undefined1 local_96d;
  undefined1 local_96c;
  undefined1 local_96b;
  undefined1 local_96a;
  undefined1 local_969;
  undefined1 local_968;
  undefined1 local_967;
  undefined1 local_966;
  undefined1 local_965;
  undefined1 local_964;
  undefined1 local_963;
  undefined1 local_962;
  undefined1 local_961;
  undefined1 local_960;
  undefined1 local_95f;
  undefined1 local_95e;
  undefined1 local_95d;
  undefined1 local_95c;
  undefined1 local_95b;
  undefined1 local_95a;
  undefined1 local_959;
  undefined1 local_958;
  undefined1 local_957;
  undefined1 local_956;
  undefined1 local_955;
  undefined1 local_954;
  undefined1 local_953;
  undefined1 local_952;
  undefined1 local_951;
  undefined1 local_950;
  undefined1 local_94f;
  undefined1 local_94e;
  undefined1 local_94d;
  undefined1 local_94c;
  undefined1 local_94b;
  undefined1 local_94a;
  undefined1 local_949;
  undefined1 local_948;
  undefined1 local_947;
  undefined1 local_946;
  undefined1 local_945;
  undefined1 local_944;
  undefined1 local_943;
  undefined1 local_942;
  undefined1 local_941;
  undefined1 local_940;
  undefined1 local_93f;
  undefined1 local_93e;
  undefined1 local_93d;
  undefined1 local_93c;
  undefined1 local_93b;
  undefined1 local_93a;
  undefined1 local_939;
  undefined1 local_938;
  undefined1 local_937;
  undefined1 local_936;
  undefined1 local_935;
  undefined1 local_934;
  undefined1 local_933;
  undefined1 local_932;
  undefined1 local_931;
  undefined1 local_930;
  undefined1 local_92f;
  undefined1 local_92e;
  undefined1 local_92d;
  undefined1 local_92c;
  undefined1 local_92b;
  undefined1 local_92a;
  undefined1 local_929;
  undefined1 local_928;
  undefined1 local_927;
  undefined1 local_926;
  undefined1 local_925;
  undefined1 local_924;
  undefined1 local_923;
  undefined1 local_922;
  undefined1 local_921;
  undefined1 local_920;
  undefined1 local_91f;
  undefined1 local_91e;
  undefined1 local_91d;
  undefined1 local_91c;
  undefined1 local_91b;
  undefined1 local_91a;
  undefined1 local_919;
  undefined1 local_918;
  undefined1 local_917;
  undefined1 local_916;
  undefined1 local_915;
  undefined1 local_914;
  undefined1 local_913;
  undefined1 local_912;
  undefined1 local_911;
  undefined1 local_910;
  undefined1 local_90f;
  undefined1 local_90e;
  undefined1 local_90d;
  undefined1 local_90c;
  undefined1 local_90b;
  undefined1 local_90a;
  undefined1 local_909;
  undefined1 local_908;
  undefined1 local_907;
  undefined1 local_906;
  undefined1 local_905;
  undefined1 local_904;
  undefined1 local_903;
  undefined1 local_902;
  undefined1 local_901;
  undefined1 local_900;
  undefined1 local_8ff;
  undefined1 local_8fe;
  undefined1 local_8fd;
  undefined1 local_8fc;
  undefined1 local_8fb;
  undefined1 local_8fa;
  undefined1 local_8f9;
  undefined1 local_8f8;
  undefined1 local_8f7;
  undefined1 local_8f6;
  undefined1 local_8f5;
  undefined1 local_8f4;
  undefined1 local_8f3;
  undefined1 local_8f2;
  undefined1 local_8f1;
  undefined1 local_8f0;
  undefined1 local_8ef;
  undefined1 local_8ee;
  undefined1 local_8ed;
  undefined1 local_8ec;
  undefined1 local_8eb;
  undefined1 local_8ea;
  undefined1 local_8e9;
  undefined1 local_8e8;
  undefined1 local_8e7;
  undefined1 local_8e6;
  undefined1 local_8e5;
  undefined1 local_8e4;
  undefined1 local_8e3;
  undefined1 local_8e2;
  undefined1 local_8e1;
  undefined1 local_8e0;
  undefined1 local_8df;
  undefined1 local_8de;
  undefined1 local_8dd;
  undefined1 local_8dc;
  undefined1 local_8db;
  undefined1 local_8da;
  undefined1 local_8d9;
  undefined1 local_8d8;
  undefined1 local_8d7;
  undefined1 local_8d6;
  undefined1 local_8d5;
  undefined1 local_8d4;
  undefined1 local_8d3;
  undefined1 local_8d2;
  undefined1 local_8d1;
  undefined1 local_8d0;
  undefined1 local_8cf;
  undefined1 local_8ce;
  undefined1 local_8cd;
  undefined1 local_8cc;
  undefined1 local_8cb;
  undefined1 local_8ca;
  undefined1 local_8c9;
  undefined1 local_8c8;
  undefined1 local_8c7;
  undefined1 local_8c6;
  undefined1 local_8c5;
  undefined1 local_8c4;
  undefined1 local_8c3;
  undefined1 local_8c2;
  undefined1 local_8c1;
  undefined1 local_8c0;
  undefined1 local_8bf;
  undefined1 local_8be;
  undefined1 local_8bd;
  undefined1 local_8bc;
  undefined1 local_8bb;
  undefined1 local_8ba;
  undefined1 local_8b9;
  undefined1 local_8b8;
  undefined1 local_8b7;
  undefined1 local_8b6;
  undefined1 local_8b5;
  undefined1 local_8b4;
  undefined1 local_8b3;
  undefined1 local_8b2;
  undefined1 local_8b1;
  undefined1 local_8b0;
  undefined1 local_8af;
  undefined1 local_8ae;
  undefined1 local_8ad;
  undefined1 local_8ac;
  undefined1 local_8ab;
  undefined1 local_8aa;
  undefined1 local_8a9;
  undefined1 local_8a8;
  undefined1 local_8a7;
  undefined1 local_8a6;
  undefined1 local_8a5;
  undefined1 local_8a4;
  undefined1 local_8a3;
  undefined1 local_8a2;
  undefined1 local_8a1;
  undefined1 local_8a0;
  undefined1 local_89f;
  undefined1 local_89e;
  undefined1 local_89d;
  undefined1 local_89c;
  undefined1 local_89b;
  undefined1 local_89a;
  undefined1 local_899;
  undefined1 local_898;
  undefined1 local_897;
  undefined1 local_896;
  undefined1 local_895;
  undefined1 local_894;
  undefined1 local_893;
  undefined1 local_892;
  undefined1 local_891;
  undefined1 local_890;
  undefined1 local_88f;
  undefined1 local_88e;
  undefined1 local_88d;
  undefined1 local_88c;
  undefined1 local_88b;
  undefined1 local_88a;
  undefined1 local_889;
  undefined1 local_888;
  undefined1 local_887;
  undefined1 local_886;
  undefined1 local_885;
  undefined4 local_884;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined4 local_844;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined4 local_804;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined4 local_7c4;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined4 local_784;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined4 local_744;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined4 local_704;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined4 local_6c4;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_460 [16];
  undefined1 auStack_450 [16];
  undefined1 local_440;
  undefined1 local_43f;
  undefined1 local_43e;
  undefined1 local_43d;
  undefined1 local_43c;
  undefined1 local_43b;
  undefined1 local_43a;
  undefined1 local_439;
  undefined1 local_438;
  undefined1 local_437;
  undefined1 local_436;
  undefined1 local_435;
  undefined1 local_434;
  undefined1 local_433;
  undefined1 local_432;
  undefined1 local_431;
  undefined1 local_430;
  undefined1 local_42f;
  undefined1 local_42e;
  undefined1 local_42d;
  undefined1 local_42c;
  undefined1 local_42b;
  undefined1 local_42a;
  undefined1 local_429;
  undefined1 local_428;
  undefined1 local_427;
  undefined1 local_426;
  undefined1 local_425;
  undefined1 local_424;
  undefined1 local_423;
  undefined1 local_422;
  undefined1 local_421;
  undefined1 local_420 [32];
  undefined1 local_400;
  undefined1 local_3ff;
  undefined1 local_3fe;
  undefined1 local_3fd;
  undefined1 local_3fc;
  undefined1 local_3fb;
  undefined1 local_3fa;
  undefined1 local_3f9;
  undefined1 local_3f8;
  undefined1 local_3f7;
  undefined1 local_3f6;
  undefined1 local_3f5;
  undefined1 local_3f4;
  undefined1 local_3f3;
  undefined1 local_3f2;
  undefined1 local_3f1;
  undefined1 local_3f0;
  undefined1 local_3ef;
  undefined1 local_3ee;
  undefined1 local_3ed;
  undefined1 local_3ec;
  undefined1 local_3eb;
  undefined1 local_3ea;
  undefined1 local_3e9;
  undefined1 local_3e8;
  undefined1 local_3e7;
  undefined1 local_3e6;
  undefined1 local_3e5;
  undefined1 local_3e4;
  undefined1 local_3e3;
  undefined1 local_3e2;
  undefined1 local_3e1;
  undefined1 local_3e0 [16];
  undefined1 auStack_3d0 [16];
  undefined1 local_3c0;
  undefined1 local_3bf;
  undefined1 local_3be;
  undefined1 local_3bd;
  undefined1 local_3bc;
  undefined1 local_3bb;
  undefined1 local_3ba;
  undefined1 local_3b9;
  undefined1 local_3b8;
  undefined1 local_3b7;
  undefined1 local_3b6;
  undefined1 local_3b5;
  undefined1 local_3b4;
  undefined1 local_3b3;
  undefined1 local_3b2;
  undefined1 local_3b1;
  undefined1 local_3b0;
  undefined1 local_3af;
  undefined1 local_3ae;
  undefined1 local_3ad;
  undefined1 local_3ac;
  undefined1 local_3ab;
  undefined1 local_3aa;
  undefined1 local_3a9;
  undefined1 local_3a8;
  undefined1 local_3a7;
  undefined1 local_3a6;
  undefined1 local_3a5;
  undefined1 local_3a4;
  undefined1 local_3a3;
  undefined1 local_3a2;
  undefined1 local_3a1;
  undefined1 local_3a0 [32];
  undefined1 local_380;
  undefined1 local_37f;
  undefined1 local_37e;
  undefined1 local_37d;
  undefined1 local_37c;
  undefined1 local_37b;
  undefined1 local_37a;
  undefined1 local_379;
  undefined1 local_378;
  undefined1 local_377;
  undefined1 local_376;
  undefined1 local_375;
  undefined1 local_374;
  undefined1 local_373;
  undefined1 local_372;
  undefined1 local_371;
  undefined1 local_370;
  undefined1 local_36f;
  undefined1 local_36e;
  undefined1 local_36d;
  undefined1 local_36c;
  undefined1 local_36b;
  undefined1 local_36a;
  undefined1 local_369;
  undefined1 local_368;
  undefined1 local_367;
  undefined1 local_366;
  undefined1 local_365;
  undefined1 local_364;
  undefined1 local_363;
  undefined1 local_362;
  undefined1 local_361;
  undefined1 local_360 [16];
  undefined1 auStack_350 [16];
  undefined1 local_340;
  undefined1 local_33f;
  undefined1 local_33e;
  undefined1 local_33d;
  undefined1 local_33c;
  undefined1 local_33b;
  undefined1 local_33a;
  undefined1 local_339;
  undefined1 local_338;
  undefined1 local_337;
  undefined1 local_336;
  undefined1 local_335;
  undefined1 local_334;
  undefined1 local_333;
  undefined1 local_332;
  undefined1 local_331;
  undefined1 local_330;
  undefined1 local_32f;
  undefined1 local_32e;
  undefined1 local_32d;
  undefined1 local_32c;
  undefined1 local_32b;
  undefined1 local_32a;
  undefined1 local_329;
  undefined1 local_328;
  undefined1 local_327;
  undefined1 local_326;
  undefined1 local_325;
  undefined1 local_324;
  undefined1 local_323;
  undefined1 local_322;
  undefined1 local_321;
  undefined1 local_320 [32];
  undefined1 local_300;
  undefined1 local_2ff;
  undefined1 local_2fe;
  undefined1 local_2fd;
  undefined1 local_2fc;
  undefined1 local_2fb;
  undefined1 local_2fa;
  undefined1 local_2f9;
  undefined1 local_2f8;
  undefined1 local_2f7;
  undefined1 local_2f6;
  undefined1 local_2f5;
  undefined1 local_2f4;
  undefined1 local_2f3;
  undefined1 local_2f2;
  undefined1 local_2f1;
  undefined1 local_2f0;
  undefined1 local_2ef;
  undefined1 local_2ee;
  undefined1 local_2ed;
  undefined1 local_2ec;
  undefined1 local_2eb;
  undefined1 local_2ea;
  undefined1 local_2e9;
  undefined1 local_2e8;
  undefined1 local_2e7;
  undefined1 local_2e6;
  undefined1 local_2e5;
  undefined1 local_2e4;
  undefined1 local_2e3;
  undefined1 local_2e2;
  undefined1 local_2e1;
  undefined1 local_2e0 [16];
  undefined1 auStack_2d0 [16];
  undefined1 local_2c0;
  undefined1 local_2bf;
  undefined1 local_2be;
  undefined1 local_2bd;
  undefined1 local_2bc;
  undefined1 local_2bb;
  undefined1 local_2ba;
  undefined1 local_2b9;
  undefined1 local_2b8;
  undefined1 local_2b7;
  undefined1 local_2b6;
  undefined1 local_2b5;
  undefined1 local_2b4;
  undefined1 local_2b3;
  undefined1 local_2b2;
  undefined1 local_2b1;
  undefined1 local_2b0;
  undefined1 local_2af;
  undefined1 local_2ae;
  undefined1 local_2ad;
  undefined1 local_2ac;
  undefined1 local_2ab;
  undefined1 local_2aa;
  undefined1 local_2a9;
  undefined1 local_2a8;
  undefined1 local_2a7;
  undefined1 local_2a6;
  undefined1 local_2a5;
  undefined1 local_2a4;
  undefined1 local_2a3;
  undefined1 local_2a2;
  undefined1 local_2a1;
  undefined1 local_2a0 [32];
  undefined1 local_280;
  undefined1 local_27f;
  undefined1 local_27e;
  undefined1 local_27d;
  undefined1 local_27c;
  undefined1 local_27b;
  undefined1 local_27a;
  undefined1 local_279;
  undefined1 local_278;
  undefined1 local_277;
  undefined1 local_276;
  undefined1 local_275;
  undefined1 local_274;
  undefined1 local_273;
  undefined1 local_272;
  undefined1 local_271;
  undefined1 local_270;
  undefined1 local_26f;
  undefined1 local_26e;
  undefined1 local_26d;
  undefined1 local_26c;
  undefined1 local_26b;
  undefined1 local_26a;
  undefined1 local_269;
  undefined1 local_268;
  undefined1 local_267;
  undefined1 local_266;
  undefined1 local_265;
  undefined1 local_264;
  undefined1 local_263;
  undefined1 local_262;
  undefined1 local_261;
  undefined1 local_260 [16];
  undefined1 auStack_250 [16];
  undefined1 local_240;
  undefined1 local_23f;
  undefined1 local_23e;
  undefined1 local_23d;
  undefined1 local_23c;
  undefined1 local_23b;
  undefined1 local_23a;
  undefined1 local_239;
  undefined1 local_238;
  undefined1 local_237;
  undefined1 local_236;
  undefined1 local_235;
  undefined1 local_234;
  undefined1 local_233;
  undefined1 local_232;
  undefined1 local_231;
  undefined1 local_230;
  undefined1 local_22f;
  undefined1 local_22e;
  undefined1 local_22d;
  undefined1 local_22c;
  undefined1 local_22b;
  undefined1 local_22a;
  undefined1 local_229;
  undefined1 local_228;
  undefined1 local_227;
  undefined1 local_226;
  undefined1 local_225;
  undefined1 local_224;
  undefined1 local_223;
  undefined1 local_222;
  undefined1 local_221;
  undefined1 local_220 [32];
  undefined1 local_200;
  undefined1 local_1ff;
  undefined1 local_1fe;
  undefined1 local_1fd;
  undefined1 local_1fc;
  undefined1 local_1fb;
  undefined1 local_1fa;
  undefined1 local_1f9;
  undefined1 local_1f8;
  undefined1 local_1f7;
  undefined1 local_1f6;
  undefined1 local_1f5;
  undefined1 local_1f4;
  undefined1 local_1f3;
  undefined1 local_1f2;
  undefined1 local_1f1;
  undefined1 local_1f0;
  undefined1 local_1ef;
  undefined1 local_1ee;
  undefined1 local_1ed;
  undefined1 local_1ec;
  undefined1 local_1eb;
  undefined1 local_1ea;
  undefined1 local_1e9;
  undefined1 local_1e8;
  undefined1 local_1e7;
  undefined1 local_1e6;
  undefined1 local_1e5;
  undefined1 local_1e4;
  undefined1 local_1e3;
  undefined1 local_1e2;
  undefined1 local_1e1;
  undefined1 local_1e0 [16];
  undefined1 auStack_1d0 [16];
  undefined1 local_1c0;
  undefined1 local_1bf;
  undefined1 local_1be;
  undefined1 local_1bd;
  undefined1 local_1bc;
  undefined1 local_1bb;
  undefined1 local_1ba;
  undefined1 local_1b9;
  undefined1 local_1b8;
  undefined1 local_1b7;
  undefined1 local_1b6;
  undefined1 local_1b5;
  undefined1 local_1b4;
  undefined1 local_1b3;
  undefined1 local_1b2;
  undefined1 local_1b1;
  undefined1 local_1b0;
  undefined1 local_1af;
  undefined1 local_1ae;
  undefined1 local_1ad;
  undefined1 local_1ac;
  undefined1 local_1ab;
  undefined1 local_1aa;
  undefined1 local_1a9;
  undefined1 local_1a8;
  undefined1 local_1a7;
  undefined1 local_1a6;
  undefined1 local_1a5;
  undefined1 local_1a4;
  undefined1 local_1a3;
  undefined1 local_1a2;
  undefined1 local_1a1;
  undefined1 local_1a0 [32];
  undefined1 local_180;
  undefined1 local_17f;
  undefined1 local_17e;
  undefined1 local_17d;
  undefined1 local_17c;
  undefined1 local_17b;
  undefined1 local_17a;
  undefined1 local_179;
  undefined1 local_178;
  undefined1 local_177;
  undefined1 local_176;
  undefined1 local_175;
  undefined1 local_174;
  undefined1 local_173;
  undefined1 local_172;
  undefined1 local_171;
  undefined1 local_170;
  undefined1 local_16f;
  undefined1 local_16e;
  undefined1 local_16d;
  undefined1 local_16c;
  undefined1 local_16b;
  undefined1 local_16a;
  undefined1 local_169;
  undefined1 local_168;
  undefined1 local_167;
  undefined1 local_166;
  undefined1 local_165;
  undefined1 local_164;
  undefined1 local_163;
  undefined1 local_162;
  undefined1 local_161;
  undefined1 local_160 [16];
  undefined1 auStack_150 [16];
  undefined1 local_140;
  undefined1 local_13f;
  undefined1 local_13e;
  undefined1 local_13d;
  undefined1 local_13c;
  undefined1 local_13b;
  undefined1 local_13a;
  undefined1 local_139;
  undefined1 local_138;
  undefined1 local_137;
  undefined1 local_136;
  undefined1 local_135;
  undefined1 local_134;
  undefined1 local_133;
  undefined1 local_132;
  undefined1 local_131;
  undefined1 local_130;
  undefined1 local_12f;
  undefined1 local_12e;
  undefined1 local_12d;
  undefined1 local_12c;
  undefined1 local_12b;
  undefined1 local_12a;
  undefined1 local_129;
  undefined1 local_128;
  undefined1 local_127;
  undefined1 local_126;
  undefined1 local_125;
  undefined1 local_124;
  undefined1 local_123;
  undefined1 local_122;
  undefined1 local_121;
  undefined1 local_120 [32];
  undefined1 local_100;
  undefined1 local_ff;
  undefined1 local_fe;
  undefined1 local_fd;
  undefined1 local_fc;
  undefined1 local_fb;
  undefined1 local_fa;
  undefined1 local_f9;
  undefined1 local_f8;
  undefined1 local_f7;
  undefined1 local_f6;
  undefined1 local_f5;
  undefined1 local_f4;
  undefined1 local_f3;
  undefined1 local_f2;
  undefined1 local_f1;
  undefined1 local_f0;
  undefined1 local_ef;
  undefined1 local_ee;
  undefined1 local_ed;
  undefined1 local_ec;
  undefined1 local_eb;
  undefined1 local_ea;
  undefined1 local_e9;
  undefined1 local_e8;
  undefined1 local_e7;
  undefined1 local_e6;
  undefined1 local_e5;
  undefined1 local_e4;
  undefined1 local_e3;
  undefined1 local_e2;
  undefined1 local_e1;
  undefined1 local_e0 [16];
  undefined1 auStack_d0 [16];
  undefined1 local_c0;
  undefined1 local_bf;
  undefined1 local_be;
  undefined1 local_bd;
  undefined1 local_bc;
  undefined1 local_bb;
  undefined1 local_ba;
  undefined1 local_b9;
  undefined1 local_b8;
  undefined1 local_b7;
  undefined1 local_b6;
  undefined1 local_b5;
  undefined1 local_b4;
  undefined1 local_b3;
  undefined1 local_b2;
  undefined1 local_b1;
  undefined1 local_b0;
  undefined1 local_af;
  undefined1 local_ae;
  undefined1 local_ad;
  undefined1 local_ac;
  undefined1 local_ab;
  undefined1 local_aa;
  undefined1 local_a9;
  undefined1 local_a8;
  undefined1 local_a7;
  undefined1 local_a6;
  undefined1 local_a5;
  undefined1 local_a4;
  undefined1 local_a3;
  undefined1 local_a2;
  undefined1 local_a1;
  undefined1 local_a0 [32];
  undefined1 local_78;
  undefined1 local_77;
  undefined1 local_76;
  undefined1 local_75;
  undefined1 local_74;
  undefined1 local_73;
  undefined1 local_72;
  undefined1 local_71;
  undefined1 local_70;
  undefined1 local_6f;
  undefined1 local_6e;
  undefined1 local_6d;
  undefined1 local_6c;
  undefined1 local_6b;
  undefined1 local_6a;
  undefined1 local_69;
  undefined1 local_68;
  undefined1 local_67;
  undefined1 local_66;
  undefined1 local_65;
  undefined1 local_64;
  undefined1 local_63;
  undefined1 local_62;
  undefined1 local_61;
  undefined1 local_60;
  undefined1 local_5f;
  undefined1 local_5e;
  undefined1 local_5d;
  undefined1 local_5c;
  undefined1 local_5b;
  undefined1 local_5a;
  undefined1 local_59;
  
  local_19c8 = CONCAT71(in_register_00000039,in_DIL);
  local_1de0[0x82] = CONCAT71(in_register_00000031,in_SIL);
  local_1de0[0x81] = in_RDX;
  if (in_ECX == 0) {
    for (local_1de4 = 0; local_1de4 < 0x20; local_1de4 = local_1de4 + 1) {
      puVar26 = (ulong *)(local_19c8 + (ulong)local_1de4 * 0x20);
      local_f60 = *puVar26;
      uStack_f58 = puVar26[1];
      uStack_f50 = puVar26[2];
      uStack_f48 = puVar26[3];
      local_eb8 = (ulong *)(local_1de0[0x82] + (ulong)local_1de4 * 0x20);
      local_f80 = *local_eb8;
      uStack_f78 = local_eb8[1];
      uStack_f70 = local_eb8[2];
      uStack_f68 = local_eb8[3];
      puVar26 = (ulong *)(local_19c8 + (ulong)local_1de4 * 0x20);
      *puVar26 = local_f60 ^ local_f80;
      puVar26[1] = uStack_f58 ^ uStack_f78;
      puVar26[2] = uStack_f50 ^ uStack_f70;
      puVar26[3] = uStack_f48 ^ uStack_f68;
      uVar31 = (ulong)local_1de4;
      local_1de0[uVar31 * 4] = local_f60 ^ local_f80;
      local_1de0[uVar31 * 4 + 1] = uStack_f58 ^ uStack_f78;
      local_1de0[uVar31 * 4 + 2] = uStack_f50 ^ uStack_f70;
      local_1de0[uVar31 * 4 + 3] = uStack_f48 ^ uStack_f68;
    }
  }
  else {
    for (local_1de4 = 0; local_1de4 < 0x20; local_1de4 = local_1de4 + 1) {
      puVar26 = (ulong *)(local_19c8 + (ulong)local_1de4 * 0x20);
      local_ee0 = *puVar26;
      uStack_ed8 = puVar26[1];
      uStack_ed0 = puVar26[2];
      uStack_ec8 = puVar26[3];
      local_ea8 = (ulong *)(local_1de0[0x82] + (ulong)local_1de4 * 0x20);
      local_f00 = *local_ea8;
      uStack_ef8 = local_ea8[1];
      uStack_ef0 = local_ea8[2];
      uStack_ee8 = local_ea8[3];
      puVar26 = (ulong *)(local_19c8 + (ulong)local_1de4 * 0x20);
      *puVar26 = local_ee0 ^ local_f00;
      puVar26[1] = uStack_ed8 ^ uStack_ef8;
      puVar26[2] = uStack_ed0 ^ uStack_ef0;
      puVar26[3] = uStack_ec8 ^ uStack_ee8;
      puVar26 = (ulong *)(local_19c8 + (ulong)local_1de4 * 0x20);
      local_f20 = *puVar26;
      uStack_f18 = puVar26[1];
      uStack_f10 = puVar26[2];
      uStack_f08 = puVar26[3];
      local_eb0 = (ulong *)(local_1de0[0x81] + (ulong)local_1de4 * 0x20);
      local_f40 = *local_eb0;
      uStack_f38 = local_eb0[1];
      uStack_f30 = local_eb0[2];
      uStack_f28 = local_eb0[3];
      uVar31 = (ulong)local_1de4;
      local_1de0[uVar31 * 4] = local_f20 ^ local_f40;
      local_1de0[uVar31 * 4 + 1] = uStack_f18 ^ uStack_f38;
      local_1de0[uVar31 * 4 + 2] = uStack_f10 ^ uStack_f30;
      local_1de0[uVar31 * 4 + 3] = uStack_f08 ^ uStack_f28;
    }
  }
  local_1de4 = 0;
  while( true ) {
    if (3 < local_1de4) break;
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 << 3) * 0x20);
    uVar35 = *puVar27;
    uVar44 = puVar27[1];
    uVar45 = puVar27[2];
    uVar46 = puVar27[3];
    x[0]._1_1_ = in_stack_ffffffffffffe079;
    x[0]._0_1_ = in_stack_ffffffffffffe078;
    x[0]._2_1_ = in_stack_ffffffffffffe07a;
    x[0]._3_1_ = in_stack_ffffffffffffe07b;
    x[0]._4_1_ = in_stack_ffffffffffffe07c;
    x[0]._5_1_ = in_stack_ffffffffffffe07d;
    x[0]._6_1_ = in_stack_ffffffffffffe07e;
    x[0]._7_1_ = in_stack_ffffffffffffe07f;
    x[1]._0_1_ = in_stack_ffffffffffffe080;
    x[1]._1_1_ = in_stack_ffffffffffffe081;
    x[1]._2_1_ = in_stack_ffffffffffffe082;
    x[1]._3_1_ = in_stack_ffffffffffffe083;
    x[1]._4_1_ = in_stack_ffffffffffffe084;
    x[1]._5_1_ = in_stack_ffffffffffffe085;
    x[1]._6_1_ = in_stack_ffffffffffffe086;
    x[1]._7_1_ = in_stack_ffffffffffffe087;
    x[2]._0_1_ = in_stack_ffffffffffffe088;
    x[2]._1_1_ = in_stack_ffffffffffffe089;
    x[2]._2_1_ = in_stack_ffffffffffffe08a;
    x[2]._3_1_ = in_stack_ffffffffffffe08b;
    x[2]._4_1_ = in_stack_ffffffffffffe08c;
    x[2]._5_1_ = in_stack_ffffffffffffe08d;
    x[2]._6_1_ = in_stack_ffffffffffffe08e;
    x[2]._7_1_ = in_stack_ffffffffffffe08f;
    x[3]._0_1_ = in_stack_ffffffffffffe090;
    x[3]._1_1_ = in_stack_ffffffffffffe091;
    x[3]._2_1_ = in_stack_ffffffffffffe092;
    x[3]._3_1_ = in_stack_ffffffffffffe093;
    x[3]._4_1_ = in_stack_ffffffffffffe094;
    x[3]._5_1_ = in_stack_ffffffffffffe095;
    x[3]._6_1_ = in_stack_ffffffffffffe096;
    x[3]._7_1_ = in_stack_ffffffffffffe097;
    y[0]._1_1_ = in_stack_ffffffffffffe059;
    y[0]._0_1_ = in_stack_ffffffffffffe058;
    y[0]._2_1_ = in_stack_ffffffffffffe05a;
    y[0]._3_1_ = in_stack_ffffffffffffe05b;
    y[0]._4_1_ = in_stack_ffffffffffffe05c;
    y[0]._5_1_ = in_stack_ffffffffffffe05d;
    y[0]._6_1_ = in_stack_ffffffffffffe05e;
    y[0]._7_1_ = in_stack_ffffffffffffe05f;
    y[1]._0_1_ = in_stack_ffffffffffffe060;
    y[1]._1_1_ = in_stack_ffffffffffffe061;
    y[1]._2_1_ = in_stack_ffffffffffffe062;
    y[1]._3_1_ = in_stack_ffffffffffffe063;
    y[1]._4_1_ = in_stack_ffffffffffffe064;
    y[1]._5_1_ = in_stack_ffffffffffffe065;
    y[1]._6_1_ = in_stack_ffffffffffffe066;
    y[1]._7_1_ = in_stack_ffffffffffffe067;
    y[2]._0_1_ = in_stack_ffffffffffffe068;
    y[2]._1_1_ = in_stack_ffffffffffffe069;
    y[2]._2_1_ = in_stack_ffffffffffffe06a;
    y[2]._3_1_ = in_stack_ffffffffffffe06b;
    y[2]._4_1_ = in_stack_ffffffffffffe06c;
    y[2]._5_1_ = in_stack_ffffffffffffe06d;
    y[2]._6_1_ = in_stack_ffffffffffffe06e;
    y[2]._7_1_ = in_stack_ffffffffffffe06f;
    y[3]._0_1_ = in_stack_ffffffffffffe070;
    y[3]._1_1_ = in_stack_ffffffffffffe071;
    y[3]._2_1_ = in_stack_ffffffffffffe072;
    y[3]._3_1_ = in_stack_ffffffffffffe073;
    y[3]._4_1_ = in_stack_ffffffffffffe074;
    y[3]._5_1_ = in_stack_ffffffffffffe075;
    y[3]._6_1_ = in_stack_ffffffffffffe076;
    y[3]._7_1_ = in_stack_ffffffffffffe077;
    f(x,y);
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 << 3) * 0x20);
    *puVar27 = uVar35;
    puVar27[1] = uVar44;
    puVar27[2] = uVar45;
    puVar27[3] = uVar46;
    puVar27 = (undefined8 *)(local_19c8 + 0x80 + (ulong)(local_1de4 << 3) * 0x20);
    uVar35 = *puVar27;
    uVar44 = puVar27[1];
    uVar45 = puVar27[2];
    uVar46 = puVar27[3];
    x_00[0]._1_1_ = in_stack_ffffffffffffe079;
    x_00[0]._0_1_ = in_stack_ffffffffffffe078;
    x_00[0]._2_1_ = in_stack_ffffffffffffe07a;
    x_00[0]._3_1_ = in_stack_ffffffffffffe07b;
    x_00[0]._4_1_ = in_stack_ffffffffffffe07c;
    x_00[0]._5_1_ = in_stack_ffffffffffffe07d;
    x_00[0]._6_1_ = in_stack_ffffffffffffe07e;
    x_00[0]._7_1_ = in_stack_ffffffffffffe07f;
    x_00[1]._0_1_ = in_stack_ffffffffffffe080;
    x_00[1]._1_1_ = in_stack_ffffffffffffe081;
    x_00[1]._2_1_ = in_stack_ffffffffffffe082;
    x_00[1]._3_1_ = in_stack_ffffffffffffe083;
    x_00[1]._4_1_ = in_stack_ffffffffffffe084;
    x_00[1]._5_1_ = in_stack_ffffffffffffe085;
    x_00[1]._6_1_ = in_stack_ffffffffffffe086;
    x_00[1]._7_1_ = in_stack_ffffffffffffe087;
    x_00[2]._0_1_ = in_stack_ffffffffffffe088;
    x_00[2]._1_1_ = in_stack_ffffffffffffe089;
    x_00[2]._2_1_ = in_stack_ffffffffffffe08a;
    x_00[2]._3_1_ = in_stack_ffffffffffffe08b;
    x_00[2]._4_1_ = in_stack_ffffffffffffe08c;
    x_00[2]._5_1_ = in_stack_ffffffffffffe08d;
    x_00[2]._6_1_ = in_stack_ffffffffffffe08e;
    x_00[2]._7_1_ = in_stack_ffffffffffffe08f;
    x_00[3]._0_1_ = in_stack_ffffffffffffe090;
    x_00[3]._1_1_ = in_stack_ffffffffffffe091;
    x_00[3]._2_1_ = in_stack_ffffffffffffe092;
    x_00[3]._3_1_ = in_stack_ffffffffffffe093;
    x_00[3]._4_1_ = in_stack_ffffffffffffe094;
    x_00[3]._5_1_ = in_stack_ffffffffffffe095;
    x_00[3]._6_1_ = in_stack_ffffffffffffe096;
    x_00[3]._7_1_ = in_stack_ffffffffffffe097;
    y_00[0]._1_1_ = in_stack_ffffffffffffe059;
    y_00[0]._0_1_ = in_stack_ffffffffffffe058;
    y_00[0]._2_1_ = in_stack_ffffffffffffe05a;
    y_00[0]._3_1_ = in_stack_ffffffffffffe05b;
    y_00[0]._4_1_ = in_stack_ffffffffffffe05c;
    y_00[0]._5_1_ = in_stack_ffffffffffffe05d;
    y_00[0]._6_1_ = in_stack_ffffffffffffe05e;
    y_00[0]._7_1_ = in_stack_ffffffffffffe05f;
    y_00[1]._0_1_ = in_stack_ffffffffffffe060;
    y_00[1]._1_1_ = in_stack_ffffffffffffe061;
    y_00[1]._2_1_ = in_stack_ffffffffffffe062;
    y_00[1]._3_1_ = in_stack_ffffffffffffe063;
    y_00[1]._4_1_ = in_stack_ffffffffffffe064;
    y_00[1]._5_1_ = in_stack_ffffffffffffe065;
    y_00[1]._6_1_ = in_stack_ffffffffffffe066;
    y_00[1]._7_1_ = in_stack_ffffffffffffe067;
    y_00[2]._0_1_ = in_stack_ffffffffffffe068;
    y_00[2]._1_1_ = in_stack_ffffffffffffe069;
    y_00[2]._2_1_ = in_stack_ffffffffffffe06a;
    y_00[2]._3_1_ = in_stack_ffffffffffffe06b;
    y_00[2]._4_1_ = in_stack_ffffffffffffe06c;
    y_00[2]._5_1_ = in_stack_ffffffffffffe06d;
    y_00[2]._6_1_ = in_stack_ffffffffffffe06e;
    y_00[2]._7_1_ = in_stack_ffffffffffffe06f;
    y_00[3]._0_1_ = in_stack_ffffffffffffe070;
    y_00[3]._1_1_ = in_stack_ffffffffffffe071;
    y_00[3]._2_1_ = in_stack_ffffffffffffe072;
    y_00[3]._3_1_ = in_stack_ffffffffffffe073;
    y_00[3]._4_1_ = in_stack_ffffffffffffe074;
    y_00[3]._5_1_ = in_stack_ffffffffffffe075;
    y_00[3]._6_1_ = in_stack_ffffffffffffe076;
    y_00[3]._7_1_ = in_stack_ffffffffffffe077;
    f(x_00,y_00);
    puVar27 = (undefined8 *)(local_19c8 + 0x80 + (ulong)(local_1de4 << 3) * 0x20);
    *puVar27 = uVar35;
    puVar27[1] = uVar44;
    puVar27[2] = uVar45;
    puVar27[3] = uVar46;
    lVar32 = (ulong)(local_1de4 << 3) * 0x20;
    puVar26 = (ulong *)(local_19c8 + lVar32);
    local_fc0 = *puVar26;
    uStack_fb8 = puVar26[1];
    uStack_fb0 = puVar26[2];
    uStack_fa8 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + 0x60 + lVar32);
    local_fa0 = *puVar26;
    uStack_f98 = puVar26[1];
    uStack_f90 = puVar26[2];
    uStack_f88 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + 0x60 + (ulong)(local_1de4 << 3) * 0x20);
    *puVar26 = local_fa0 ^ local_fc0;
    puVar26[1] = uStack_f98 ^ uStack_fb8;
    puVar26[2] = uStack_f90 ^ uStack_fb0;
    puVar26[3] = uStack_f88 ^ uStack_fa8;
    lVar32 = (ulong)(local_1de4 << 3) * 0x20;
    puVar26 = (ulong *)(local_19c8 + 0x80 + lVar32);
    local_1000 = *puVar26;
    uStack_ff8 = puVar26[1];
    uStack_ff0 = puVar26[2];
    uStack_fe8 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + 0xe0 + lVar32);
    local_fe0 = *puVar26;
    uStack_fd8 = puVar26[1];
    uStack_fd0 = puVar26[2];
    uStack_fc8 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + 0xe0 + (ulong)(local_1de4 << 3) * 0x20);
    *puVar26 = local_fe0 ^ local_1000;
    puVar26[1] = uStack_fd8 ^ uStack_ff8;
    puVar26[2] = uStack_fd0 ^ uStack_ff0;
    puVar26[3] = uStack_fc8 ^ uStack_fe8;
    lVar32 = (ulong)(local_1de4 << 3) * 0x20;
    auVar4 = vpshufd_avx2(*(undefined1 (*) [32])(local_19c8 + 0x60 + lVar32),0xb1);
    *(undefined1 (*) [32])(local_19c8 + 0x60 + lVar32) = auVar4;
    lVar32 = (ulong)(local_1de4 << 3) * 0x20;
    auVar4 = vpshufd_avx2(*(undefined1 (*) [32])(local_19c8 + 0xe0 + lVar32),0xb1);
    *(undefined1 (*) [32])(local_19c8 + 0xe0 + lVar32) = auVar4;
    puVar27 = (undefined8 *)(local_19c8 + 0x40 + (ulong)(local_1de4 << 3) * 0x20);
    uVar35 = *puVar27;
    uVar44 = puVar27[1];
    uVar45 = puVar27[2];
    uVar46 = puVar27[3];
    x_01[0]._1_1_ = in_stack_ffffffffffffe079;
    x_01[0]._0_1_ = in_stack_ffffffffffffe078;
    x_01[0]._2_1_ = in_stack_ffffffffffffe07a;
    x_01[0]._3_1_ = in_stack_ffffffffffffe07b;
    x_01[0]._4_1_ = in_stack_ffffffffffffe07c;
    x_01[0]._5_1_ = in_stack_ffffffffffffe07d;
    x_01[0]._6_1_ = in_stack_ffffffffffffe07e;
    x_01[0]._7_1_ = in_stack_ffffffffffffe07f;
    x_01[1]._0_1_ = in_stack_ffffffffffffe080;
    x_01[1]._1_1_ = in_stack_ffffffffffffe081;
    x_01[1]._2_1_ = in_stack_ffffffffffffe082;
    x_01[1]._3_1_ = in_stack_ffffffffffffe083;
    x_01[1]._4_1_ = in_stack_ffffffffffffe084;
    x_01[1]._5_1_ = in_stack_ffffffffffffe085;
    x_01[1]._6_1_ = in_stack_ffffffffffffe086;
    x_01[1]._7_1_ = in_stack_ffffffffffffe087;
    x_01[2]._0_1_ = in_stack_ffffffffffffe088;
    x_01[2]._1_1_ = in_stack_ffffffffffffe089;
    x_01[2]._2_1_ = in_stack_ffffffffffffe08a;
    x_01[2]._3_1_ = in_stack_ffffffffffffe08b;
    x_01[2]._4_1_ = in_stack_ffffffffffffe08c;
    x_01[2]._5_1_ = in_stack_ffffffffffffe08d;
    x_01[2]._6_1_ = in_stack_ffffffffffffe08e;
    x_01[2]._7_1_ = in_stack_ffffffffffffe08f;
    x_01[3]._0_1_ = in_stack_ffffffffffffe090;
    x_01[3]._1_1_ = in_stack_ffffffffffffe091;
    x_01[3]._2_1_ = in_stack_ffffffffffffe092;
    x_01[3]._3_1_ = in_stack_ffffffffffffe093;
    x_01[3]._4_1_ = in_stack_ffffffffffffe094;
    x_01[3]._5_1_ = in_stack_ffffffffffffe095;
    x_01[3]._6_1_ = in_stack_ffffffffffffe096;
    x_01[3]._7_1_ = in_stack_ffffffffffffe097;
    y_01[0]._1_1_ = in_stack_ffffffffffffe059;
    y_01[0]._0_1_ = in_stack_ffffffffffffe058;
    y_01[0]._2_1_ = in_stack_ffffffffffffe05a;
    y_01[0]._3_1_ = in_stack_ffffffffffffe05b;
    y_01[0]._4_1_ = in_stack_ffffffffffffe05c;
    y_01[0]._5_1_ = in_stack_ffffffffffffe05d;
    y_01[0]._6_1_ = in_stack_ffffffffffffe05e;
    y_01[0]._7_1_ = in_stack_ffffffffffffe05f;
    y_01[1]._0_1_ = in_stack_ffffffffffffe060;
    y_01[1]._1_1_ = in_stack_ffffffffffffe061;
    y_01[1]._2_1_ = in_stack_ffffffffffffe062;
    y_01[1]._3_1_ = in_stack_ffffffffffffe063;
    y_01[1]._4_1_ = in_stack_ffffffffffffe064;
    y_01[1]._5_1_ = in_stack_ffffffffffffe065;
    y_01[1]._6_1_ = in_stack_ffffffffffffe066;
    y_01[1]._7_1_ = in_stack_ffffffffffffe067;
    y_01[2]._0_1_ = in_stack_ffffffffffffe068;
    y_01[2]._1_1_ = in_stack_ffffffffffffe069;
    y_01[2]._2_1_ = in_stack_ffffffffffffe06a;
    y_01[2]._3_1_ = in_stack_ffffffffffffe06b;
    y_01[2]._4_1_ = in_stack_ffffffffffffe06c;
    y_01[2]._5_1_ = in_stack_ffffffffffffe06d;
    y_01[2]._6_1_ = in_stack_ffffffffffffe06e;
    y_01[2]._7_1_ = in_stack_ffffffffffffe06f;
    y_01[3]._0_1_ = in_stack_ffffffffffffe070;
    y_01[3]._1_1_ = in_stack_ffffffffffffe071;
    y_01[3]._2_1_ = in_stack_ffffffffffffe072;
    y_01[3]._3_1_ = in_stack_ffffffffffffe073;
    y_01[3]._4_1_ = in_stack_ffffffffffffe074;
    y_01[3]._5_1_ = in_stack_ffffffffffffe075;
    y_01[3]._6_1_ = in_stack_ffffffffffffe076;
    y_01[3]._7_1_ = in_stack_ffffffffffffe077;
    f(x_01,y_01);
    puVar27 = (undefined8 *)(local_19c8 + 0x40 + (ulong)(local_1de4 << 3) * 0x20);
    *puVar27 = uVar35;
    puVar27[1] = uVar44;
    puVar27[2] = uVar45;
    puVar27[3] = uVar46;
    puVar27 = (undefined8 *)(local_19c8 + 0xc0 + (ulong)(local_1de4 << 3) * 0x20);
    uVar35 = *puVar27;
    uVar44 = puVar27[1];
    uVar45 = puVar27[2];
    uVar46 = puVar27[3];
    x_02[0]._1_1_ = in_stack_ffffffffffffe079;
    x_02[0]._0_1_ = in_stack_ffffffffffffe078;
    x_02[0]._2_1_ = in_stack_ffffffffffffe07a;
    x_02[0]._3_1_ = in_stack_ffffffffffffe07b;
    x_02[0]._4_1_ = in_stack_ffffffffffffe07c;
    x_02[0]._5_1_ = in_stack_ffffffffffffe07d;
    x_02[0]._6_1_ = in_stack_ffffffffffffe07e;
    x_02[0]._7_1_ = in_stack_ffffffffffffe07f;
    x_02[1]._0_1_ = in_stack_ffffffffffffe080;
    x_02[1]._1_1_ = in_stack_ffffffffffffe081;
    x_02[1]._2_1_ = in_stack_ffffffffffffe082;
    x_02[1]._3_1_ = in_stack_ffffffffffffe083;
    x_02[1]._4_1_ = in_stack_ffffffffffffe084;
    x_02[1]._5_1_ = in_stack_ffffffffffffe085;
    x_02[1]._6_1_ = in_stack_ffffffffffffe086;
    x_02[1]._7_1_ = in_stack_ffffffffffffe087;
    x_02[2]._0_1_ = in_stack_ffffffffffffe088;
    x_02[2]._1_1_ = in_stack_ffffffffffffe089;
    x_02[2]._2_1_ = in_stack_ffffffffffffe08a;
    x_02[2]._3_1_ = in_stack_ffffffffffffe08b;
    x_02[2]._4_1_ = in_stack_ffffffffffffe08c;
    x_02[2]._5_1_ = in_stack_ffffffffffffe08d;
    x_02[2]._6_1_ = in_stack_ffffffffffffe08e;
    x_02[2]._7_1_ = in_stack_ffffffffffffe08f;
    x_02[3]._0_1_ = in_stack_ffffffffffffe090;
    x_02[3]._1_1_ = in_stack_ffffffffffffe091;
    x_02[3]._2_1_ = in_stack_ffffffffffffe092;
    x_02[3]._3_1_ = in_stack_ffffffffffffe093;
    x_02[3]._4_1_ = in_stack_ffffffffffffe094;
    x_02[3]._5_1_ = in_stack_ffffffffffffe095;
    x_02[3]._6_1_ = in_stack_ffffffffffffe096;
    x_02[3]._7_1_ = in_stack_ffffffffffffe097;
    y_02[0]._1_1_ = in_stack_ffffffffffffe059;
    y_02[0]._0_1_ = in_stack_ffffffffffffe058;
    y_02[0]._2_1_ = in_stack_ffffffffffffe05a;
    y_02[0]._3_1_ = in_stack_ffffffffffffe05b;
    y_02[0]._4_1_ = in_stack_ffffffffffffe05c;
    y_02[0]._5_1_ = in_stack_ffffffffffffe05d;
    y_02[0]._6_1_ = in_stack_ffffffffffffe05e;
    y_02[0]._7_1_ = in_stack_ffffffffffffe05f;
    y_02[1]._0_1_ = in_stack_ffffffffffffe060;
    y_02[1]._1_1_ = in_stack_ffffffffffffe061;
    y_02[1]._2_1_ = in_stack_ffffffffffffe062;
    y_02[1]._3_1_ = in_stack_ffffffffffffe063;
    y_02[1]._4_1_ = in_stack_ffffffffffffe064;
    y_02[1]._5_1_ = in_stack_ffffffffffffe065;
    y_02[1]._6_1_ = in_stack_ffffffffffffe066;
    y_02[1]._7_1_ = in_stack_ffffffffffffe067;
    y_02[2]._0_1_ = in_stack_ffffffffffffe068;
    y_02[2]._1_1_ = in_stack_ffffffffffffe069;
    y_02[2]._2_1_ = in_stack_ffffffffffffe06a;
    y_02[2]._3_1_ = in_stack_ffffffffffffe06b;
    y_02[2]._4_1_ = in_stack_ffffffffffffe06c;
    y_02[2]._5_1_ = in_stack_ffffffffffffe06d;
    y_02[2]._6_1_ = in_stack_ffffffffffffe06e;
    y_02[2]._7_1_ = in_stack_ffffffffffffe06f;
    y_02[3]._0_1_ = in_stack_ffffffffffffe070;
    y_02[3]._1_1_ = in_stack_ffffffffffffe071;
    y_02[3]._2_1_ = in_stack_ffffffffffffe072;
    y_02[3]._3_1_ = in_stack_ffffffffffffe073;
    y_02[3]._4_1_ = in_stack_ffffffffffffe074;
    y_02[3]._5_1_ = in_stack_ffffffffffffe075;
    y_02[3]._6_1_ = in_stack_ffffffffffffe076;
    y_02[3]._7_1_ = in_stack_ffffffffffffe077;
    f(x_02,y_02);
    puVar27 = (undefined8 *)(local_19c8 + 0xc0 + (ulong)(local_1de4 << 3) * 0x20);
    *puVar27 = uVar35;
    puVar27[1] = uVar44;
    puVar27[2] = uVar45;
    puVar27[3] = uVar46;
    lVar32 = (ulong)(local_1de4 << 3) * 0x20;
    puVar26 = (ulong *)(local_19c8 + 0x20 + lVar32);
    local_1020 = *puVar26;
    uStack_1018 = puVar26[1];
    uStack_1010 = puVar26[2];
    uStack_1008 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + 0x40 + lVar32);
    local_1040 = *puVar26;
    uStack_1038 = puVar26[1];
    uStack_1030 = puVar26[2];
    uStack_1028 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + 0x20 + (ulong)(local_1de4 << 3) * 0x20);
    *puVar26 = local_1020 ^ local_1040;
    puVar26[1] = uStack_1018 ^ uStack_1038;
    puVar26[2] = uStack_1010 ^ uStack_1030;
    puVar26[3] = uStack_1008 ^ uStack_1028;
    lVar32 = (ulong)(local_1de4 << 3) * 0x20;
    puVar26 = (ulong *)(local_19c8 + 0xa0 + lVar32);
    local_1060 = *puVar26;
    uStack_1058 = puVar26[1];
    uStack_1050 = puVar26[2];
    uStack_1048 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + 0xc0 + lVar32);
    local_1080 = *puVar26;
    uStack_1078 = puVar26[1];
    uStack_1070 = puVar26[2];
    uStack_1068 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + 0xa0 + (ulong)(local_1de4 << 3) * 0x20);
    *puVar26 = local_1060 ^ local_1080;
    puVar26[1] = uStack_1058 ^ uStack_1078;
    puVar26[2] = uStack_1050 ^ uStack_1070;
    puVar26[3] = uStack_1048 ^ uStack_1068;
    pauVar28 = (undefined1 (*) [32])(local_19c8 + 0x20 + (ulong)(local_1de4 << 3) * 0x20);
    local_ac0 = *(undefined8 *)*pauVar28;
    uStack_ab8 = *(undefined8 *)(*pauVar28 + 8);
    uStack_ab0 = *(undefined8 *)(*pauVar28 + 0x10);
    uStack_aa8 = *(undefined8 *)(*pauVar28 + 0x18);
    local_885 = 3;
    local_886 = 4;
    local_887 = 5;
    local_888 = 6;
    local_889 = 7;
    local_88a = 0;
    local_88b = 1;
    local_88c = 2;
    local_88d = 0xb;
    local_88e = 0xc;
    local_88f = 0xd;
    local_890 = 0xe;
    local_891 = 0xf;
    local_892 = 8;
    local_893 = 9;
    local_894 = 10;
    local_895 = 0x13;
    local_896 = 0x14;
    local_897 = 0x15;
    local_898 = 0x16;
    local_899 = 0x17;
    local_89a = 0x10;
    local_89b = 0x11;
    local_89c = 0x12;
    local_89d = 0x1b;
    local_89e = 0x1c;
    local_89f = 0x1d;
    local_8a0 = 0x1e;
    local_8a1 = 0x1f;
    local_8a2 = 0x18;
    local_8a3 = 0x19;
    local_8a4 = 0x1a;
    local_421 = 0x1a;
    local_422 = 0x19;
    local_423 = 0x18;
    local_424 = 0x1f;
    local_425 = 0x1e;
    local_426 = 0x1d;
    local_427 = 0x1c;
    local_428 = 0x1b;
    local_429 = 0x12;
    local_42a = 0x11;
    local_42b = 0x10;
    local_42c = 0x17;
    local_42d = 0x16;
    local_42e = 0x15;
    local_42f = 0x14;
    local_430 = 0x13;
    local_431 = 10;
    local_432 = 9;
    local_433 = 8;
    local_434 = 0xf;
    local_435 = 0xe;
    local_436 = 0xd;
    local_437 = 0xc;
    local_438 = 0xb;
    local_439 = 2;
    local_43a = 1;
    local_43b = 0;
    local_43c = 7;
    local_43d = 6;
    local_43e = 5;
    local_43f = 4;
    local_440 = 3;
    auVar2 = vpinsrb_avx(ZEXT116(3),4,1);
    auVar2 = vpinsrb_avx(auVar2,5,2);
    auVar2 = vpinsrb_avx(auVar2,6,3);
    auVar2 = vpinsrb_avx(auVar2,7,4);
    auVar2 = vpinsrb_avx(auVar2,0,5);
    auVar2 = vpinsrb_avx(auVar2,1,6);
    auVar2 = vpinsrb_avx(auVar2,2,7);
    auVar2 = vpinsrb_avx(auVar2,0xb,8);
    auVar2 = vpinsrb_avx(auVar2,0xc,9);
    auVar2 = vpinsrb_avx(auVar2,0xd,10);
    auVar2 = vpinsrb_avx(auVar2,0xe,0xb);
    auVar2 = vpinsrb_avx(auVar2,0xf,0xc);
    auVar2 = vpinsrb_avx(auVar2,8,0xd);
    auVar2 = vpinsrb_avx(auVar2,9,0xe);
    local_460 = vpinsrb_avx(auVar2,10,0xf);
    auVar2 = vpinsrb_avx(ZEXT116(0x13),0x14,1);
    auVar2 = vpinsrb_avx(auVar2,0x15,2);
    auVar2 = vpinsrb_avx(auVar2,0x16,3);
    auVar2 = vpinsrb_avx(auVar2,0x17,4);
    auVar2 = vpinsrb_avx(auVar2,0x10,5);
    auVar2 = vpinsrb_avx(auVar2,0x11,6);
    auVar2 = vpinsrb_avx(auVar2,0x12,7);
    auVar2 = vpinsrb_avx(auVar2,0x1b,8);
    auVar2 = vpinsrb_avx(auVar2,0x1c,9);
    auVar2 = vpinsrb_avx(auVar2,0x1d,10);
    auVar2 = vpinsrb_avx(auVar2,0x1e,0xb);
    auVar2 = vpinsrb_avx(auVar2,0x1f,0xc);
    auVar2 = vpinsrb_avx(auVar2,0x18,0xd);
    auVar2 = vpinsrb_avx(auVar2,0x19,0xe);
    auStack_450 = vpinsrb_avx(auVar2,0x1a,0xf);
    local_ae0 = local_460._0_8_;
    uStack_ad8 = local_460._8_8_;
    uStack_ad0 = auStack_450._0_8_;
    uStack_ac8 = auStack_450._8_8_;
    auVar24._16_8_ = auStack_450._0_8_;
    auVar24._0_16_ = local_460;
    auVar24._24_8_ = auStack_450._8_8_;
    auVar4 = vpshufb_avx2(*pauVar28,auVar24);
    *(undefined1 (*) [32])(local_19c8 + 0x20 + (ulong)(local_1de4 << 3) * 0x20) = auVar4;
    pauVar28 = (undefined1 (*) [32])(local_19c8 + 0xa0 + (ulong)(local_1de4 << 3) * 0x20);
    local_b00 = *(undefined8 *)*pauVar28;
    uStack_af8 = *(undefined8 *)(*pauVar28 + 8);
    uStack_af0 = *(undefined8 *)(*pauVar28 + 0x10);
    uStack_ae8 = *(undefined8 *)(*pauVar28 + 0x18);
    local_8a5 = 3;
    local_8a6 = 4;
    local_8a7 = 5;
    local_8a8 = 6;
    local_8a9 = 7;
    local_8aa = 0;
    local_8ab = 1;
    local_8ac = 2;
    local_8ad = 0xb;
    local_8ae = 0xc;
    local_8af = 0xd;
    local_8b0 = 0xe;
    local_8b1 = 0xf;
    local_8b2 = 8;
    local_8b3 = 9;
    local_8b4 = 10;
    local_8b5 = 0x13;
    local_8b6 = 0x14;
    local_8b7 = 0x15;
    local_8b8 = 0x16;
    local_8b9 = 0x17;
    local_8ba = 0x10;
    local_8bb = 0x11;
    local_8bc = 0x12;
    local_8bd = 0x1b;
    local_8be = 0x1c;
    local_8bf = 0x1d;
    local_8c0 = 0x1e;
    local_8c1 = 0x1f;
    local_8c2 = 0x18;
    local_8c3 = 0x19;
    local_8c4 = 0x1a;
    local_3e1 = 0x1a;
    local_3e2 = 0x19;
    local_3e3 = 0x18;
    local_3e4 = 0x1f;
    local_3e5 = 0x1e;
    local_3e6 = 0x1d;
    local_3e7 = 0x1c;
    local_3e8 = 0x1b;
    local_3e9 = 0x12;
    local_3ea = 0x11;
    local_3eb = 0x10;
    local_3ec = 0x17;
    local_3ed = 0x16;
    local_3ee = 0x15;
    local_3ef = 0x14;
    local_3f0 = 0x13;
    local_3f1 = 10;
    local_3f2 = 9;
    local_3f3 = 8;
    local_3f4 = 0xf;
    local_3f5 = 0xe;
    local_3f6 = 0xd;
    local_3f7 = 0xc;
    local_3f8 = 0xb;
    local_3f9 = 2;
    local_3fa = 1;
    local_3fb = 0;
    local_3fc = 7;
    local_3fd = 6;
    local_3fe = 5;
    local_3ff = 4;
    local_400 = 3;
    auVar2 = vpinsrb_avx(ZEXT116(0x13),0x14,1);
    auVar2 = vpinsrb_avx(auVar2,0x15,2);
    auVar2 = vpinsrb_avx(auVar2,0x16,3);
    auVar2 = vpinsrb_avx(auVar2,0x17,4);
    auVar2 = vpinsrb_avx(auVar2,0x10,5);
    auVar2 = vpinsrb_avx(auVar2,0x11,6);
    auVar2 = vpinsrb_avx(auVar2,0x12,7);
    auVar2 = vpinsrb_avx(auVar2,0x1b,8);
    auVar2 = vpinsrb_avx(auVar2,0x1c,9);
    auVar2 = vpinsrb_avx(auVar2,0x1d,10);
    auVar2 = vpinsrb_avx(auVar2,0x1e,0xb);
    auVar2 = vpinsrb_avx(auVar2,0x1f,0xc);
    auVar2 = vpinsrb_avx(auVar2,0x18,0xd);
    auVar2 = vpinsrb_avx(auVar2,0x19,0xe);
    auVar2 = vpinsrb_avx(auVar2,0x1a,0xf);
    auVar3 = vpinsrb_avx(ZEXT116(3),4,1);
    auVar3 = vpinsrb_avx(auVar3,5,2);
    auVar3 = vpinsrb_avx(auVar3,6,3);
    auVar3 = vpinsrb_avx(auVar3,7,4);
    auVar3 = vpinsrb_avx(auVar3,0,5);
    auVar3 = vpinsrb_avx(auVar3,1,6);
    auVar3 = vpinsrb_avx(auVar3,2,7);
    auVar3 = vpinsrb_avx(auVar3,0xb,8);
    auVar3 = vpinsrb_avx(auVar3,0xc,9);
    auVar3 = vpinsrb_avx(auVar3,0xd,10);
    auVar3 = vpinsrb_avx(auVar3,0xe,0xb);
    auVar3 = vpinsrb_avx(auVar3,0xf,0xc);
    auVar3 = vpinsrb_avx(auVar3,8,0xd);
    auVar3 = vpinsrb_avx(auVar3,9,0xe);
    auVar3 = vpinsrb_avx(auVar3,10,0xf);
    auVar36._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
    auVar36._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
    local_420._16_8_ = auVar36._16_8_;
    local_420._24_8_ = auVar36._24_8_;
    auVar23._16_8_ = local_420._16_8_;
    auVar23._0_16_ = auVar36._0_16_;
    auVar23._24_8_ = local_420._24_8_;
    auVar4 = vpshufb_avx2(*pauVar28,auVar23);
    *(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 * 8 + 5) * 0x20) = auVar4;
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 << 3) * 0x20);
    uVar35 = *puVar27;
    uVar44 = puVar27[1];
    uVar45 = puVar27[2];
    uVar46 = puVar27[3];
    x_03[0]._1_1_ = in_stack_ffffffffffffe079;
    x_03[0]._0_1_ = in_stack_ffffffffffffe078;
    x_03[0]._2_1_ = in_stack_ffffffffffffe07a;
    x_03[0]._3_1_ = in_stack_ffffffffffffe07b;
    x_03[0]._4_1_ = in_stack_ffffffffffffe07c;
    x_03[0]._5_1_ = in_stack_ffffffffffffe07d;
    x_03[0]._6_1_ = in_stack_ffffffffffffe07e;
    x_03[0]._7_1_ = in_stack_ffffffffffffe07f;
    x_03[1]._0_1_ = in_stack_ffffffffffffe080;
    x_03[1]._1_1_ = in_stack_ffffffffffffe081;
    x_03[1]._2_1_ = in_stack_ffffffffffffe082;
    x_03[1]._3_1_ = in_stack_ffffffffffffe083;
    x_03[1]._4_1_ = in_stack_ffffffffffffe084;
    x_03[1]._5_1_ = in_stack_ffffffffffffe085;
    x_03[1]._6_1_ = in_stack_ffffffffffffe086;
    x_03[1]._7_1_ = in_stack_ffffffffffffe087;
    x_03[2]._0_1_ = in_stack_ffffffffffffe088;
    x_03[2]._1_1_ = in_stack_ffffffffffffe089;
    x_03[2]._2_1_ = in_stack_ffffffffffffe08a;
    x_03[2]._3_1_ = in_stack_ffffffffffffe08b;
    x_03[2]._4_1_ = in_stack_ffffffffffffe08c;
    x_03[2]._5_1_ = in_stack_ffffffffffffe08d;
    x_03[2]._6_1_ = in_stack_ffffffffffffe08e;
    x_03[2]._7_1_ = in_stack_ffffffffffffe08f;
    x_03[3]._0_1_ = in_stack_ffffffffffffe090;
    x_03[3]._1_1_ = in_stack_ffffffffffffe091;
    x_03[3]._2_1_ = in_stack_ffffffffffffe092;
    x_03[3]._3_1_ = in_stack_ffffffffffffe093;
    x_03[3]._4_1_ = in_stack_ffffffffffffe094;
    x_03[3]._5_1_ = in_stack_ffffffffffffe095;
    x_03[3]._6_1_ = in_stack_ffffffffffffe096;
    x_03[3]._7_1_ = in_stack_ffffffffffffe097;
    y_03[0]._1_1_ = in_stack_ffffffffffffe059;
    y_03[0]._0_1_ = in_stack_ffffffffffffe058;
    y_03[0]._2_1_ = in_stack_ffffffffffffe05a;
    y_03[0]._3_1_ = in_stack_ffffffffffffe05b;
    y_03[0]._4_1_ = in_stack_ffffffffffffe05c;
    y_03[0]._5_1_ = in_stack_ffffffffffffe05d;
    y_03[0]._6_1_ = in_stack_ffffffffffffe05e;
    y_03[0]._7_1_ = in_stack_ffffffffffffe05f;
    y_03[1]._0_1_ = in_stack_ffffffffffffe060;
    y_03[1]._1_1_ = in_stack_ffffffffffffe061;
    y_03[1]._2_1_ = in_stack_ffffffffffffe062;
    y_03[1]._3_1_ = in_stack_ffffffffffffe063;
    y_03[1]._4_1_ = in_stack_ffffffffffffe064;
    y_03[1]._5_1_ = in_stack_ffffffffffffe065;
    y_03[1]._6_1_ = in_stack_ffffffffffffe066;
    y_03[1]._7_1_ = in_stack_ffffffffffffe067;
    y_03[2]._0_1_ = in_stack_ffffffffffffe068;
    y_03[2]._1_1_ = in_stack_ffffffffffffe069;
    y_03[2]._2_1_ = in_stack_ffffffffffffe06a;
    y_03[2]._3_1_ = in_stack_ffffffffffffe06b;
    y_03[2]._4_1_ = in_stack_ffffffffffffe06c;
    y_03[2]._5_1_ = in_stack_ffffffffffffe06d;
    y_03[2]._6_1_ = in_stack_ffffffffffffe06e;
    y_03[2]._7_1_ = in_stack_ffffffffffffe06f;
    y_03[3]._0_1_ = in_stack_ffffffffffffe070;
    y_03[3]._1_1_ = in_stack_ffffffffffffe071;
    y_03[3]._2_1_ = in_stack_ffffffffffffe072;
    y_03[3]._3_1_ = in_stack_ffffffffffffe073;
    y_03[3]._4_1_ = in_stack_ffffffffffffe074;
    y_03[3]._5_1_ = in_stack_ffffffffffffe075;
    y_03[3]._6_1_ = in_stack_ffffffffffffe076;
    y_03[3]._7_1_ = in_stack_ffffffffffffe077;
    local_420 = auVar36;
    local_b20 = auVar36._0_16_;
    auStack_b10 = auVar36._16_16_;
    f(x_03,y_03);
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 << 3) * 0x20);
    *puVar27 = uVar35;
    puVar27[1] = uVar44;
    puVar27[2] = uVar45;
    puVar27[3] = uVar46;
    puVar27 = (undefined8 *)(local_19c8 + 0x80 + (ulong)(local_1de4 << 3) * 0x20);
    uVar35 = *puVar27;
    uVar44 = puVar27[1];
    uVar45 = puVar27[2];
    uVar46 = puVar27[3];
    x_04[0]._1_1_ = in_stack_ffffffffffffe079;
    x_04[0]._0_1_ = in_stack_ffffffffffffe078;
    x_04[0]._2_1_ = in_stack_ffffffffffffe07a;
    x_04[0]._3_1_ = in_stack_ffffffffffffe07b;
    x_04[0]._4_1_ = in_stack_ffffffffffffe07c;
    x_04[0]._5_1_ = in_stack_ffffffffffffe07d;
    x_04[0]._6_1_ = in_stack_ffffffffffffe07e;
    x_04[0]._7_1_ = in_stack_ffffffffffffe07f;
    x_04[1]._0_1_ = in_stack_ffffffffffffe080;
    x_04[1]._1_1_ = in_stack_ffffffffffffe081;
    x_04[1]._2_1_ = in_stack_ffffffffffffe082;
    x_04[1]._3_1_ = in_stack_ffffffffffffe083;
    x_04[1]._4_1_ = in_stack_ffffffffffffe084;
    x_04[1]._5_1_ = in_stack_ffffffffffffe085;
    x_04[1]._6_1_ = in_stack_ffffffffffffe086;
    x_04[1]._7_1_ = in_stack_ffffffffffffe087;
    x_04[2]._0_1_ = in_stack_ffffffffffffe088;
    x_04[2]._1_1_ = in_stack_ffffffffffffe089;
    x_04[2]._2_1_ = in_stack_ffffffffffffe08a;
    x_04[2]._3_1_ = in_stack_ffffffffffffe08b;
    x_04[2]._4_1_ = in_stack_ffffffffffffe08c;
    x_04[2]._5_1_ = in_stack_ffffffffffffe08d;
    x_04[2]._6_1_ = in_stack_ffffffffffffe08e;
    x_04[2]._7_1_ = in_stack_ffffffffffffe08f;
    x_04[3]._0_1_ = in_stack_ffffffffffffe090;
    x_04[3]._1_1_ = in_stack_ffffffffffffe091;
    x_04[3]._2_1_ = in_stack_ffffffffffffe092;
    x_04[3]._3_1_ = in_stack_ffffffffffffe093;
    x_04[3]._4_1_ = in_stack_ffffffffffffe094;
    x_04[3]._5_1_ = in_stack_ffffffffffffe095;
    x_04[3]._6_1_ = in_stack_ffffffffffffe096;
    x_04[3]._7_1_ = in_stack_ffffffffffffe097;
    y_04[0]._1_1_ = in_stack_ffffffffffffe059;
    y_04[0]._0_1_ = in_stack_ffffffffffffe058;
    y_04[0]._2_1_ = in_stack_ffffffffffffe05a;
    y_04[0]._3_1_ = in_stack_ffffffffffffe05b;
    y_04[0]._4_1_ = in_stack_ffffffffffffe05c;
    y_04[0]._5_1_ = in_stack_ffffffffffffe05d;
    y_04[0]._6_1_ = in_stack_ffffffffffffe05e;
    y_04[0]._7_1_ = in_stack_ffffffffffffe05f;
    y_04[1]._0_1_ = in_stack_ffffffffffffe060;
    y_04[1]._1_1_ = in_stack_ffffffffffffe061;
    y_04[1]._2_1_ = in_stack_ffffffffffffe062;
    y_04[1]._3_1_ = in_stack_ffffffffffffe063;
    y_04[1]._4_1_ = in_stack_ffffffffffffe064;
    y_04[1]._5_1_ = in_stack_ffffffffffffe065;
    y_04[1]._6_1_ = in_stack_ffffffffffffe066;
    y_04[1]._7_1_ = in_stack_ffffffffffffe067;
    y_04[2]._0_1_ = in_stack_ffffffffffffe068;
    y_04[2]._1_1_ = in_stack_ffffffffffffe069;
    y_04[2]._2_1_ = in_stack_ffffffffffffe06a;
    y_04[2]._3_1_ = in_stack_ffffffffffffe06b;
    y_04[2]._4_1_ = in_stack_ffffffffffffe06c;
    y_04[2]._5_1_ = in_stack_ffffffffffffe06d;
    y_04[2]._6_1_ = in_stack_ffffffffffffe06e;
    y_04[2]._7_1_ = in_stack_ffffffffffffe06f;
    y_04[3]._0_1_ = in_stack_ffffffffffffe070;
    y_04[3]._1_1_ = in_stack_ffffffffffffe071;
    y_04[3]._2_1_ = in_stack_ffffffffffffe072;
    y_04[3]._3_1_ = in_stack_ffffffffffffe073;
    y_04[3]._4_1_ = in_stack_ffffffffffffe074;
    y_04[3]._5_1_ = in_stack_ffffffffffffe075;
    y_04[3]._6_1_ = in_stack_ffffffffffffe076;
    y_04[3]._7_1_ = in_stack_ffffffffffffe077;
    f(x_04,y_04);
    puVar27 = (undefined8 *)(local_19c8 + 0x80 + (ulong)(local_1de4 << 3) * 0x20);
    *puVar27 = uVar35;
    puVar27[1] = uVar44;
    puVar27[2] = uVar45;
    puVar27[3] = uVar46;
    lVar32 = (ulong)(local_1de4 << 3) * 0x20;
    puVar26 = (ulong *)(local_19c8 + lVar32);
    local_10c0 = *puVar26;
    uStack_10b8 = puVar26[1];
    uStack_10b0 = puVar26[2];
    uStack_10a8 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + 0x60 + lVar32);
    local_10a0 = *puVar26;
    uStack_1098 = puVar26[1];
    uStack_1090 = puVar26[2];
    uStack_1088 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + 0x60 + (ulong)(local_1de4 << 3) * 0x20);
    *puVar26 = local_10a0 ^ local_10c0;
    puVar26[1] = uStack_1098 ^ uStack_10b8;
    puVar26[2] = uStack_1090 ^ uStack_10b0;
    puVar26[3] = uStack_1088 ^ uStack_10a8;
    lVar32 = (ulong)(local_1de4 << 3) * 0x20;
    puVar26 = (ulong *)(local_19c8 + 0x80 + lVar32);
    local_1100 = *puVar26;
    uStack_10f8 = puVar26[1];
    uStack_10f0 = puVar26[2];
    uStack_10e8 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + 0xe0 + lVar32);
    local_10e0 = *puVar26;
    uStack_10d8 = puVar26[1];
    uStack_10d0 = puVar26[2];
    uStack_10c8 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + 0xe0 + (ulong)(local_1de4 << 3) * 0x20);
    *puVar26 = local_10e0 ^ local_1100;
    puVar26[1] = uStack_10d8 ^ uStack_10f8;
    puVar26[2] = uStack_10d0 ^ uStack_10f0;
    puVar26[3] = uStack_10c8 ^ uStack_10e8;
    pauVar28 = (undefined1 (*) [32])(local_19c8 + 0x60 + (ulong)(local_1de4 << 3) * 0x20);
    local_b40 = *(undefined8 *)*pauVar28;
    uStack_b38 = *(undefined8 *)(*pauVar28 + 8);
    uStack_b30 = *(undefined8 *)(*pauVar28 + 0x10);
    uStack_b28 = *(undefined8 *)(*pauVar28 + 0x18);
    local_8c5 = 2;
    local_8c6 = 3;
    local_8c7 = 4;
    local_8c8 = 5;
    local_8c9 = 6;
    local_8ca = 7;
    local_8cb = 0;
    local_8cc = 1;
    local_8cd = 10;
    local_8ce = 0xb;
    local_8cf = 0xc;
    local_8d0 = 0xd;
    local_8d1 = 0xe;
    local_8d2 = 0xf;
    local_8d3 = 8;
    local_8d4 = 9;
    local_8d5 = 0x12;
    local_8d6 = 0x13;
    local_8d7 = 0x14;
    local_8d8 = 0x15;
    local_8d9 = 0x16;
    local_8da = 0x17;
    local_8db = 0x10;
    local_8dc = 0x11;
    local_8dd = 0x1a;
    local_8de = 0x1b;
    local_8df = 0x1c;
    local_8e0 = 0x1d;
    local_8e1 = 0x1e;
    local_8e2 = 0x1f;
    local_8e3 = 0x18;
    local_8e4 = 0x19;
    local_3a1 = 0x19;
    local_3a2 = 0x18;
    local_3a3 = 0x1f;
    local_3a4 = 0x1e;
    local_3a5 = 0x1d;
    local_3a6 = 0x1c;
    local_3a7 = 0x1b;
    local_3a8 = 0x1a;
    local_3a9 = 0x11;
    local_3aa = 0x10;
    local_3ab = 0x17;
    local_3ac = 0x16;
    local_3ad = 0x15;
    local_3ae = 0x14;
    local_3af = 0x13;
    local_3b0 = 0x12;
    local_3b1 = 9;
    local_3b2 = 8;
    local_3b3 = 0xf;
    local_3b4 = 0xe;
    local_3b5 = 0xd;
    local_3b6 = 0xc;
    local_3b7 = 0xb;
    local_3b8 = 10;
    local_3b9 = 1;
    local_3ba = 0;
    local_3bb = 7;
    local_3bc = 6;
    local_3bd = 5;
    local_3be = 4;
    local_3bf = 3;
    local_3c0 = 2;
    auVar2 = vpinsrb_avx(ZEXT116(2),3,1);
    auVar2 = vpinsrb_avx(auVar2,4,2);
    auVar2 = vpinsrb_avx(auVar2,5,3);
    auVar2 = vpinsrb_avx(auVar2,6,4);
    auVar2 = vpinsrb_avx(auVar2,7,5);
    auVar2 = vpinsrb_avx(auVar2,0,6);
    auVar2 = vpinsrb_avx(auVar2,1,7);
    auVar2 = vpinsrb_avx(auVar2,10,8);
    auVar2 = vpinsrb_avx(auVar2,0xb,9);
    auVar2 = vpinsrb_avx(auVar2,0xc,10);
    auVar2 = vpinsrb_avx(auVar2,0xd,0xb);
    auVar2 = vpinsrb_avx(auVar2,0xe,0xc);
    auVar2 = vpinsrb_avx(auVar2,0xf,0xd);
    auVar2 = vpinsrb_avx(auVar2,8,0xe);
    local_3e0 = vpinsrb_avx(auVar2,9,0xf);
    auVar2 = vpinsrb_avx(ZEXT116(0x12),0x13,1);
    auVar2 = vpinsrb_avx(auVar2,0x14,2);
    auVar2 = vpinsrb_avx(auVar2,0x15,3);
    auVar2 = vpinsrb_avx(auVar2,0x16,4);
    auVar2 = vpinsrb_avx(auVar2,0x17,5);
    auVar2 = vpinsrb_avx(auVar2,0x10,6);
    auVar2 = vpinsrb_avx(auVar2,0x11,7);
    auVar2 = vpinsrb_avx(auVar2,0x1a,8);
    auVar2 = vpinsrb_avx(auVar2,0x1b,9);
    auVar2 = vpinsrb_avx(auVar2,0x1c,10);
    auVar2 = vpinsrb_avx(auVar2,0x1d,0xb);
    auVar2 = vpinsrb_avx(auVar2,0x1e,0xc);
    auVar2 = vpinsrb_avx(auVar2,0x1f,0xd);
    auVar2 = vpinsrb_avx(auVar2,0x18,0xe);
    auStack_3d0 = vpinsrb_avx(auVar2,0x19,0xf);
    local_b60 = local_3e0._0_8_;
    uStack_b58 = local_3e0._8_8_;
    uStack_b50 = auStack_3d0._0_8_;
    uStack_b48 = auStack_3d0._8_8_;
    auVar22._16_8_ = auStack_3d0._0_8_;
    auVar22._0_16_ = local_3e0;
    auVar22._24_8_ = auStack_3d0._8_8_;
    auVar4 = vpshufb_avx2(*pauVar28,auVar22);
    *(undefined1 (*) [32])(local_19c8 + 0x60 + (ulong)(local_1de4 << 3) * 0x20) = auVar4;
    pauVar28 = (undefined1 (*) [32])(local_19c8 + 0xe0 + (ulong)(local_1de4 << 3) * 0x20);
    local_b80 = *(undefined8 *)*pauVar28;
    uStack_b78 = *(undefined8 *)(*pauVar28 + 8);
    uStack_b70 = *(undefined8 *)(*pauVar28 + 0x10);
    uStack_b68 = *(undefined8 *)(*pauVar28 + 0x18);
    local_8e5 = 2;
    local_8e6 = 3;
    local_8e7 = 4;
    local_8e8 = 5;
    local_8e9 = 6;
    local_8ea = 7;
    local_8eb = 0;
    local_8ec = 1;
    local_8ed = 10;
    local_8ee = 0xb;
    local_8ef = 0xc;
    local_8f0 = 0xd;
    local_8f1 = 0xe;
    local_8f2 = 0xf;
    local_8f3 = 8;
    local_8f4 = 9;
    local_8f5 = 0x12;
    local_8f6 = 0x13;
    local_8f7 = 0x14;
    local_8f8 = 0x15;
    local_8f9 = 0x16;
    local_8fa = 0x17;
    local_8fb = 0x10;
    local_8fc = 0x11;
    local_8fd = 0x1a;
    local_8fe = 0x1b;
    local_8ff = 0x1c;
    local_900 = 0x1d;
    local_901 = 0x1e;
    local_902 = 0x1f;
    local_903 = 0x18;
    local_904 = 0x19;
    local_361 = 0x19;
    local_362 = 0x18;
    local_363 = 0x1f;
    local_364 = 0x1e;
    local_365 = 0x1d;
    local_366 = 0x1c;
    local_367 = 0x1b;
    local_368 = 0x1a;
    local_369 = 0x11;
    local_36a = 0x10;
    local_36b = 0x17;
    local_36c = 0x16;
    local_36d = 0x15;
    local_36e = 0x14;
    local_36f = 0x13;
    local_370 = 0x12;
    local_371 = 9;
    local_372 = 8;
    local_373 = 0xf;
    local_374 = 0xe;
    local_375 = 0xd;
    local_376 = 0xc;
    local_377 = 0xb;
    local_378 = 10;
    local_379 = 1;
    local_37a = 0;
    local_37b = 7;
    local_37c = 6;
    local_37d = 5;
    local_37e = 4;
    local_37f = 3;
    local_380 = 2;
    auVar2 = vpinsrb_avx(ZEXT116(0x12),0x13,1);
    auVar2 = vpinsrb_avx(auVar2,0x14,2);
    auVar2 = vpinsrb_avx(auVar2,0x15,3);
    auVar2 = vpinsrb_avx(auVar2,0x16,4);
    auVar2 = vpinsrb_avx(auVar2,0x17,5);
    auVar2 = vpinsrb_avx(auVar2,0x10,6);
    auVar2 = vpinsrb_avx(auVar2,0x11,7);
    auVar2 = vpinsrb_avx(auVar2,0x1a,8);
    auVar2 = vpinsrb_avx(auVar2,0x1b,9);
    auVar2 = vpinsrb_avx(auVar2,0x1c,10);
    auVar2 = vpinsrb_avx(auVar2,0x1d,0xb);
    auVar2 = vpinsrb_avx(auVar2,0x1e,0xc);
    auVar2 = vpinsrb_avx(auVar2,0x1f,0xd);
    auVar2 = vpinsrb_avx(auVar2,0x18,0xe);
    auVar2 = vpinsrb_avx(auVar2,0x19,0xf);
    auVar3 = vpinsrb_avx(ZEXT116(2),3,1);
    auVar3 = vpinsrb_avx(auVar3,4,2);
    auVar3 = vpinsrb_avx(auVar3,5,3);
    auVar3 = vpinsrb_avx(auVar3,6,4);
    auVar3 = vpinsrb_avx(auVar3,7,5);
    auVar3 = vpinsrb_avx(auVar3,0,6);
    auVar3 = vpinsrb_avx(auVar3,1,7);
    auVar3 = vpinsrb_avx(auVar3,10,8);
    auVar3 = vpinsrb_avx(auVar3,0xb,9);
    auVar3 = vpinsrb_avx(auVar3,0xc,10);
    auVar3 = vpinsrb_avx(auVar3,0xd,0xb);
    auVar3 = vpinsrb_avx(auVar3,0xe,0xc);
    auVar3 = vpinsrb_avx(auVar3,0xf,0xd);
    auVar3 = vpinsrb_avx(auVar3,8,0xe);
    auVar3 = vpinsrb_avx(auVar3,9,0xf);
    auVar37._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
    auVar37._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
    local_3a0._16_8_ = auVar37._16_8_;
    local_3a0._24_8_ = auVar37._24_8_;
    auVar21._16_8_ = local_3a0._16_8_;
    auVar21._0_16_ = auVar37._0_16_;
    auVar21._24_8_ = local_3a0._24_8_;
    auVar4 = vpshufb_avx2(*pauVar28,auVar21);
    *(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 * 8 + 7) * 0x20) = auVar4;
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 * 8 + 2) * 0x20);
    uVar35 = *puVar27;
    uVar44 = puVar27[1];
    uVar45 = puVar27[2];
    uVar46 = puVar27[3];
    x_05[0]._1_1_ = in_stack_ffffffffffffe079;
    x_05[0]._0_1_ = in_stack_ffffffffffffe078;
    x_05[0]._2_1_ = in_stack_ffffffffffffe07a;
    x_05[0]._3_1_ = in_stack_ffffffffffffe07b;
    x_05[0]._4_1_ = in_stack_ffffffffffffe07c;
    x_05[0]._5_1_ = in_stack_ffffffffffffe07d;
    x_05[0]._6_1_ = in_stack_ffffffffffffe07e;
    x_05[0]._7_1_ = in_stack_ffffffffffffe07f;
    x_05[1]._0_1_ = in_stack_ffffffffffffe080;
    x_05[1]._1_1_ = in_stack_ffffffffffffe081;
    x_05[1]._2_1_ = in_stack_ffffffffffffe082;
    x_05[1]._3_1_ = in_stack_ffffffffffffe083;
    x_05[1]._4_1_ = in_stack_ffffffffffffe084;
    x_05[1]._5_1_ = in_stack_ffffffffffffe085;
    x_05[1]._6_1_ = in_stack_ffffffffffffe086;
    x_05[1]._7_1_ = in_stack_ffffffffffffe087;
    x_05[2]._0_1_ = in_stack_ffffffffffffe088;
    x_05[2]._1_1_ = in_stack_ffffffffffffe089;
    x_05[2]._2_1_ = in_stack_ffffffffffffe08a;
    x_05[2]._3_1_ = in_stack_ffffffffffffe08b;
    x_05[2]._4_1_ = in_stack_ffffffffffffe08c;
    x_05[2]._5_1_ = in_stack_ffffffffffffe08d;
    x_05[2]._6_1_ = in_stack_ffffffffffffe08e;
    x_05[2]._7_1_ = in_stack_ffffffffffffe08f;
    x_05[3]._0_1_ = in_stack_ffffffffffffe090;
    x_05[3]._1_1_ = in_stack_ffffffffffffe091;
    x_05[3]._2_1_ = in_stack_ffffffffffffe092;
    x_05[3]._3_1_ = in_stack_ffffffffffffe093;
    x_05[3]._4_1_ = in_stack_ffffffffffffe094;
    x_05[3]._5_1_ = in_stack_ffffffffffffe095;
    x_05[3]._6_1_ = in_stack_ffffffffffffe096;
    x_05[3]._7_1_ = in_stack_ffffffffffffe097;
    y_05[0]._1_1_ = in_stack_ffffffffffffe059;
    y_05[0]._0_1_ = in_stack_ffffffffffffe058;
    y_05[0]._2_1_ = in_stack_ffffffffffffe05a;
    y_05[0]._3_1_ = in_stack_ffffffffffffe05b;
    y_05[0]._4_1_ = in_stack_ffffffffffffe05c;
    y_05[0]._5_1_ = in_stack_ffffffffffffe05d;
    y_05[0]._6_1_ = in_stack_ffffffffffffe05e;
    y_05[0]._7_1_ = in_stack_ffffffffffffe05f;
    y_05[1]._0_1_ = in_stack_ffffffffffffe060;
    y_05[1]._1_1_ = in_stack_ffffffffffffe061;
    y_05[1]._2_1_ = in_stack_ffffffffffffe062;
    y_05[1]._3_1_ = in_stack_ffffffffffffe063;
    y_05[1]._4_1_ = in_stack_ffffffffffffe064;
    y_05[1]._5_1_ = in_stack_ffffffffffffe065;
    y_05[1]._6_1_ = in_stack_ffffffffffffe066;
    y_05[1]._7_1_ = in_stack_ffffffffffffe067;
    y_05[2]._0_1_ = in_stack_ffffffffffffe068;
    y_05[2]._1_1_ = in_stack_ffffffffffffe069;
    y_05[2]._2_1_ = in_stack_ffffffffffffe06a;
    y_05[2]._3_1_ = in_stack_ffffffffffffe06b;
    y_05[2]._4_1_ = in_stack_ffffffffffffe06c;
    y_05[2]._5_1_ = in_stack_ffffffffffffe06d;
    y_05[2]._6_1_ = in_stack_ffffffffffffe06e;
    y_05[2]._7_1_ = in_stack_ffffffffffffe06f;
    y_05[3]._0_1_ = in_stack_ffffffffffffe070;
    y_05[3]._1_1_ = in_stack_ffffffffffffe071;
    y_05[3]._2_1_ = in_stack_ffffffffffffe072;
    y_05[3]._3_1_ = in_stack_ffffffffffffe073;
    y_05[3]._4_1_ = in_stack_ffffffffffffe074;
    y_05[3]._5_1_ = in_stack_ffffffffffffe075;
    y_05[3]._6_1_ = in_stack_ffffffffffffe076;
    y_05[3]._7_1_ = in_stack_ffffffffffffe077;
    local_3a0 = auVar37;
    local_ba0 = auVar37._0_16_;
    auStack_b90 = auVar37._16_16_;
    f(x_05,y_05);
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 * 8 + 2) * 0x20);
    *puVar27 = uVar35;
    puVar27[1] = uVar44;
    puVar27[2] = uVar45;
    puVar27[3] = uVar46;
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 * 8 + 6) * 0x20);
    uVar35 = *puVar27;
    uVar44 = puVar27[1];
    uVar45 = puVar27[2];
    uVar46 = puVar27[3];
    x_06[0]._1_1_ = in_stack_ffffffffffffe079;
    x_06[0]._0_1_ = in_stack_ffffffffffffe078;
    x_06[0]._2_1_ = in_stack_ffffffffffffe07a;
    x_06[0]._3_1_ = in_stack_ffffffffffffe07b;
    x_06[0]._4_1_ = in_stack_ffffffffffffe07c;
    x_06[0]._5_1_ = in_stack_ffffffffffffe07d;
    x_06[0]._6_1_ = in_stack_ffffffffffffe07e;
    x_06[0]._7_1_ = in_stack_ffffffffffffe07f;
    x_06[1]._0_1_ = in_stack_ffffffffffffe080;
    x_06[1]._1_1_ = in_stack_ffffffffffffe081;
    x_06[1]._2_1_ = in_stack_ffffffffffffe082;
    x_06[1]._3_1_ = in_stack_ffffffffffffe083;
    x_06[1]._4_1_ = in_stack_ffffffffffffe084;
    x_06[1]._5_1_ = in_stack_ffffffffffffe085;
    x_06[1]._6_1_ = in_stack_ffffffffffffe086;
    x_06[1]._7_1_ = in_stack_ffffffffffffe087;
    x_06[2]._0_1_ = in_stack_ffffffffffffe088;
    x_06[2]._1_1_ = in_stack_ffffffffffffe089;
    x_06[2]._2_1_ = in_stack_ffffffffffffe08a;
    x_06[2]._3_1_ = in_stack_ffffffffffffe08b;
    x_06[2]._4_1_ = in_stack_ffffffffffffe08c;
    x_06[2]._5_1_ = in_stack_ffffffffffffe08d;
    x_06[2]._6_1_ = in_stack_ffffffffffffe08e;
    x_06[2]._7_1_ = in_stack_ffffffffffffe08f;
    x_06[3]._0_1_ = in_stack_ffffffffffffe090;
    x_06[3]._1_1_ = in_stack_ffffffffffffe091;
    x_06[3]._2_1_ = in_stack_ffffffffffffe092;
    x_06[3]._3_1_ = in_stack_ffffffffffffe093;
    x_06[3]._4_1_ = in_stack_ffffffffffffe094;
    x_06[3]._5_1_ = in_stack_ffffffffffffe095;
    x_06[3]._6_1_ = in_stack_ffffffffffffe096;
    x_06[3]._7_1_ = in_stack_ffffffffffffe097;
    y_06[0]._1_1_ = in_stack_ffffffffffffe059;
    y_06[0]._0_1_ = in_stack_ffffffffffffe058;
    y_06[0]._2_1_ = in_stack_ffffffffffffe05a;
    y_06[0]._3_1_ = in_stack_ffffffffffffe05b;
    y_06[0]._4_1_ = in_stack_ffffffffffffe05c;
    y_06[0]._5_1_ = in_stack_ffffffffffffe05d;
    y_06[0]._6_1_ = in_stack_ffffffffffffe05e;
    y_06[0]._7_1_ = in_stack_ffffffffffffe05f;
    y_06[1]._0_1_ = in_stack_ffffffffffffe060;
    y_06[1]._1_1_ = in_stack_ffffffffffffe061;
    y_06[1]._2_1_ = in_stack_ffffffffffffe062;
    y_06[1]._3_1_ = in_stack_ffffffffffffe063;
    y_06[1]._4_1_ = in_stack_ffffffffffffe064;
    y_06[1]._5_1_ = in_stack_ffffffffffffe065;
    y_06[1]._6_1_ = in_stack_ffffffffffffe066;
    y_06[1]._7_1_ = in_stack_ffffffffffffe067;
    y_06[2]._0_1_ = in_stack_ffffffffffffe068;
    y_06[2]._1_1_ = in_stack_ffffffffffffe069;
    y_06[2]._2_1_ = in_stack_ffffffffffffe06a;
    y_06[2]._3_1_ = in_stack_ffffffffffffe06b;
    y_06[2]._4_1_ = in_stack_ffffffffffffe06c;
    y_06[2]._5_1_ = in_stack_ffffffffffffe06d;
    y_06[2]._6_1_ = in_stack_ffffffffffffe06e;
    y_06[2]._7_1_ = in_stack_ffffffffffffe06f;
    y_06[3]._0_1_ = in_stack_ffffffffffffe070;
    y_06[3]._1_1_ = in_stack_ffffffffffffe071;
    y_06[3]._2_1_ = in_stack_ffffffffffffe072;
    y_06[3]._3_1_ = in_stack_ffffffffffffe073;
    y_06[3]._4_1_ = in_stack_ffffffffffffe074;
    y_06[3]._5_1_ = in_stack_ffffffffffffe075;
    y_06[3]._6_1_ = in_stack_ffffffffffffe076;
    y_06[3]._7_1_ = in_stack_ffffffffffffe077;
    f(x_06,y_06);
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 * 8 + 6) * 0x20);
    *puVar27 = uVar35;
    puVar27[1] = uVar44;
    puVar27[2] = uVar45;
    puVar27[3] = uVar46;
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 * 8 + 1) * 0x20);
    local_1120 = *puVar26;
    uStack_1118 = puVar26[1];
    uStack_1110 = puVar26[2];
    uStack_1108 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 * 8 + 2) * 0x20);
    local_1140 = *puVar26;
    uStack_1138 = puVar26[1];
    uStack_1130 = puVar26[2];
    uStack_1128 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 * 8 + 1) * 0x20);
    *puVar26 = local_1120 ^ local_1140;
    puVar26[1] = uStack_1118 ^ uStack_1138;
    puVar26[2] = uStack_1110 ^ uStack_1130;
    puVar26[3] = uStack_1108 ^ uStack_1128;
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 * 8 + 5) * 0x20);
    local_1160 = *puVar26;
    uStack_1158 = puVar26[1];
    uStack_1150 = puVar26[2];
    uStack_1148 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 * 8 + 6) * 0x20);
    local_1180 = *puVar26;
    uStack_1178 = puVar26[1];
    uStack_1170 = puVar26[2];
    uStack_1168 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 * 8 + 5) * 0x20);
    *puVar26 = local_1160 ^ local_1180;
    puVar26[1] = uStack_1158 ^ uStack_1178;
    puVar26[2] = uStack_1150 ^ uStack_1170;
    puVar26[3] = uStack_1148 ^ uStack_1168;
    pauVar28 = (undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 * 8 + 1) * 0x20);
    local_6c0 = *(undefined8 *)*pauVar28;
    uStack_6b8 = *(undefined8 *)(*pauVar28 + 8);
    uStack_6b0 = *(undefined8 *)(*pauVar28 + 0x10);
    uStack_6a8 = *(undefined8 *)(*pauVar28 + 0x18);
    local_6c4 = 0x3f;
    local_11a0 = vpsrlq_avx2(*pauVar28,ZEXT416(0x3f));
    pauVar28 = (undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 * 8 + 1) * 0x20);
    local_4c0 = *(undefined8 *)*pauVar28;
    uStack_4b8 = *(undefined8 *)(*pauVar28 + 8);
    uStack_4b0 = *(undefined8 *)(*pauVar28 + 0x10);
    uStack_4a8 = *(undefined8 *)(*pauVar28 + 0x18);
    pauVar29 = (undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 * 8 + 1) * 0x20);
    local_4e0 = *(undefined8 *)*pauVar29;
    uStack_4d8 = *(undefined8 *)(*pauVar29 + 8);
    uStack_4d0 = *(undefined8 *)(*pauVar29 + 0x10);
    uStack_4c8 = *(undefined8 *)(*pauVar29 + 0x18);
    local_11c0 = vpaddq_avx2(*pauVar28,*pauVar29);
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 * 8 + 1) * 0x20);
    *puVar26 = local_11a0._0_8_ ^ local_11c0._0_8_;
    puVar26[1] = local_11a0._8_8_ ^ local_11c0._8_8_;
    puVar26[2] = local_11a0._16_8_ ^ local_11c0._16_8_;
    puVar26[3] = local_11a0._24_8_ ^ local_11c0._24_8_;
    pauVar28 = (undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 * 8 + 5) * 0x20);
    local_700 = *(undefined8 *)*pauVar28;
    uStack_6f8 = *(undefined8 *)(*pauVar28 + 8);
    uStack_6f0 = *(undefined8 *)(*pauVar28 + 0x10);
    uStack_6e8 = *(undefined8 *)(*pauVar28 + 0x18);
    local_704 = 0x3f;
    local_11e0 = vpsrlq_avx2(*pauVar28,ZEXT416(0x3f));
    pauVar28 = (undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 * 8 + 5) * 0x20);
    local_500 = *(undefined8 *)*pauVar28;
    uStack_4f8 = *(undefined8 *)(*pauVar28 + 8);
    uStack_4f0 = *(undefined8 *)(*pauVar28 + 0x10);
    uStack_4e8 = *(undefined8 *)(*pauVar28 + 0x18);
    pauVar29 = (undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 * 8 + 5) * 0x20);
    local_520 = *(undefined8 *)*pauVar29;
    uStack_518 = *(undefined8 *)(*pauVar29 + 8);
    uStack_510 = *(undefined8 *)(*pauVar29 + 0x10);
    uStack_508 = *(undefined8 *)(*pauVar29 + 0x18);
    local_1200 = vpaddq_avx2(*pauVar28,*pauVar29);
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 * 8 + 5) * 0x20);
    *puVar26 = local_11e0._0_8_ ^ local_1200._0_8_;
    puVar26[1] = local_11e0._8_8_ ^ local_1200._8_8_;
    puVar26[2] = local_11e0._16_8_ ^ local_1200._16_8_;
    puVar26[3] = local_11e0._24_8_ ^ local_1200._24_8_;
    lVar32 = (ulong)(local_1de4 << 3) * 0x20;
    auVar4 = vpermq_avx2(*(undefined1 (*) [32])(local_19c8 + 0x20 + lVar32),0x39);
    *(undefined1 (*) [32])(local_19c8 + 0x20 + lVar32) = auVar4;
    lVar32 = (ulong)(local_1de4 << 3) * 0x20;
    auVar4 = vpermq_avx2(*(undefined1 (*) [32])(local_19c8 + 0xa0 + lVar32),0x39);
    *(undefined1 (*) [32])(local_19c8 + 0xa0 + lVar32) = auVar4;
    lVar32 = (ulong)(local_1de4 << 3) * 0x20;
    auVar4 = vpermq_avx2(*(undefined1 (*) [32])(local_19c8 + 0x40 + lVar32),0x4e);
    *(undefined1 (*) [32])(local_19c8 + 0x40 + lVar32) = auVar4;
    lVar32 = (ulong)(local_1de4 << 3) * 0x20;
    auVar4 = vpermq_avx2(*(undefined1 (*) [32])(local_19c8 + 0xc0 + lVar32),0x4e);
    *(undefined1 (*) [32])(local_19c8 + 0xc0 + lVar32) = auVar4;
    lVar32 = (ulong)(local_1de4 << 3) * 0x20;
    auVar4 = vpermq_avx2(*(undefined1 (*) [32])(local_19c8 + 0x60 + lVar32),0x93);
    *(undefined1 (*) [32])(local_19c8 + 0x60 + lVar32) = auVar4;
    auVar4 = vpermq_avx2(*(undefined1 (*) [32])(local_19c8 + 0xe0 + (ulong)(local_1de4 << 3) * 0x20)
                         ,0x93);
    *(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 * 8 + 7) * 0x20) = auVar4;
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 << 3) * 0x20);
    uVar35 = *puVar27;
    uVar44 = puVar27[1];
    uVar45 = puVar27[2];
    uVar46 = puVar27[3];
    x_07[0]._1_1_ = in_stack_ffffffffffffe079;
    x_07[0]._0_1_ = in_stack_ffffffffffffe078;
    x_07[0]._2_1_ = in_stack_ffffffffffffe07a;
    x_07[0]._3_1_ = in_stack_ffffffffffffe07b;
    x_07[0]._4_1_ = in_stack_ffffffffffffe07c;
    x_07[0]._5_1_ = in_stack_ffffffffffffe07d;
    x_07[0]._6_1_ = in_stack_ffffffffffffe07e;
    x_07[0]._7_1_ = in_stack_ffffffffffffe07f;
    x_07[1]._0_1_ = in_stack_ffffffffffffe080;
    x_07[1]._1_1_ = in_stack_ffffffffffffe081;
    x_07[1]._2_1_ = in_stack_ffffffffffffe082;
    x_07[1]._3_1_ = in_stack_ffffffffffffe083;
    x_07[1]._4_1_ = in_stack_ffffffffffffe084;
    x_07[1]._5_1_ = in_stack_ffffffffffffe085;
    x_07[1]._6_1_ = in_stack_ffffffffffffe086;
    x_07[1]._7_1_ = in_stack_ffffffffffffe087;
    x_07[2]._0_1_ = in_stack_ffffffffffffe088;
    x_07[2]._1_1_ = in_stack_ffffffffffffe089;
    x_07[2]._2_1_ = in_stack_ffffffffffffe08a;
    x_07[2]._3_1_ = in_stack_ffffffffffffe08b;
    x_07[2]._4_1_ = in_stack_ffffffffffffe08c;
    x_07[2]._5_1_ = in_stack_ffffffffffffe08d;
    x_07[2]._6_1_ = in_stack_ffffffffffffe08e;
    x_07[2]._7_1_ = in_stack_ffffffffffffe08f;
    x_07[3]._0_1_ = in_stack_ffffffffffffe090;
    x_07[3]._1_1_ = in_stack_ffffffffffffe091;
    x_07[3]._2_1_ = in_stack_ffffffffffffe092;
    x_07[3]._3_1_ = in_stack_ffffffffffffe093;
    x_07[3]._4_1_ = in_stack_ffffffffffffe094;
    x_07[3]._5_1_ = in_stack_ffffffffffffe095;
    x_07[3]._6_1_ = in_stack_ffffffffffffe096;
    x_07[3]._7_1_ = in_stack_ffffffffffffe097;
    y_07[0]._1_1_ = in_stack_ffffffffffffe059;
    y_07[0]._0_1_ = in_stack_ffffffffffffe058;
    y_07[0]._2_1_ = in_stack_ffffffffffffe05a;
    y_07[0]._3_1_ = in_stack_ffffffffffffe05b;
    y_07[0]._4_1_ = in_stack_ffffffffffffe05c;
    y_07[0]._5_1_ = in_stack_ffffffffffffe05d;
    y_07[0]._6_1_ = in_stack_ffffffffffffe05e;
    y_07[0]._7_1_ = in_stack_ffffffffffffe05f;
    y_07[1]._0_1_ = in_stack_ffffffffffffe060;
    y_07[1]._1_1_ = in_stack_ffffffffffffe061;
    y_07[1]._2_1_ = in_stack_ffffffffffffe062;
    y_07[1]._3_1_ = in_stack_ffffffffffffe063;
    y_07[1]._4_1_ = in_stack_ffffffffffffe064;
    y_07[1]._5_1_ = in_stack_ffffffffffffe065;
    y_07[1]._6_1_ = in_stack_ffffffffffffe066;
    y_07[1]._7_1_ = in_stack_ffffffffffffe067;
    y_07[2]._0_1_ = in_stack_ffffffffffffe068;
    y_07[2]._1_1_ = in_stack_ffffffffffffe069;
    y_07[2]._2_1_ = in_stack_ffffffffffffe06a;
    y_07[2]._3_1_ = in_stack_ffffffffffffe06b;
    y_07[2]._4_1_ = in_stack_ffffffffffffe06c;
    y_07[2]._5_1_ = in_stack_ffffffffffffe06d;
    y_07[2]._6_1_ = in_stack_ffffffffffffe06e;
    y_07[2]._7_1_ = in_stack_ffffffffffffe06f;
    y_07[3]._0_1_ = in_stack_ffffffffffffe070;
    y_07[3]._1_1_ = in_stack_ffffffffffffe071;
    y_07[3]._2_1_ = in_stack_ffffffffffffe072;
    y_07[3]._3_1_ = in_stack_ffffffffffffe073;
    y_07[3]._4_1_ = in_stack_ffffffffffffe074;
    y_07[3]._5_1_ = in_stack_ffffffffffffe075;
    y_07[3]._6_1_ = in_stack_ffffffffffffe076;
    y_07[3]._7_1_ = in_stack_ffffffffffffe077;
    f(x_07,y_07);
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 << 3) * 0x20);
    *puVar27 = uVar35;
    puVar27[1] = uVar44;
    puVar27[2] = uVar45;
    puVar27[3] = uVar46;
    puVar27 = (undefined8 *)(local_19c8 + 0x80 + (ulong)(local_1de4 << 3) * 0x20);
    uVar35 = *puVar27;
    uVar44 = puVar27[1];
    uVar45 = puVar27[2];
    uVar46 = puVar27[3];
    x_08[0]._1_1_ = in_stack_ffffffffffffe079;
    x_08[0]._0_1_ = in_stack_ffffffffffffe078;
    x_08[0]._2_1_ = in_stack_ffffffffffffe07a;
    x_08[0]._3_1_ = in_stack_ffffffffffffe07b;
    x_08[0]._4_1_ = in_stack_ffffffffffffe07c;
    x_08[0]._5_1_ = in_stack_ffffffffffffe07d;
    x_08[0]._6_1_ = in_stack_ffffffffffffe07e;
    x_08[0]._7_1_ = in_stack_ffffffffffffe07f;
    x_08[1]._0_1_ = in_stack_ffffffffffffe080;
    x_08[1]._1_1_ = in_stack_ffffffffffffe081;
    x_08[1]._2_1_ = in_stack_ffffffffffffe082;
    x_08[1]._3_1_ = in_stack_ffffffffffffe083;
    x_08[1]._4_1_ = in_stack_ffffffffffffe084;
    x_08[1]._5_1_ = in_stack_ffffffffffffe085;
    x_08[1]._6_1_ = in_stack_ffffffffffffe086;
    x_08[1]._7_1_ = in_stack_ffffffffffffe087;
    x_08[2]._0_1_ = in_stack_ffffffffffffe088;
    x_08[2]._1_1_ = in_stack_ffffffffffffe089;
    x_08[2]._2_1_ = in_stack_ffffffffffffe08a;
    x_08[2]._3_1_ = in_stack_ffffffffffffe08b;
    x_08[2]._4_1_ = in_stack_ffffffffffffe08c;
    x_08[2]._5_1_ = in_stack_ffffffffffffe08d;
    x_08[2]._6_1_ = in_stack_ffffffffffffe08e;
    x_08[2]._7_1_ = in_stack_ffffffffffffe08f;
    x_08[3]._0_1_ = in_stack_ffffffffffffe090;
    x_08[3]._1_1_ = in_stack_ffffffffffffe091;
    x_08[3]._2_1_ = in_stack_ffffffffffffe092;
    x_08[3]._3_1_ = in_stack_ffffffffffffe093;
    x_08[3]._4_1_ = in_stack_ffffffffffffe094;
    x_08[3]._5_1_ = in_stack_ffffffffffffe095;
    x_08[3]._6_1_ = in_stack_ffffffffffffe096;
    x_08[3]._7_1_ = in_stack_ffffffffffffe097;
    y_08[0]._1_1_ = in_stack_ffffffffffffe059;
    y_08[0]._0_1_ = in_stack_ffffffffffffe058;
    y_08[0]._2_1_ = in_stack_ffffffffffffe05a;
    y_08[0]._3_1_ = in_stack_ffffffffffffe05b;
    y_08[0]._4_1_ = in_stack_ffffffffffffe05c;
    y_08[0]._5_1_ = in_stack_ffffffffffffe05d;
    y_08[0]._6_1_ = in_stack_ffffffffffffe05e;
    y_08[0]._7_1_ = in_stack_ffffffffffffe05f;
    y_08[1]._0_1_ = in_stack_ffffffffffffe060;
    y_08[1]._1_1_ = in_stack_ffffffffffffe061;
    y_08[1]._2_1_ = in_stack_ffffffffffffe062;
    y_08[1]._3_1_ = in_stack_ffffffffffffe063;
    y_08[1]._4_1_ = in_stack_ffffffffffffe064;
    y_08[1]._5_1_ = in_stack_ffffffffffffe065;
    y_08[1]._6_1_ = in_stack_ffffffffffffe066;
    y_08[1]._7_1_ = in_stack_ffffffffffffe067;
    y_08[2]._0_1_ = in_stack_ffffffffffffe068;
    y_08[2]._1_1_ = in_stack_ffffffffffffe069;
    y_08[2]._2_1_ = in_stack_ffffffffffffe06a;
    y_08[2]._3_1_ = in_stack_ffffffffffffe06b;
    y_08[2]._4_1_ = in_stack_ffffffffffffe06c;
    y_08[2]._5_1_ = in_stack_ffffffffffffe06d;
    y_08[2]._6_1_ = in_stack_ffffffffffffe06e;
    y_08[2]._7_1_ = in_stack_ffffffffffffe06f;
    y_08[3]._0_1_ = in_stack_ffffffffffffe070;
    y_08[3]._1_1_ = in_stack_ffffffffffffe071;
    y_08[3]._2_1_ = in_stack_ffffffffffffe072;
    y_08[3]._3_1_ = in_stack_ffffffffffffe073;
    y_08[3]._4_1_ = in_stack_ffffffffffffe074;
    y_08[3]._5_1_ = in_stack_ffffffffffffe075;
    y_08[3]._6_1_ = in_stack_ffffffffffffe076;
    y_08[3]._7_1_ = in_stack_ffffffffffffe077;
    f(x_08,y_08);
    puVar27 = (undefined8 *)(local_19c8 + 0x80 + (ulong)(local_1de4 << 3) * 0x20);
    *puVar27 = uVar35;
    puVar27[1] = uVar44;
    puVar27[2] = uVar45;
    puVar27[3] = uVar46;
    lVar32 = (ulong)(local_1de4 << 3) * 0x20;
    puVar26 = (ulong *)(local_19c8 + lVar32);
    local_1240 = *puVar26;
    uStack_1238 = puVar26[1];
    uStack_1230 = puVar26[2];
    uStack_1228 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + 0x60 + lVar32);
    local_1220 = *puVar26;
    uStack_1218 = puVar26[1];
    uStack_1210 = puVar26[2];
    uStack_1208 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + 0x60 + (ulong)(local_1de4 << 3) * 0x20);
    *puVar26 = local_1220 ^ local_1240;
    puVar26[1] = uStack_1218 ^ uStack_1238;
    puVar26[2] = uStack_1210 ^ uStack_1230;
    puVar26[3] = uStack_1208 ^ uStack_1228;
    lVar32 = (ulong)(local_1de4 << 3) * 0x20;
    puVar26 = (ulong *)(local_19c8 + 0x80 + lVar32);
    local_1280 = *puVar26;
    uStack_1278 = puVar26[1];
    uStack_1270 = puVar26[2];
    uStack_1268 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + 0xe0 + lVar32);
    local_1260 = *puVar26;
    uStack_1258 = puVar26[1];
    uStack_1250 = puVar26[2];
    uStack_1248 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + 0xe0 + (ulong)(local_1de4 << 3) * 0x20);
    *puVar26 = local_1260 ^ local_1280;
    puVar26[1] = uStack_1258 ^ uStack_1278;
    puVar26[2] = uStack_1250 ^ uStack_1270;
    puVar26[3] = uStack_1248 ^ uStack_1268;
    lVar32 = (ulong)(local_1de4 << 3) * 0x20;
    auVar4 = vpshufd_avx2(*(undefined1 (*) [32])(local_19c8 + 0x60 + lVar32),0xb1);
    *(undefined1 (*) [32])(local_19c8 + 0x60 + lVar32) = auVar4;
    lVar32 = (ulong)(local_1de4 << 3) * 0x20;
    auVar4 = vpshufd_avx2(*(undefined1 (*) [32])(local_19c8 + 0xe0 + lVar32),0xb1);
    *(undefined1 (*) [32])(local_19c8 + 0xe0 + lVar32) = auVar4;
    puVar27 = (undefined8 *)(local_19c8 + 0x40 + (ulong)(local_1de4 << 3) * 0x20);
    uVar35 = *puVar27;
    uVar44 = puVar27[1];
    uVar45 = puVar27[2];
    uVar46 = puVar27[3];
    x_09[0]._1_1_ = in_stack_ffffffffffffe079;
    x_09[0]._0_1_ = in_stack_ffffffffffffe078;
    x_09[0]._2_1_ = in_stack_ffffffffffffe07a;
    x_09[0]._3_1_ = in_stack_ffffffffffffe07b;
    x_09[0]._4_1_ = in_stack_ffffffffffffe07c;
    x_09[0]._5_1_ = in_stack_ffffffffffffe07d;
    x_09[0]._6_1_ = in_stack_ffffffffffffe07e;
    x_09[0]._7_1_ = in_stack_ffffffffffffe07f;
    x_09[1]._0_1_ = in_stack_ffffffffffffe080;
    x_09[1]._1_1_ = in_stack_ffffffffffffe081;
    x_09[1]._2_1_ = in_stack_ffffffffffffe082;
    x_09[1]._3_1_ = in_stack_ffffffffffffe083;
    x_09[1]._4_1_ = in_stack_ffffffffffffe084;
    x_09[1]._5_1_ = in_stack_ffffffffffffe085;
    x_09[1]._6_1_ = in_stack_ffffffffffffe086;
    x_09[1]._7_1_ = in_stack_ffffffffffffe087;
    x_09[2]._0_1_ = in_stack_ffffffffffffe088;
    x_09[2]._1_1_ = in_stack_ffffffffffffe089;
    x_09[2]._2_1_ = in_stack_ffffffffffffe08a;
    x_09[2]._3_1_ = in_stack_ffffffffffffe08b;
    x_09[2]._4_1_ = in_stack_ffffffffffffe08c;
    x_09[2]._5_1_ = in_stack_ffffffffffffe08d;
    x_09[2]._6_1_ = in_stack_ffffffffffffe08e;
    x_09[2]._7_1_ = in_stack_ffffffffffffe08f;
    x_09[3]._0_1_ = in_stack_ffffffffffffe090;
    x_09[3]._1_1_ = in_stack_ffffffffffffe091;
    x_09[3]._2_1_ = in_stack_ffffffffffffe092;
    x_09[3]._3_1_ = in_stack_ffffffffffffe093;
    x_09[3]._4_1_ = in_stack_ffffffffffffe094;
    x_09[3]._5_1_ = in_stack_ffffffffffffe095;
    x_09[3]._6_1_ = in_stack_ffffffffffffe096;
    x_09[3]._7_1_ = in_stack_ffffffffffffe097;
    y_09[0]._1_1_ = in_stack_ffffffffffffe059;
    y_09[0]._0_1_ = in_stack_ffffffffffffe058;
    y_09[0]._2_1_ = in_stack_ffffffffffffe05a;
    y_09[0]._3_1_ = in_stack_ffffffffffffe05b;
    y_09[0]._4_1_ = in_stack_ffffffffffffe05c;
    y_09[0]._5_1_ = in_stack_ffffffffffffe05d;
    y_09[0]._6_1_ = in_stack_ffffffffffffe05e;
    y_09[0]._7_1_ = in_stack_ffffffffffffe05f;
    y_09[1]._0_1_ = in_stack_ffffffffffffe060;
    y_09[1]._1_1_ = in_stack_ffffffffffffe061;
    y_09[1]._2_1_ = in_stack_ffffffffffffe062;
    y_09[1]._3_1_ = in_stack_ffffffffffffe063;
    y_09[1]._4_1_ = in_stack_ffffffffffffe064;
    y_09[1]._5_1_ = in_stack_ffffffffffffe065;
    y_09[1]._6_1_ = in_stack_ffffffffffffe066;
    y_09[1]._7_1_ = in_stack_ffffffffffffe067;
    y_09[2]._0_1_ = in_stack_ffffffffffffe068;
    y_09[2]._1_1_ = in_stack_ffffffffffffe069;
    y_09[2]._2_1_ = in_stack_ffffffffffffe06a;
    y_09[2]._3_1_ = in_stack_ffffffffffffe06b;
    y_09[2]._4_1_ = in_stack_ffffffffffffe06c;
    y_09[2]._5_1_ = in_stack_ffffffffffffe06d;
    y_09[2]._6_1_ = in_stack_ffffffffffffe06e;
    y_09[2]._7_1_ = in_stack_ffffffffffffe06f;
    y_09[3]._0_1_ = in_stack_ffffffffffffe070;
    y_09[3]._1_1_ = in_stack_ffffffffffffe071;
    y_09[3]._2_1_ = in_stack_ffffffffffffe072;
    y_09[3]._3_1_ = in_stack_ffffffffffffe073;
    y_09[3]._4_1_ = in_stack_ffffffffffffe074;
    y_09[3]._5_1_ = in_stack_ffffffffffffe075;
    y_09[3]._6_1_ = in_stack_ffffffffffffe076;
    y_09[3]._7_1_ = in_stack_ffffffffffffe077;
    f(x_09,y_09);
    puVar27 = (undefined8 *)(local_19c8 + 0x40 + (ulong)(local_1de4 << 3) * 0x20);
    *puVar27 = uVar35;
    puVar27[1] = uVar44;
    puVar27[2] = uVar45;
    puVar27[3] = uVar46;
    puVar27 = (undefined8 *)(local_19c8 + 0xc0 + (ulong)(local_1de4 << 3) * 0x20);
    uVar35 = *puVar27;
    uVar44 = puVar27[1];
    uVar45 = puVar27[2];
    uVar46 = puVar27[3];
    x_10[0]._1_1_ = in_stack_ffffffffffffe079;
    x_10[0]._0_1_ = in_stack_ffffffffffffe078;
    x_10[0]._2_1_ = in_stack_ffffffffffffe07a;
    x_10[0]._3_1_ = in_stack_ffffffffffffe07b;
    x_10[0]._4_1_ = in_stack_ffffffffffffe07c;
    x_10[0]._5_1_ = in_stack_ffffffffffffe07d;
    x_10[0]._6_1_ = in_stack_ffffffffffffe07e;
    x_10[0]._7_1_ = in_stack_ffffffffffffe07f;
    x_10[1]._0_1_ = in_stack_ffffffffffffe080;
    x_10[1]._1_1_ = in_stack_ffffffffffffe081;
    x_10[1]._2_1_ = in_stack_ffffffffffffe082;
    x_10[1]._3_1_ = in_stack_ffffffffffffe083;
    x_10[1]._4_1_ = in_stack_ffffffffffffe084;
    x_10[1]._5_1_ = in_stack_ffffffffffffe085;
    x_10[1]._6_1_ = in_stack_ffffffffffffe086;
    x_10[1]._7_1_ = in_stack_ffffffffffffe087;
    x_10[2]._0_1_ = in_stack_ffffffffffffe088;
    x_10[2]._1_1_ = in_stack_ffffffffffffe089;
    x_10[2]._2_1_ = in_stack_ffffffffffffe08a;
    x_10[2]._3_1_ = in_stack_ffffffffffffe08b;
    x_10[2]._4_1_ = in_stack_ffffffffffffe08c;
    x_10[2]._5_1_ = in_stack_ffffffffffffe08d;
    x_10[2]._6_1_ = in_stack_ffffffffffffe08e;
    x_10[2]._7_1_ = in_stack_ffffffffffffe08f;
    x_10[3]._0_1_ = in_stack_ffffffffffffe090;
    x_10[3]._1_1_ = in_stack_ffffffffffffe091;
    x_10[3]._2_1_ = in_stack_ffffffffffffe092;
    x_10[3]._3_1_ = in_stack_ffffffffffffe093;
    x_10[3]._4_1_ = in_stack_ffffffffffffe094;
    x_10[3]._5_1_ = in_stack_ffffffffffffe095;
    x_10[3]._6_1_ = in_stack_ffffffffffffe096;
    x_10[3]._7_1_ = in_stack_ffffffffffffe097;
    y_10[0]._1_1_ = in_stack_ffffffffffffe059;
    y_10[0]._0_1_ = in_stack_ffffffffffffe058;
    y_10[0]._2_1_ = in_stack_ffffffffffffe05a;
    y_10[0]._3_1_ = in_stack_ffffffffffffe05b;
    y_10[0]._4_1_ = in_stack_ffffffffffffe05c;
    y_10[0]._5_1_ = in_stack_ffffffffffffe05d;
    y_10[0]._6_1_ = in_stack_ffffffffffffe05e;
    y_10[0]._7_1_ = in_stack_ffffffffffffe05f;
    y_10[1]._0_1_ = in_stack_ffffffffffffe060;
    y_10[1]._1_1_ = in_stack_ffffffffffffe061;
    y_10[1]._2_1_ = in_stack_ffffffffffffe062;
    y_10[1]._3_1_ = in_stack_ffffffffffffe063;
    y_10[1]._4_1_ = in_stack_ffffffffffffe064;
    y_10[1]._5_1_ = in_stack_ffffffffffffe065;
    y_10[1]._6_1_ = in_stack_ffffffffffffe066;
    y_10[1]._7_1_ = in_stack_ffffffffffffe067;
    y_10[2]._0_1_ = in_stack_ffffffffffffe068;
    y_10[2]._1_1_ = in_stack_ffffffffffffe069;
    y_10[2]._2_1_ = in_stack_ffffffffffffe06a;
    y_10[2]._3_1_ = in_stack_ffffffffffffe06b;
    y_10[2]._4_1_ = in_stack_ffffffffffffe06c;
    y_10[2]._5_1_ = in_stack_ffffffffffffe06d;
    y_10[2]._6_1_ = in_stack_ffffffffffffe06e;
    y_10[2]._7_1_ = in_stack_ffffffffffffe06f;
    y_10[3]._0_1_ = in_stack_ffffffffffffe070;
    y_10[3]._1_1_ = in_stack_ffffffffffffe071;
    y_10[3]._2_1_ = in_stack_ffffffffffffe072;
    y_10[3]._3_1_ = in_stack_ffffffffffffe073;
    y_10[3]._4_1_ = in_stack_ffffffffffffe074;
    y_10[3]._5_1_ = in_stack_ffffffffffffe075;
    y_10[3]._6_1_ = in_stack_ffffffffffffe076;
    y_10[3]._7_1_ = in_stack_ffffffffffffe077;
    f(x_10,y_10);
    puVar27 = (undefined8 *)(local_19c8 + 0xc0 + (ulong)(local_1de4 << 3) * 0x20);
    *puVar27 = uVar35;
    puVar27[1] = uVar44;
    puVar27[2] = uVar45;
    puVar27[3] = uVar46;
    lVar32 = (ulong)(local_1de4 << 3) * 0x20;
    puVar26 = (ulong *)(local_19c8 + 0x20 + lVar32);
    local_12a0 = *puVar26;
    uStack_1298 = puVar26[1];
    uStack_1290 = puVar26[2];
    uStack_1288 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + 0x40 + lVar32);
    local_12c0 = *puVar26;
    uStack_12b8 = puVar26[1];
    uStack_12b0 = puVar26[2];
    uStack_12a8 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + 0x20 + (ulong)(local_1de4 << 3) * 0x20);
    *puVar26 = local_12a0 ^ local_12c0;
    puVar26[1] = uStack_1298 ^ uStack_12b8;
    puVar26[2] = uStack_1290 ^ uStack_12b0;
    puVar26[3] = uStack_1288 ^ uStack_12a8;
    lVar32 = (ulong)(local_1de4 << 3) * 0x20;
    puVar26 = (ulong *)(local_19c8 + 0xa0 + lVar32);
    local_12e0 = *puVar26;
    uStack_12d8 = puVar26[1];
    uStack_12d0 = puVar26[2];
    uStack_12c8 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + 0xc0 + lVar32);
    local_1300 = *puVar26;
    uStack_12f8 = puVar26[1];
    uStack_12f0 = puVar26[2];
    uStack_12e8 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + 0xa0 + (ulong)(local_1de4 << 3) * 0x20);
    *puVar26 = local_12e0 ^ local_1300;
    puVar26[1] = uStack_12d8 ^ uStack_12f8;
    puVar26[2] = uStack_12d0 ^ uStack_12f0;
    puVar26[3] = uStack_12c8 ^ uStack_12e8;
    pauVar28 = (undefined1 (*) [32])(local_19c8 + 0x20 + (ulong)(local_1de4 << 3) * 0x20);
    local_bc0 = *(undefined8 *)*pauVar28;
    uStack_bb8 = *(undefined8 *)(*pauVar28 + 8);
    uStack_bb0 = *(undefined8 *)(*pauVar28 + 0x10);
    uStack_ba8 = *(undefined8 *)(*pauVar28 + 0x18);
    local_905 = 3;
    local_906 = 4;
    local_907 = 5;
    local_908 = 6;
    local_909 = 7;
    local_90a = 0;
    local_90b = 1;
    local_90c = 2;
    local_90d = 0xb;
    local_90e = 0xc;
    local_90f = 0xd;
    local_910 = 0xe;
    local_911 = 0xf;
    local_912 = 8;
    local_913 = 9;
    local_914 = 10;
    local_915 = 0x13;
    local_916 = 0x14;
    local_917 = 0x15;
    local_918 = 0x16;
    local_919 = 0x17;
    local_91a = 0x10;
    local_91b = 0x11;
    local_91c = 0x12;
    local_91d = 0x1b;
    local_91e = 0x1c;
    local_91f = 0x1d;
    local_920 = 0x1e;
    local_921 = 0x1f;
    local_922 = 0x18;
    local_923 = 0x19;
    local_924 = 0x1a;
    local_321 = 0x1a;
    local_322 = 0x19;
    local_323 = 0x18;
    local_324 = 0x1f;
    local_325 = 0x1e;
    local_326 = 0x1d;
    local_327 = 0x1c;
    local_328 = 0x1b;
    local_329 = 0x12;
    local_32a = 0x11;
    local_32b = 0x10;
    local_32c = 0x17;
    local_32d = 0x16;
    local_32e = 0x15;
    local_32f = 0x14;
    local_330 = 0x13;
    local_331 = 10;
    local_332 = 9;
    local_333 = 8;
    local_334 = 0xf;
    local_335 = 0xe;
    local_336 = 0xd;
    local_337 = 0xc;
    local_338 = 0xb;
    local_339 = 2;
    local_33a = 1;
    local_33b = 0;
    local_33c = 7;
    local_33d = 6;
    local_33e = 5;
    local_33f = 4;
    local_340 = 3;
    auVar2 = vpinsrb_avx(ZEXT116(3),4,1);
    auVar2 = vpinsrb_avx(auVar2,5,2);
    auVar2 = vpinsrb_avx(auVar2,6,3);
    auVar2 = vpinsrb_avx(auVar2,7,4);
    auVar2 = vpinsrb_avx(auVar2,0,5);
    auVar2 = vpinsrb_avx(auVar2,1,6);
    auVar2 = vpinsrb_avx(auVar2,2,7);
    auVar2 = vpinsrb_avx(auVar2,0xb,8);
    auVar2 = vpinsrb_avx(auVar2,0xc,9);
    auVar2 = vpinsrb_avx(auVar2,0xd,10);
    auVar2 = vpinsrb_avx(auVar2,0xe,0xb);
    auVar2 = vpinsrb_avx(auVar2,0xf,0xc);
    auVar2 = vpinsrb_avx(auVar2,8,0xd);
    auVar2 = vpinsrb_avx(auVar2,9,0xe);
    local_360 = vpinsrb_avx(auVar2,10,0xf);
    auVar2 = vpinsrb_avx(ZEXT116(0x13),0x14,1);
    auVar2 = vpinsrb_avx(auVar2,0x15,2);
    auVar2 = vpinsrb_avx(auVar2,0x16,3);
    auVar2 = vpinsrb_avx(auVar2,0x17,4);
    auVar2 = vpinsrb_avx(auVar2,0x10,5);
    auVar2 = vpinsrb_avx(auVar2,0x11,6);
    auVar2 = vpinsrb_avx(auVar2,0x12,7);
    auVar2 = vpinsrb_avx(auVar2,0x1b,8);
    auVar2 = vpinsrb_avx(auVar2,0x1c,9);
    auVar2 = vpinsrb_avx(auVar2,0x1d,10);
    auVar2 = vpinsrb_avx(auVar2,0x1e,0xb);
    auVar2 = vpinsrb_avx(auVar2,0x1f,0xc);
    auVar2 = vpinsrb_avx(auVar2,0x18,0xd);
    auVar2 = vpinsrb_avx(auVar2,0x19,0xe);
    auStack_350 = vpinsrb_avx(auVar2,0x1a,0xf);
    local_be0 = local_360._0_8_;
    uStack_bd8 = local_360._8_8_;
    uStack_bd0 = auStack_350._0_8_;
    uStack_bc8 = auStack_350._8_8_;
    auVar20._16_8_ = auStack_350._0_8_;
    auVar20._0_16_ = local_360;
    auVar20._24_8_ = auStack_350._8_8_;
    auVar4 = vpshufb_avx2(*pauVar28,auVar20);
    *(undefined1 (*) [32])(local_19c8 + 0x20 + (ulong)(local_1de4 << 3) * 0x20) = auVar4;
    pauVar28 = (undefined1 (*) [32])(local_19c8 + 0xa0 + (ulong)(local_1de4 << 3) * 0x20);
    local_c00 = *(undefined8 *)*pauVar28;
    uStack_bf8 = *(undefined8 *)(*pauVar28 + 8);
    uStack_bf0 = *(undefined8 *)(*pauVar28 + 0x10);
    uStack_be8 = *(undefined8 *)(*pauVar28 + 0x18);
    local_925 = 3;
    local_926 = 4;
    local_927 = 5;
    local_928 = 6;
    local_929 = 7;
    local_92a = 0;
    local_92b = 1;
    local_92c = 2;
    local_92d = 0xb;
    local_92e = 0xc;
    local_92f = 0xd;
    local_930 = 0xe;
    local_931 = 0xf;
    local_932 = 8;
    local_933 = 9;
    local_934 = 10;
    local_935 = 0x13;
    local_936 = 0x14;
    local_937 = 0x15;
    local_938 = 0x16;
    local_939 = 0x17;
    local_93a = 0x10;
    local_93b = 0x11;
    local_93c = 0x12;
    local_93d = 0x1b;
    local_93e = 0x1c;
    local_93f = 0x1d;
    local_940 = 0x1e;
    local_941 = 0x1f;
    local_942 = 0x18;
    local_943 = 0x19;
    local_944 = 0x1a;
    local_2e1 = 0x1a;
    local_2e2 = 0x19;
    local_2e3 = 0x18;
    local_2e4 = 0x1f;
    local_2e5 = 0x1e;
    local_2e6 = 0x1d;
    local_2e7 = 0x1c;
    local_2e8 = 0x1b;
    local_2e9 = 0x12;
    local_2ea = 0x11;
    local_2eb = 0x10;
    local_2ec = 0x17;
    local_2ed = 0x16;
    local_2ee = 0x15;
    local_2ef = 0x14;
    local_2f0 = 0x13;
    local_2f1 = 10;
    local_2f2 = 9;
    local_2f3 = 8;
    local_2f4 = 0xf;
    local_2f5 = 0xe;
    local_2f6 = 0xd;
    local_2f7 = 0xc;
    local_2f8 = 0xb;
    local_2f9 = 2;
    local_2fa = 1;
    local_2fb = 0;
    local_2fc = 7;
    local_2fd = 6;
    local_2fe = 5;
    local_2ff = 4;
    local_300 = 3;
    auVar2 = vpinsrb_avx(ZEXT116(0x13),0x14,1);
    auVar2 = vpinsrb_avx(auVar2,0x15,2);
    auVar2 = vpinsrb_avx(auVar2,0x16,3);
    auVar2 = vpinsrb_avx(auVar2,0x17,4);
    auVar2 = vpinsrb_avx(auVar2,0x10,5);
    auVar2 = vpinsrb_avx(auVar2,0x11,6);
    auVar2 = vpinsrb_avx(auVar2,0x12,7);
    auVar2 = vpinsrb_avx(auVar2,0x1b,8);
    auVar2 = vpinsrb_avx(auVar2,0x1c,9);
    auVar2 = vpinsrb_avx(auVar2,0x1d,10);
    auVar2 = vpinsrb_avx(auVar2,0x1e,0xb);
    auVar2 = vpinsrb_avx(auVar2,0x1f,0xc);
    auVar2 = vpinsrb_avx(auVar2,0x18,0xd);
    auVar2 = vpinsrb_avx(auVar2,0x19,0xe);
    auVar2 = vpinsrb_avx(auVar2,0x1a,0xf);
    auVar3 = vpinsrb_avx(ZEXT116(3),4,1);
    auVar3 = vpinsrb_avx(auVar3,5,2);
    auVar3 = vpinsrb_avx(auVar3,6,3);
    auVar3 = vpinsrb_avx(auVar3,7,4);
    auVar3 = vpinsrb_avx(auVar3,0,5);
    auVar3 = vpinsrb_avx(auVar3,1,6);
    auVar3 = vpinsrb_avx(auVar3,2,7);
    auVar3 = vpinsrb_avx(auVar3,0xb,8);
    auVar3 = vpinsrb_avx(auVar3,0xc,9);
    auVar3 = vpinsrb_avx(auVar3,0xd,10);
    auVar3 = vpinsrb_avx(auVar3,0xe,0xb);
    auVar3 = vpinsrb_avx(auVar3,0xf,0xc);
    auVar3 = vpinsrb_avx(auVar3,8,0xd);
    auVar3 = vpinsrb_avx(auVar3,9,0xe);
    auVar3 = vpinsrb_avx(auVar3,10,0xf);
    auVar38._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
    auVar38._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
    local_320._16_8_ = auVar38._16_8_;
    local_320._24_8_ = auVar38._24_8_;
    auVar19._16_8_ = local_320._16_8_;
    auVar19._0_16_ = auVar38._0_16_;
    auVar19._24_8_ = local_320._24_8_;
    auVar4 = vpshufb_avx2(*pauVar28,auVar19);
    *(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 * 8 + 5) * 0x20) = auVar4;
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 << 3) * 0x20);
    uVar35 = *puVar27;
    uVar44 = puVar27[1];
    uVar45 = puVar27[2];
    uVar46 = puVar27[3];
    x_11[0]._1_1_ = in_stack_ffffffffffffe079;
    x_11[0]._0_1_ = in_stack_ffffffffffffe078;
    x_11[0]._2_1_ = in_stack_ffffffffffffe07a;
    x_11[0]._3_1_ = in_stack_ffffffffffffe07b;
    x_11[0]._4_1_ = in_stack_ffffffffffffe07c;
    x_11[0]._5_1_ = in_stack_ffffffffffffe07d;
    x_11[0]._6_1_ = in_stack_ffffffffffffe07e;
    x_11[0]._7_1_ = in_stack_ffffffffffffe07f;
    x_11[1]._0_1_ = in_stack_ffffffffffffe080;
    x_11[1]._1_1_ = in_stack_ffffffffffffe081;
    x_11[1]._2_1_ = in_stack_ffffffffffffe082;
    x_11[1]._3_1_ = in_stack_ffffffffffffe083;
    x_11[1]._4_1_ = in_stack_ffffffffffffe084;
    x_11[1]._5_1_ = in_stack_ffffffffffffe085;
    x_11[1]._6_1_ = in_stack_ffffffffffffe086;
    x_11[1]._7_1_ = in_stack_ffffffffffffe087;
    x_11[2]._0_1_ = in_stack_ffffffffffffe088;
    x_11[2]._1_1_ = in_stack_ffffffffffffe089;
    x_11[2]._2_1_ = in_stack_ffffffffffffe08a;
    x_11[2]._3_1_ = in_stack_ffffffffffffe08b;
    x_11[2]._4_1_ = in_stack_ffffffffffffe08c;
    x_11[2]._5_1_ = in_stack_ffffffffffffe08d;
    x_11[2]._6_1_ = in_stack_ffffffffffffe08e;
    x_11[2]._7_1_ = in_stack_ffffffffffffe08f;
    x_11[3]._0_1_ = in_stack_ffffffffffffe090;
    x_11[3]._1_1_ = in_stack_ffffffffffffe091;
    x_11[3]._2_1_ = in_stack_ffffffffffffe092;
    x_11[3]._3_1_ = in_stack_ffffffffffffe093;
    x_11[3]._4_1_ = in_stack_ffffffffffffe094;
    x_11[3]._5_1_ = in_stack_ffffffffffffe095;
    x_11[3]._6_1_ = in_stack_ffffffffffffe096;
    x_11[3]._7_1_ = in_stack_ffffffffffffe097;
    y_11[0]._1_1_ = in_stack_ffffffffffffe059;
    y_11[0]._0_1_ = in_stack_ffffffffffffe058;
    y_11[0]._2_1_ = in_stack_ffffffffffffe05a;
    y_11[0]._3_1_ = in_stack_ffffffffffffe05b;
    y_11[0]._4_1_ = in_stack_ffffffffffffe05c;
    y_11[0]._5_1_ = in_stack_ffffffffffffe05d;
    y_11[0]._6_1_ = in_stack_ffffffffffffe05e;
    y_11[0]._7_1_ = in_stack_ffffffffffffe05f;
    y_11[1]._0_1_ = in_stack_ffffffffffffe060;
    y_11[1]._1_1_ = in_stack_ffffffffffffe061;
    y_11[1]._2_1_ = in_stack_ffffffffffffe062;
    y_11[1]._3_1_ = in_stack_ffffffffffffe063;
    y_11[1]._4_1_ = in_stack_ffffffffffffe064;
    y_11[1]._5_1_ = in_stack_ffffffffffffe065;
    y_11[1]._6_1_ = in_stack_ffffffffffffe066;
    y_11[1]._7_1_ = in_stack_ffffffffffffe067;
    y_11[2]._0_1_ = in_stack_ffffffffffffe068;
    y_11[2]._1_1_ = in_stack_ffffffffffffe069;
    y_11[2]._2_1_ = in_stack_ffffffffffffe06a;
    y_11[2]._3_1_ = in_stack_ffffffffffffe06b;
    y_11[2]._4_1_ = in_stack_ffffffffffffe06c;
    y_11[2]._5_1_ = in_stack_ffffffffffffe06d;
    y_11[2]._6_1_ = in_stack_ffffffffffffe06e;
    y_11[2]._7_1_ = in_stack_ffffffffffffe06f;
    y_11[3]._0_1_ = in_stack_ffffffffffffe070;
    y_11[3]._1_1_ = in_stack_ffffffffffffe071;
    y_11[3]._2_1_ = in_stack_ffffffffffffe072;
    y_11[3]._3_1_ = in_stack_ffffffffffffe073;
    y_11[3]._4_1_ = in_stack_ffffffffffffe074;
    y_11[3]._5_1_ = in_stack_ffffffffffffe075;
    y_11[3]._6_1_ = in_stack_ffffffffffffe076;
    y_11[3]._7_1_ = in_stack_ffffffffffffe077;
    local_320 = auVar38;
    local_c20 = auVar38._0_16_;
    auStack_c10 = auVar38._16_16_;
    f(x_11,y_11);
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 << 3) * 0x20);
    *puVar27 = uVar35;
    puVar27[1] = uVar44;
    puVar27[2] = uVar45;
    puVar27[3] = uVar46;
    puVar27 = (undefined8 *)(local_19c8 + 0x80 + (ulong)(local_1de4 << 3) * 0x20);
    uVar35 = *puVar27;
    uVar44 = puVar27[1];
    uVar45 = puVar27[2];
    uVar46 = puVar27[3];
    x_12[0]._1_1_ = in_stack_ffffffffffffe079;
    x_12[0]._0_1_ = in_stack_ffffffffffffe078;
    x_12[0]._2_1_ = in_stack_ffffffffffffe07a;
    x_12[0]._3_1_ = in_stack_ffffffffffffe07b;
    x_12[0]._4_1_ = in_stack_ffffffffffffe07c;
    x_12[0]._5_1_ = in_stack_ffffffffffffe07d;
    x_12[0]._6_1_ = in_stack_ffffffffffffe07e;
    x_12[0]._7_1_ = in_stack_ffffffffffffe07f;
    x_12[1]._0_1_ = in_stack_ffffffffffffe080;
    x_12[1]._1_1_ = in_stack_ffffffffffffe081;
    x_12[1]._2_1_ = in_stack_ffffffffffffe082;
    x_12[1]._3_1_ = in_stack_ffffffffffffe083;
    x_12[1]._4_1_ = in_stack_ffffffffffffe084;
    x_12[1]._5_1_ = in_stack_ffffffffffffe085;
    x_12[1]._6_1_ = in_stack_ffffffffffffe086;
    x_12[1]._7_1_ = in_stack_ffffffffffffe087;
    x_12[2]._0_1_ = in_stack_ffffffffffffe088;
    x_12[2]._1_1_ = in_stack_ffffffffffffe089;
    x_12[2]._2_1_ = in_stack_ffffffffffffe08a;
    x_12[2]._3_1_ = in_stack_ffffffffffffe08b;
    x_12[2]._4_1_ = in_stack_ffffffffffffe08c;
    x_12[2]._5_1_ = in_stack_ffffffffffffe08d;
    x_12[2]._6_1_ = in_stack_ffffffffffffe08e;
    x_12[2]._7_1_ = in_stack_ffffffffffffe08f;
    x_12[3]._0_1_ = in_stack_ffffffffffffe090;
    x_12[3]._1_1_ = in_stack_ffffffffffffe091;
    x_12[3]._2_1_ = in_stack_ffffffffffffe092;
    x_12[3]._3_1_ = in_stack_ffffffffffffe093;
    x_12[3]._4_1_ = in_stack_ffffffffffffe094;
    x_12[3]._5_1_ = in_stack_ffffffffffffe095;
    x_12[3]._6_1_ = in_stack_ffffffffffffe096;
    x_12[3]._7_1_ = in_stack_ffffffffffffe097;
    y_12[0]._1_1_ = in_stack_ffffffffffffe059;
    y_12[0]._0_1_ = in_stack_ffffffffffffe058;
    y_12[0]._2_1_ = in_stack_ffffffffffffe05a;
    y_12[0]._3_1_ = in_stack_ffffffffffffe05b;
    y_12[0]._4_1_ = in_stack_ffffffffffffe05c;
    y_12[0]._5_1_ = in_stack_ffffffffffffe05d;
    y_12[0]._6_1_ = in_stack_ffffffffffffe05e;
    y_12[0]._7_1_ = in_stack_ffffffffffffe05f;
    y_12[1]._0_1_ = in_stack_ffffffffffffe060;
    y_12[1]._1_1_ = in_stack_ffffffffffffe061;
    y_12[1]._2_1_ = in_stack_ffffffffffffe062;
    y_12[1]._3_1_ = in_stack_ffffffffffffe063;
    y_12[1]._4_1_ = in_stack_ffffffffffffe064;
    y_12[1]._5_1_ = in_stack_ffffffffffffe065;
    y_12[1]._6_1_ = in_stack_ffffffffffffe066;
    y_12[1]._7_1_ = in_stack_ffffffffffffe067;
    y_12[2]._0_1_ = in_stack_ffffffffffffe068;
    y_12[2]._1_1_ = in_stack_ffffffffffffe069;
    y_12[2]._2_1_ = in_stack_ffffffffffffe06a;
    y_12[2]._3_1_ = in_stack_ffffffffffffe06b;
    y_12[2]._4_1_ = in_stack_ffffffffffffe06c;
    y_12[2]._5_1_ = in_stack_ffffffffffffe06d;
    y_12[2]._6_1_ = in_stack_ffffffffffffe06e;
    y_12[2]._7_1_ = in_stack_ffffffffffffe06f;
    y_12[3]._0_1_ = in_stack_ffffffffffffe070;
    y_12[3]._1_1_ = in_stack_ffffffffffffe071;
    y_12[3]._2_1_ = in_stack_ffffffffffffe072;
    y_12[3]._3_1_ = in_stack_ffffffffffffe073;
    y_12[3]._4_1_ = in_stack_ffffffffffffe074;
    y_12[3]._5_1_ = in_stack_ffffffffffffe075;
    y_12[3]._6_1_ = in_stack_ffffffffffffe076;
    y_12[3]._7_1_ = in_stack_ffffffffffffe077;
    f(x_12,y_12);
    puVar27 = (undefined8 *)(local_19c8 + 0x80 + (ulong)(local_1de4 << 3) * 0x20);
    *puVar27 = uVar35;
    puVar27[1] = uVar44;
    puVar27[2] = uVar45;
    puVar27[3] = uVar46;
    lVar32 = (ulong)(local_1de4 << 3) * 0x20;
    puVar26 = (ulong *)(local_19c8 + lVar32);
    local_1340 = *puVar26;
    uStack_1338 = puVar26[1];
    uStack_1330 = puVar26[2];
    uStack_1328 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + 0x60 + lVar32);
    local_1320 = *puVar26;
    uStack_1318 = puVar26[1];
    uStack_1310 = puVar26[2];
    uStack_1308 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + 0x60 + (ulong)(local_1de4 << 3) * 0x20);
    *puVar26 = local_1320 ^ local_1340;
    puVar26[1] = uStack_1318 ^ uStack_1338;
    puVar26[2] = uStack_1310 ^ uStack_1330;
    puVar26[3] = uStack_1308 ^ uStack_1328;
    lVar32 = (ulong)(local_1de4 << 3) * 0x20;
    puVar26 = (ulong *)(local_19c8 + 0x80 + lVar32);
    local_1380 = *puVar26;
    uStack_1378 = puVar26[1];
    uStack_1370 = puVar26[2];
    uStack_1368 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + 0xe0 + lVar32);
    local_1360 = *puVar26;
    uStack_1358 = puVar26[1];
    uStack_1350 = puVar26[2];
    uStack_1348 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + 0xe0 + (ulong)(local_1de4 << 3) * 0x20);
    *puVar26 = local_1360 ^ local_1380;
    puVar26[1] = uStack_1358 ^ uStack_1378;
    puVar26[2] = uStack_1350 ^ uStack_1370;
    puVar26[3] = uStack_1348 ^ uStack_1368;
    pauVar28 = (undefined1 (*) [32])(local_19c8 + 0x60 + (ulong)(local_1de4 << 3) * 0x20);
    local_c40 = *(undefined8 *)*pauVar28;
    uStack_c38 = *(undefined8 *)(*pauVar28 + 8);
    uStack_c30 = *(undefined8 *)(*pauVar28 + 0x10);
    uStack_c28 = *(undefined8 *)(*pauVar28 + 0x18);
    local_945 = 2;
    local_946 = 3;
    local_947 = 4;
    local_948 = 5;
    local_949 = 6;
    local_94a = 7;
    local_94b = 0;
    local_94c = 1;
    local_94d = 10;
    local_94e = 0xb;
    local_94f = 0xc;
    local_950 = 0xd;
    local_951 = 0xe;
    local_952 = 0xf;
    local_953 = 8;
    local_954 = 9;
    local_955 = 0x12;
    local_956 = 0x13;
    local_957 = 0x14;
    local_958 = 0x15;
    local_959 = 0x16;
    local_95a = 0x17;
    local_95b = 0x10;
    local_95c = 0x11;
    local_95d = 0x1a;
    local_95e = 0x1b;
    local_95f = 0x1c;
    local_960 = 0x1d;
    local_961 = 0x1e;
    local_962 = 0x1f;
    local_963 = 0x18;
    local_964 = 0x19;
    local_2a1 = 0x19;
    local_2a2 = 0x18;
    local_2a3 = 0x1f;
    local_2a4 = 0x1e;
    local_2a5 = 0x1d;
    local_2a6 = 0x1c;
    local_2a7 = 0x1b;
    local_2a8 = 0x1a;
    local_2a9 = 0x11;
    local_2aa = 0x10;
    local_2ab = 0x17;
    local_2ac = 0x16;
    local_2ad = 0x15;
    local_2ae = 0x14;
    local_2af = 0x13;
    local_2b0 = 0x12;
    local_2b1 = 9;
    local_2b2 = 8;
    local_2b3 = 0xf;
    local_2b4 = 0xe;
    local_2b5 = 0xd;
    local_2b6 = 0xc;
    local_2b7 = 0xb;
    local_2b8 = 10;
    local_2b9 = 1;
    local_2ba = 0;
    local_2bb = 7;
    local_2bc = 6;
    local_2bd = 5;
    local_2be = 4;
    local_2bf = 3;
    local_2c0 = 2;
    auVar2 = vpinsrb_avx(ZEXT116(2),3,1);
    auVar2 = vpinsrb_avx(auVar2,4,2);
    auVar2 = vpinsrb_avx(auVar2,5,3);
    auVar2 = vpinsrb_avx(auVar2,6,4);
    auVar2 = vpinsrb_avx(auVar2,7,5);
    auVar2 = vpinsrb_avx(auVar2,0,6);
    auVar2 = vpinsrb_avx(auVar2,1,7);
    auVar2 = vpinsrb_avx(auVar2,10,8);
    auVar2 = vpinsrb_avx(auVar2,0xb,9);
    auVar2 = vpinsrb_avx(auVar2,0xc,10);
    auVar2 = vpinsrb_avx(auVar2,0xd,0xb);
    auVar2 = vpinsrb_avx(auVar2,0xe,0xc);
    auVar2 = vpinsrb_avx(auVar2,0xf,0xd);
    auVar2 = vpinsrb_avx(auVar2,8,0xe);
    local_2e0 = vpinsrb_avx(auVar2,9,0xf);
    auVar2 = vpinsrb_avx(ZEXT116(0x12),0x13,1);
    auVar2 = vpinsrb_avx(auVar2,0x14,2);
    auVar2 = vpinsrb_avx(auVar2,0x15,3);
    auVar2 = vpinsrb_avx(auVar2,0x16,4);
    auVar2 = vpinsrb_avx(auVar2,0x17,5);
    auVar2 = vpinsrb_avx(auVar2,0x10,6);
    auVar2 = vpinsrb_avx(auVar2,0x11,7);
    auVar2 = vpinsrb_avx(auVar2,0x1a,8);
    auVar2 = vpinsrb_avx(auVar2,0x1b,9);
    auVar2 = vpinsrb_avx(auVar2,0x1c,10);
    auVar2 = vpinsrb_avx(auVar2,0x1d,0xb);
    auVar2 = vpinsrb_avx(auVar2,0x1e,0xc);
    auVar2 = vpinsrb_avx(auVar2,0x1f,0xd);
    auVar2 = vpinsrb_avx(auVar2,0x18,0xe);
    auStack_2d0 = vpinsrb_avx(auVar2,0x19,0xf);
    local_c60 = local_2e0._0_8_;
    uStack_c58 = local_2e0._8_8_;
    uStack_c50 = auStack_2d0._0_8_;
    uStack_c48 = auStack_2d0._8_8_;
    auVar5._16_8_ = auStack_2d0._0_8_;
    auVar5._0_16_ = local_2e0;
    auVar5._24_8_ = auStack_2d0._8_8_;
    auVar4 = vpshufb_avx2(*pauVar28,auVar5);
    *(undefined1 (*) [32])(local_19c8 + 0x60 + (ulong)(local_1de4 << 3) * 0x20) = auVar4;
    pauVar28 = (undefined1 (*) [32])(local_19c8 + 0xe0 + (ulong)(local_1de4 << 3) * 0x20);
    local_c80 = *(undefined8 *)*pauVar28;
    uStack_c78 = *(undefined8 *)(*pauVar28 + 8);
    uStack_c70 = *(undefined8 *)(*pauVar28 + 0x10);
    uStack_c68 = *(undefined8 *)(*pauVar28 + 0x18);
    local_965 = 2;
    local_966 = 3;
    local_967 = 4;
    local_968 = 5;
    local_969 = 6;
    local_96a = 7;
    local_96b = 0;
    local_96c = 1;
    local_96d = 10;
    local_96e = 0xb;
    local_96f = 0xc;
    local_970 = 0xd;
    local_971 = 0xe;
    local_972 = 0xf;
    local_973 = 8;
    local_974 = 9;
    local_975 = 0x12;
    local_976 = 0x13;
    local_977 = 0x14;
    local_978 = 0x15;
    local_979 = 0x16;
    local_97a = 0x17;
    local_97b = 0x10;
    local_97c = 0x11;
    local_97d = 0x1a;
    local_97e = 0x1b;
    local_97f = 0x1c;
    local_980 = 0x1d;
    local_981 = 0x1e;
    local_982 = 0x1f;
    local_983 = 0x18;
    local_984 = 0x19;
    local_261 = 0x19;
    local_262 = 0x18;
    local_263 = 0x1f;
    local_264 = 0x1e;
    local_265 = 0x1d;
    local_266 = 0x1c;
    local_267 = 0x1b;
    local_268 = 0x1a;
    local_269 = 0x11;
    local_26a = 0x10;
    local_26b = 0x17;
    local_26c = 0x16;
    local_26d = 0x15;
    local_26e = 0x14;
    local_26f = 0x13;
    local_270 = 0x12;
    local_271 = 9;
    local_272 = 8;
    local_273 = 0xf;
    local_274 = 0xe;
    local_275 = 0xd;
    local_276 = 0xc;
    local_277 = 0xb;
    local_278 = 10;
    local_279 = 1;
    local_27a = 0;
    local_27b = 7;
    local_27c = 6;
    local_27d = 5;
    local_27e = 4;
    local_27f = 3;
    local_280 = 2;
    auVar2 = vpinsrb_avx(ZEXT116(0x12),0x13,1);
    auVar2 = vpinsrb_avx(auVar2,0x14,2);
    auVar2 = vpinsrb_avx(auVar2,0x15,3);
    auVar2 = vpinsrb_avx(auVar2,0x16,4);
    auVar2 = vpinsrb_avx(auVar2,0x17,5);
    auVar2 = vpinsrb_avx(auVar2,0x10,6);
    auVar2 = vpinsrb_avx(auVar2,0x11,7);
    auVar2 = vpinsrb_avx(auVar2,0x1a,8);
    auVar2 = vpinsrb_avx(auVar2,0x1b,9);
    auVar2 = vpinsrb_avx(auVar2,0x1c,10);
    auVar2 = vpinsrb_avx(auVar2,0x1d,0xb);
    auVar2 = vpinsrb_avx(auVar2,0x1e,0xc);
    auVar2 = vpinsrb_avx(auVar2,0x1f,0xd);
    auVar2 = vpinsrb_avx(auVar2,0x18,0xe);
    auVar2 = vpinsrb_avx(auVar2,0x19,0xf);
    auVar3 = vpinsrb_avx(ZEXT116(2),3,1);
    auVar3 = vpinsrb_avx(auVar3,4,2);
    auVar3 = vpinsrb_avx(auVar3,5,3);
    auVar3 = vpinsrb_avx(auVar3,6,4);
    auVar3 = vpinsrb_avx(auVar3,7,5);
    auVar3 = vpinsrb_avx(auVar3,0,6);
    auVar3 = vpinsrb_avx(auVar3,1,7);
    auVar3 = vpinsrb_avx(auVar3,10,8);
    auVar3 = vpinsrb_avx(auVar3,0xb,9);
    auVar3 = vpinsrb_avx(auVar3,0xc,10);
    auVar3 = vpinsrb_avx(auVar3,0xd,0xb);
    auVar3 = vpinsrb_avx(auVar3,0xe,0xc);
    auVar3 = vpinsrb_avx(auVar3,0xf,0xd);
    auVar3 = vpinsrb_avx(auVar3,8,0xe);
    auVar3 = vpinsrb_avx(auVar3,9,0xf);
    auVar39._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
    auVar39._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
    local_2a0._16_8_ = auVar39._16_8_;
    local_2a0._24_8_ = auVar39._24_8_;
    auVar4._16_8_ = local_2a0._16_8_;
    auVar4._0_16_ = auVar39._0_16_;
    auVar4._24_8_ = local_2a0._24_8_;
    auVar4 = vpshufb_avx2(*pauVar28,auVar4);
    *(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 * 8 + 7) * 0x20) = auVar4;
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 * 8 + 2) * 0x20);
    uVar35 = *puVar27;
    uVar44 = puVar27[1];
    uVar45 = puVar27[2];
    uVar46 = puVar27[3];
    x_13[0]._1_1_ = in_stack_ffffffffffffe079;
    x_13[0]._0_1_ = in_stack_ffffffffffffe078;
    x_13[0]._2_1_ = in_stack_ffffffffffffe07a;
    x_13[0]._3_1_ = in_stack_ffffffffffffe07b;
    x_13[0]._4_1_ = in_stack_ffffffffffffe07c;
    x_13[0]._5_1_ = in_stack_ffffffffffffe07d;
    x_13[0]._6_1_ = in_stack_ffffffffffffe07e;
    x_13[0]._7_1_ = in_stack_ffffffffffffe07f;
    x_13[1]._0_1_ = in_stack_ffffffffffffe080;
    x_13[1]._1_1_ = in_stack_ffffffffffffe081;
    x_13[1]._2_1_ = in_stack_ffffffffffffe082;
    x_13[1]._3_1_ = in_stack_ffffffffffffe083;
    x_13[1]._4_1_ = in_stack_ffffffffffffe084;
    x_13[1]._5_1_ = in_stack_ffffffffffffe085;
    x_13[1]._6_1_ = in_stack_ffffffffffffe086;
    x_13[1]._7_1_ = in_stack_ffffffffffffe087;
    x_13[2]._0_1_ = in_stack_ffffffffffffe088;
    x_13[2]._1_1_ = in_stack_ffffffffffffe089;
    x_13[2]._2_1_ = in_stack_ffffffffffffe08a;
    x_13[2]._3_1_ = in_stack_ffffffffffffe08b;
    x_13[2]._4_1_ = in_stack_ffffffffffffe08c;
    x_13[2]._5_1_ = in_stack_ffffffffffffe08d;
    x_13[2]._6_1_ = in_stack_ffffffffffffe08e;
    x_13[2]._7_1_ = in_stack_ffffffffffffe08f;
    x_13[3]._0_1_ = in_stack_ffffffffffffe090;
    x_13[3]._1_1_ = in_stack_ffffffffffffe091;
    x_13[3]._2_1_ = in_stack_ffffffffffffe092;
    x_13[3]._3_1_ = in_stack_ffffffffffffe093;
    x_13[3]._4_1_ = in_stack_ffffffffffffe094;
    x_13[3]._5_1_ = in_stack_ffffffffffffe095;
    x_13[3]._6_1_ = in_stack_ffffffffffffe096;
    x_13[3]._7_1_ = in_stack_ffffffffffffe097;
    y_13[0]._1_1_ = in_stack_ffffffffffffe059;
    y_13[0]._0_1_ = in_stack_ffffffffffffe058;
    y_13[0]._2_1_ = in_stack_ffffffffffffe05a;
    y_13[0]._3_1_ = in_stack_ffffffffffffe05b;
    y_13[0]._4_1_ = in_stack_ffffffffffffe05c;
    y_13[0]._5_1_ = in_stack_ffffffffffffe05d;
    y_13[0]._6_1_ = in_stack_ffffffffffffe05e;
    y_13[0]._7_1_ = in_stack_ffffffffffffe05f;
    y_13[1]._0_1_ = in_stack_ffffffffffffe060;
    y_13[1]._1_1_ = in_stack_ffffffffffffe061;
    y_13[1]._2_1_ = in_stack_ffffffffffffe062;
    y_13[1]._3_1_ = in_stack_ffffffffffffe063;
    y_13[1]._4_1_ = in_stack_ffffffffffffe064;
    y_13[1]._5_1_ = in_stack_ffffffffffffe065;
    y_13[1]._6_1_ = in_stack_ffffffffffffe066;
    y_13[1]._7_1_ = in_stack_ffffffffffffe067;
    y_13[2]._0_1_ = in_stack_ffffffffffffe068;
    y_13[2]._1_1_ = in_stack_ffffffffffffe069;
    y_13[2]._2_1_ = in_stack_ffffffffffffe06a;
    y_13[2]._3_1_ = in_stack_ffffffffffffe06b;
    y_13[2]._4_1_ = in_stack_ffffffffffffe06c;
    y_13[2]._5_1_ = in_stack_ffffffffffffe06d;
    y_13[2]._6_1_ = in_stack_ffffffffffffe06e;
    y_13[2]._7_1_ = in_stack_ffffffffffffe06f;
    y_13[3]._0_1_ = in_stack_ffffffffffffe070;
    y_13[3]._1_1_ = in_stack_ffffffffffffe071;
    y_13[3]._2_1_ = in_stack_ffffffffffffe072;
    y_13[3]._3_1_ = in_stack_ffffffffffffe073;
    y_13[3]._4_1_ = in_stack_ffffffffffffe074;
    y_13[3]._5_1_ = in_stack_ffffffffffffe075;
    y_13[3]._6_1_ = in_stack_ffffffffffffe076;
    y_13[3]._7_1_ = in_stack_ffffffffffffe077;
    local_2a0 = auVar39;
    local_ca0 = auVar39._0_16_;
    auStack_c90 = auVar39._16_16_;
    f(x_13,y_13);
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 * 8 + 2) * 0x20);
    *puVar27 = uVar35;
    puVar27[1] = uVar44;
    puVar27[2] = uVar45;
    puVar27[3] = uVar46;
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 * 8 + 6) * 0x20);
    uVar35 = *puVar27;
    uVar44 = puVar27[1];
    uVar45 = puVar27[2];
    uVar46 = puVar27[3];
    x_14[0]._1_1_ = in_stack_ffffffffffffe079;
    x_14[0]._0_1_ = in_stack_ffffffffffffe078;
    x_14[0]._2_1_ = in_stack_ffffffffffffe07a;
    x_14[0]._3_1_ = in_stack_ffffffffffffe07b;
    x_14[0]._4_1_ = in_stack_ffffffffffffe07c;
    x_14[0]._5_1_ = in_stack_ffffffffffffe07d;
    x_14[0]._6_1_ = in_stack_ffffffffffffe07e;
    x_14[0]._7_1_ = in_stack_ffffffffffffe07f;
    x_14[1]._0_1_ = in_stack_ffffffffffffe080;
    x_14[1]._1_1_ = in_stack_ffffffffffffe081;
    x_14[1]._2_1_ = in_stack_ffffffffffffe082;
    x_14[1]._3_1_ = in_stack_ffffffffffffe083;
    x_14[1]._4_1_ = in_stack_ffffffffffffe084;
    x_14[1]._5_1_ = in_stack_ffffffffffffe085;
    x_14[1]._6_1_ = in_stack_ffffffffffffe086;
    x_14[1]._7_1_ = in_stack_ffffffffffffe087;
    x_14[2]._0_1_ = in_stack_ffffffffffffe088;
    x_14[2]._1_1_ = in_stack_ffffffffffffe089;
    x_14[2]._2_1_ = in_stack_ffffffffffffe08a;
    x_14[2]._3_1_ = in_stack_ffffffffffffe08b;
    x_14[2]._4_1_ = in_stack_ffffffffffffe08c;
    x_14[2]._5_1_ = in_stack_ffffffffffffe08d;
    x_14[2]._6_1_ = in_stack_ffffffffffffe08e;
    x_14[2]._7_1_ = in_stack_ffffffffffffe08f;
    x_14[3]._0_1_ = in_stack_ffffffffffffe090;
    x_14[3]._1_1_ = in_stack_ffffffffffffe091;
    x_14[3]._2_1_ = in_stack_ffffffffffffe092;
    x_14[3]._3_1_ = in_stack_ffffffffffffe093;
    x_14[3]._4_1_ = in_stack_ffffffffffffe094;
    x_14[3]._5_1_ = in_stack_ffffffffffffe095;
    x_14[3]._6_1_ = in_stack_ffffffffffffe096;
    x_14[3]._7_1_ = in_stack_ffffffffffffe097;
    y_14[0]._1_1_ = in_stack_ffffffffffffe059;
    y_14[0]._0_1_ = in_stack_ffffffffffffe058;
    y_14[0]._2_1_ = in_stack_ffffffffffffe05a;
    y_14[0]._3_1_ = in_stack_ffffffffffffe05b;
    y_14[0]._4_1_ = in_stack_ffffffffffffe05c;
    y_14[0]._5_1_ = in_stack_ffffffffffffe05d;
    y_14[0]._6_1_ = in_stack_ffffffffffffe05e;
    y_14[0]._7_1_ = in_stack_ffffffffffffe05f;
    y_14[1]._0_1_ = in_stack_ffffffffffffe060;
    y_14[1]._1_1_ = in_stack_ffffffffffffe061;
    y_14[1]._2_1_ = in_stack_ffffffffffffe062;
    y_14[1]._3_1_ = in_stack_ffffffffffffe063;
    y_14[1]._4_1_ = in_stack_ffffffffffffe064;
    y_14[1]._5_1_ = in_stack_ffffffffffffe065;
    y_14[1]._6_1_ = in_stack_ffffffffffffe066;
    y_14[1]._7_1_ = in_stack_ffffffffffffe067;
    y_14[2]._0_1_ = in_stack_ffffffffffffe068;
    y_14[2]._1_1_ = in_stack_ffffffffffffe069;
    y_14[2]._2_1_ = in_stack_ffffffffffffe06a;
    y_14[2]._3_1_ = in_stack_ffffffffffffe06b;
    y_14[2]._4_1_ = in_stack_ffffffffffffe06c;
    y_14[2]._5_1_ = in_stack_ffffffffffffe06d;
    y_14[2]._6_1_ = in_stack_ffffffffffffe06e;
    y_14[2]._7_1_ = in_stack_ffffffffffffe06f;
    y_14[3]._0_1_ = in_stack_ffffffffffffe070;
    y_14[3]._1_1_ = in_stack_ffffffffffffe071;
    y_14[3]._2_1_ = in_stack_ffffffffffffe072;
    y_14[3]._3_1_ = in_stack_ffffffffffffe073;
    y_14[3]._4_1_ = in_stack_ffffffffffffe074;
    y_14[3]._5_1_ = in_stack_ffffffffffffe075;
    y_14[3]._6_1_ = in_stack_ffffffffffffe076;
    y_14[3]._7_1_ = in_stack_ffffffffffffe077;
    f(x_14,y_14);
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 * 8 + 6) * 0x20);
    *puVar27 = uVar35;
    puVar27[1] = uVar44;
    puVar27[2] = uVar45;
    puVar27[3] = uVar46;
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 * 8 + 1) * 0x20);
    local_13a0 = *puVar26;
    uStack_1398 = puVar26[1];
    uStack_1390 = puVar26[2];
    uStack_1388 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 * 8 + 2) * 0x20);
    local_13c0 = *puVar26;
    uStack_13b8 = puVar26[1];
    uStack_13b0 = puVar26[2];
    uStack_13a8 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 * 8 + 1) * 0x20);
    *puVar26 = local_13a0 ^ local_13c0;
    puVar26[1] = uStack_1398 ^ uStack_13b8;
    puVar26[2] = uStack_1390 ^ uStack_13b0;
    puVar26[3] = uStack_1388 ^ uStack_13a8;
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 * 8 + 5) * 0x20);
    local_13e0 = *puVar26;
    uStack_13d8 = puVar26[1];
    uStack_13d0 = puVar26[2];
    uStack_13c8 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 * 8 + 6) * 0x20);
    local_1400 = *puVar26;
    uStack_13f8 = puVar26[1];
    uStack_13f0 = puVar26[2];
    uStack_13e8 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 * 8 + 5) * 0x20);
    *puVar26 = local_13e0 ^ local_1400;
    puVar26[1] = uStack_13d8 ^ uStack_13f8;
    puVar26[2] = uStack_13d0 ^ uStack_13f0;
    puVar26[3] = uStack_13c8 ^ uStack_13e8;
    pauVar28 = (undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 * 8 + 1) * 0x20);
    local_740 = *(undefined8 *)*pauVar28;
    uStack_738 = *(undefined8 *)(*pauVar28 + 8);
    uStack_730 = *(undefined8 *)(*pauVar28 + 0x10);
    uStack_728 = *(undefined8 *)(*pauVar28 + 0x18);
    local_744 = 0x3f;
    local_1420 = vpsrlq_avx2(*pauVar28,ZEXT416(0x3f));
    pauVar28 = (undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 * 8 + 1) * 0x20);
    local_540 = *(undefined8 *)*pauVar28;
    uStack_538 = *(undefined8 *)(*pauVar28 + 8);
    uStack_530 = *(undefined8 *)(*pauVar28 + 0x10);
    uStack_528 = *(undefined8 *)(*pauVar28 + 0x18);
    pauVar29 = (undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 * 8 + 1) * 0x20);
    local_560 = *(undefined8 *)*pauVar29;
    uStack_558 = *(undefined8 *)(*pauVar29 + 8);
    uStack_550 = *(undefined8 *)(*pauVar29 + 0x10);
    uStack_548 = *(undefined8 *)(*pauVar29 + 0x18);
    local_1440 = vpaddq_avx2(*pauVar28,*pauVar29);
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 * 8 + 1) * 0x20);
    *puVar26 = local_1420._0_8_ ^ local_1440._0_8_;
    puVar26[1] = local_1420._8_8_ ^ local_1440._8_8_;
    puVar26[2] = local_1420._16_8_ ^ local_1440._16_8_;
    puVar26[3] = local_1420._24_8_ ^ local_1440._24_8_;
    pauVar28 = (undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 * 8 + 5) * 0x20);
    local_780 = *(undefined8 *)*pauVar28;
    uStack_778 = *(undefined8 *)(*pauVar28 + 8);
    uStack_770 = *(undefined8 *)(*pauVar28 + 0x10);
    uStack_768 = *(undefined8 *)(*pauVar28 + 0x18);
    local_784 = 0x3f;
    local_1460 = vpsrlq_avx2(*pauVar28,ZEXT416(0x3f));
    pauVar28 = (undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 * 8 + 5) * 0x20);
    local_580 = *(undefined8 *)*pauVar28;
    uStack_578 = *(undefined8 *)(*pauVar28 + 8);
    uStack_570 = *(undefined8 *)(*pauVar28 + 0x10);
    uStack_568 = *(undefined8 *)(*pauVar28 + 0x18);
    pauVar29 = (undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 * 8 + 5) * 0x20);
    local_5a0 = *(undefined8 *)*pauVar29;
    uStack_598 = *(undefined8 *)(*pauVar29 + 8);
    uStack_590 = *(undefined8 *)(*pauVar29 + 0x10);
    uStack_588 = *(undefined8 *)(*pauVar29 + 0x18);
    local_1480 = vpaddq_avx2(*pauVar28,*pauVar29);
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 * 8 + 5) * 0x20);
    *puVar26 = local_1460._0_8_ ^ local_1480._0_8_;
    puVar26[1] = local_1460._8_8_ ^ local_1480._8_8_;
    puVar26[2] = local_1460._16_8_ ^ local_1480._16_8_;
    puVar26[3] = local_1460._24_8_ ^ local_1480._24_8_;
    lVar32 = (ulong)(local_1de4 << 3) * 0x20;
    auVar4 = vpermq_avx2(*(undefined1 (*) [32])(local_19c8 + 0x20 + lVar32),0x93);
    *(undefined1 (*) [32])(local_19c8 + 0x20 + lVar32) = auVar4;
    lVar32 = (ulong)(local_1de4 << 3) * 0x20;
    auVar4 = vpermq_avx2(*(undefined1 (*) [32])(local_19c8 + 0xa0 + lVar32),0x93);
    *(undefined1 (*) [32])(local_19c8 + 0xa0 + lVar32) = auVar4;
    lVar32 = (ulong)(local_1de4 << 3) * 0x20;
    auVar4 = vpermq_avx2(*(undefined1 (*) [32])(local_19c8 + 0x40 + lVar32),0x4e);
    *(undefined1 (*) [32])(local_19c8 + 0x40 + lVar32) = auVar4;
    lVar32 = (ulong)(local_1de4 << 3) * 0x20;
    auVar4 = vpermq_avx2(*(undefined1 (*) [32])(local_19c8 + 0xc0 + lVar32),0x4e);
    *(undefined1 (*) [32])(local_19c8 + 0xc0 + lVar32) = auVar4;
    lVar32 = (ulong)(local_1de4 << 3) * 0x20;
    auVar4 = vpermq_avx2(*(undefined1 (*) [32])(local_19c8 + 0x60 + lVar32),0x39);
    *(undefined1 (*) [32])(local_19c8 + 0x60 + lVar32) = auVar4;
    auVar4 = vpermq_avx2(*(undefined1 (*) [32])(local_19c8 + 0xe0 + (ulong)(local_1de4 << 3) * 0x20)
                         ,0x39);
    *(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 * 8 + 7) * 0x20) = auVar4;
    local_1de4 = local_1de4 + 1;
  }
  for (local_1de4 = 0; local_1de4 < 4; local_1de4 = local_1de4 + 1) {
    puVar27 = (undefined8 *)(local_19c8 + (ulong)local_1de4 * 0x20);
    uVar35 = *puVar27;
    uVar44 = puVar27[1];
    uVar45 = puVar27[2];
    uVar46 = puVar27[3];
    x_15[0]._1_1_ = in_stack_ffffffffffffe079;
    x_15[0]._0_1_ = in_stack_ffffffffffffe078;
    x_15[0]._2_1_ = in_stack_ffffffffffffe07a;
    x_15[0]._3_1_ = in_stack_ffffffffffffe07b;
    x_15[0]._4_1_ = in_stack_ffffffffffffe07c;
    x_15[0]._5_1_ = in_stack_ffffffffffffe07d;
    x_15[0]._6_1_ = in_stack_ffffffffffffe07e;
    x_15[0]._7_1_ = in_stack_ffffffffffffe07f;
    x_15[1]._0_1_ = in_stack_ffffffffffffe080;
    x_15[1]._1_1_ = in_stack_ffffffffffffe081;
    x_15[1]._2_1_ = in_stack_ffffffffffffe082;
    x_15[1]._3_1_ = in_stack_ffffffffffffe083;
    x_15[1]._4_1_ = in_stack_ffffffffffffe084;
    x_15[1]._5_1_ = in_stack_ffffffffffffe085;
    x_15[1]._6_1_ = in_stack_ffffffffffffe086;
    x_15[1]._7_1_ = in_stack_ffffffffffffe087;
    x_15[2]._0_1_ = in_stack_ffffffffffffe088;
    x_15[2]._1_1_ = in_stack_ffffffffffffe089;
    x_15[2]._2_1_ = in_stack_ffffffffffffe08a;
    x_15[2]._3_1_ = in_stack_ffffffffffffe08b;
    x_15[2]._4_1_ = in_stack_ffffffffffffe08c;
    x_15[2]._5_1_ = in_stack_ffffffffffffe08d;
    x_15[2]._6_1_ = in_stack_ffffffffffffe08e;
    x_15[2]._7_1_ = in_stack_ffffffffffffe08f;
    x_15[3]._0_1_ = in_stack_ffffffffffffe090;
    x_15[3]._1_1_ = in_stack_ffffffffffffe091;
    x_15[3]._2_1_ = in_stack_ffffffffffffe092;
    x_15[3]._3_1_ = in_stack_ffffffffffffe093;
    x_15[3]._4_1_ = in_stack_ffffffffffffe094;
    x_15[3]._5_1_ = in_stack_ffffffffffffe095;
    x_15[3]._6_1_ = in_stack_ffffffffffffe096;
    x_15[3]._7_1_ = in_stack_ffffffffffffe097;
    y_15[0]._1_1_ = in_stack_ffffffffffffe059;
    y_15[0]._0_1_ = in_stack_ffffffffffffe058;
    y_15[0]._2_1_ = in_stack_ffffffffffffe05a;
    y_15[0]._3_1_ = in_stack_ffffffffffffe05b;
    y_15[0]._4_1_ = in_stack_ffffffffffffe05c;
    y_15[0]._5_1_ = in_stack_ffffffffffffe05d;
    y_15[0]._6_1_ = in_stack_ffffffffffffe05e;
    y_15[0]._7_1_ = in_stack_ffffffffffffe05f;
    y_15[1]._0_1_ = in_stack_ffffffffffffe060;
    y_15[1]._1_1_ = in_stack_ffffffffffffe061;
    y_15[1]._2_1_ = in_stack_ffffffffffffe062;
    y_15[1]._3_1_ = in_stack_ffffffffffffe063;
    y_15[1]._4_1_ = in_stack_ffffffffffffe064;
    y_15[1]._5_1_ = in_stack_ffffffffffffe065;
    y_15[1]._6_1_ = in_stack_ffffffffffffe066;
    y_15[1]._7_1_ = in_stack_ffffffffffffe067;
    y_15[2]._0_1_ = in_stack_ffffffffffffe068;
    y_15[2]._1_1_ = in_stack_ffffffffffffe069;
    y_15[2]._2_1_ = in_stack_ffffffffffffe06a;
    y_15[2]._3_1_ = in_stack_ffffffffffffe06b;
    y_15[2]._4_1_ = in_stack_ffffffffffffe06c;
    y_15[2]._5_1_ = in_stack_ffffffffffffe06d;
    y_15[2]._6_1_ = in_stack_ffffffffffffe06e;
    y_15[2]._7_1_ = in_stack_ffffffffffffe06f;
    y_15[3]._0_1_ = in_stack_ffffffffffffe070;
    y_15[3]._1_1_ = in_stack_ffffffffffffe071;
    y_15[3]._2_1_ = in_stack_ffffffffffffe072;
    y_15[3]._3_1_ = in_stack_ffffffffffffe073;
    y_15[3]._4_1_ = in_stack_ffffffffffffe074;
    y_15[3]._5_1_ = in_stack_ffffffffffffe075;
    y_15[3]._6_1_ = in_stack_ffffffffffffe076;
    y_15[3]._7_1_ = in_stack_ffffffffffffe077;
    f(x_15,y_15);
    puVar27 = (undefined8 *)(local_19c8 + (ulong)local_1de4 * 0x20);
    *puVar27 = uVar35;
    puVar27[1] = uVar44;
    puVar27[2] = uVar45;
    puVar27[3] = uVar46;
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 + 4) * 0x20);
    uVar35 = *puVar27;
    uVar44 = puVar27[1];
    uVar45 = puVar27[2];
    uVar46 = puVar27[3];
    x_16[0]._1_1_ = in_stack_ffffffffffffe079;
    x_16[0]._0_1_ = in_stack_ffffffffffffe078;
    x_16[0]._2_1_ = in_stack_ffffffffffffe07a;
    x_16[0]._3_1_ = in_stack_ffffffffffffe07b;
    x_16[0]._4_1_ = in_stack_ffffffffffffe07c;
    x_16[0]._5_1_ = in_stack_ffffffffffffe07d;
    x_16[0]._6_1_ = in_stack_ffffffffffffe07e;
    x_16[0]._7_1_ = in_stack_ffffffffffffe07f;
    x_16[1]._0_1_ = in_stack_ffffffffffffe080;
    x_16[1]._1_1_ = in_stack_ffffffffffffe081;
    x_16[1]._2_1_ = in_stack_ffffffffffffe082;
    x_16[1]._3_1_ = in_stack_ffffffffffffe083;
    x_16[1]._4_1_ = in_stack_ffffffffffffe084;
    x_16[1]._5_1_ = in_stack_ffffffffffffe085;
    x_16[1]._6_1_ = in_stack_ffffffffffffe086;
    x_16[1]._7_1_ = in_stack_ffffffffffffe087;
    x_16[2]._0_1_ = in_stack_ffffffffffffe088;
    x_16[2]._1_1_ = in_stack_ffffffffffffe089;
    x_16[2]._2_1_ = in_stack_ffffffffffffe08a;
    x_16[2]._3_1_ = in_stack_ffffffffffffe08b;
    x_16[2]._4_1_ = in_stack_ffffffffffffe08c;
    x_16[2]._5_1_ = in_stack_ffffffffffffe08d;
    x_16[2]._6_1_ = in_stack_ffffffffffffe08e;
    x_16[2]._7_1_ = in_stack_ffffffffffffe08f;
    x_16[3]._0_1_ = in_stack_ffffffffffffe090;
    x_16[3]._1_1_ = in_stack_ffffffffffffe091;
    x_16[3]._2_1_ = in_stack_ffffffffffffe092;
    x_16[3]._3_1_ = in_stack_ffffffffffffe093;
    x_16[3]._4_1_ = in_stack_ffffffffffffe094;
    x_16[3]._5_1_ = in_stack_ffffffffffffe095;
    x_16[3]._6_1_ = in_stack_ffffffffffffe096;
    x_16[3]._7_1_ = in_stack_ffffffffffffe097;
    y_16[0]._1_1_ = in_stack_ffffffffffffe059;
    y_16[0]._0_1_ = in_stack_ffffffffffffe058;
    y_16[0]._2_1_ = in_stack_ffffffffffffe05a;
    y_16[0]._3_1_ = in_stack_ffffffffffffe05b;
    y_16[0]._4_1_ = in_stack_ffffffffffffe05c;
    y_16[0]._5_1_ = in_stack_ffffffffffffe05d;
    y_16[0]._6_1_ = in_stack_ffffffffffffe05e;
    y_16[0]._7_1_ = in_stack_ffffffffffffe05f;
    y_16[1]._0_1_ = in_stack_ffffffffffffe060;
    y_16[1]._1_1_ = in_stack_ffffffffffffe061;
    y_16[1]._2_1_ = in_stack_ffffffffffffe062;
    y_16[1]._3_1_ = in_stack_ffffffffffffe063;
    y_16[1]._4_1_ = in_stack_ffffffffffffe064;
    y_16[1]._5_1_ = in_stack_ffffffffffffe065;
    y_16[1]._6_1_ = in_stack_ffffffffffffe066;
    y_16[1]._7_1_ = in_stack_ffffffffffffe067;
    y_16[2]._0_1_ = in_stack_ffffffffffffe068;
    y_16[2]._1_1_ = in_stack_ffffffffffffe069;
    y_16[2]._2_1_ = in_stack_ffffffffffffe06a;
    y_16[2]._3_1_ = in_stack_ffffffffffffe06b;
    y_16[2]._4_1_ = in_stack_ffffffffffffe06c;
    y_16[2]._5_1_ = in_stack_ffffffffffffe06d;
    y_16[2]._6_1_ = in_stack_ffffffffffffe06e;
    y_16[2]._7_1_ = in_stack_ffffffffffffe06f;
    y_16[3]._0_1_ = in_stack_ffffffffffffe070;
    y_16[3]._1_1_ = in_stack_ffffffffffffe071;
    y_16[3]._2_1_ = in_stack_ffffffffffffe072;
    y_16[3]._3_1_ = in_stack_ffffffffffffe073;
    y_16[3]._4_1_ = in_stack_ffffffffffffe074;
    y_16[3]._5_1_ = in_stack_ffffffffffffe075;
    y_16[3]._6_1_ = in_stack_ffffffffffffe076;
    y_16[3]._7_1_ = in_stack_ffffffffffffe077;
    f(x_16,y_16);
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 + 4) * 0x20);
    *puVar27 = uVar35;
    puVar27[1] = uVar44;
    puVar27[2] = uVar45;
    puVar27[3] = uVar46;
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 0x18) * 0x20);
    local_14a0 = *puVar26;
    uStack_1498 = puVar26[1];
    uStack_1490 = puVar26[2];
    uStack_1488 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)local_1de4 * 0x20);
    local_14c0 = *puVar26;
    uStack_14b8 = puVar26[1];
    uStack_14b0 = puVar26[2];
    uStack_14a8 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 0x18) * 0x20);
    *puVar26 = local_14a0 ^ local_14c0;
    puVar26[1] = uStack_1498 ^ uStack_14b8;
    puVar26[2] = uStack_1490 ^ uStack_14b0;
    puVar26[3] = uStack_1488 ^ uStack_14a8;
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 0x1c) * 0x20);
    local_14e0 = *puVar26;
    uStack_14d8 = puVar26[1];
    uStack_14d0 = puVar26[2];
    uStack_14c8 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 4) * 0x20);
    local_1500 = *puVar26;
    uStack_14f8 = puVar26[1];
    uStack_14f0 = puVar26[2];
    uStack_14e8 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 0x1c) * 0x20);
    *puVar26 = local_14e0 ^ local_1500;
    puVar26[1] = uStack_14d8 ^ uStack_14f8;
    puVar26[2] = uStack_14d0 ^ uStack_14f0;
    puVar26[3] = uStack_14c8 ^ uStack_14e8;
    lVar32 = (ulong)(local_1de4 + 0x18) * 0x20;
    auVar4 = vpshufd_avx2(*(undefined1 (*) [32])(local_19c8 + lVar32),0xb1);
    *(undefined1 (*) [32])(local_19c8 + lVar32) = auVar4;
    lVar32 = (ulong)(local_1de4 + 0x1c) * 0x20;
    auVar4 = vpshufd_avx2(*(undefined1 (*) [32])(local_19c8 + lVar32),0xb1);
    *(undefined1 (*) [32])(local_19c8 + lVar32) = auVar4;
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 + 0x10) * 0x20);
    uVar35 = *puVar27;
    uVar44 = puVar27[1];
    uVar45 = puVar27[2];
    uVar46 = puVar27[3];
    x_17[0]._1_1_ = in_stack_ffffffffffffe079;
    x_17[0]._0_1_ = in_stack_ffffffffffffe078;
    x_17[0]._2_1_ = in_stack_ffffffffffffe07a;
    x_17[0]._3_1_ = in_stack_ffffffffffffe07b;
    x_17[0]._4_1_ = in_stack_ffffffffffffe07c;
    x_17[0]._5_1_ = in_stack_ffffffffffffe07d;
    x_17[0]._6_1_ = in_stack_ffffffffffffe07e;
    x_17[0]._7_1_ = in_stack_ffffffffffffe07f;
    x_17[1]._0_1_ = in_stack_ffffffffffffe080;
    x_17[1]._1_1_ = in_stack_ffffffffffffe081;
    x_17[1]._2_1_ = in_stack_ffffffffffffe082;
    x_17[1]._3_1_ = in_stack_ffffffffffffe083;
    x_17[1]._4_1_ = in_stack_ffffffffffffe084;
    x_17[1]._5_1_ = in_stack_ffffffffffffe085;
    x_17[1]._6_1_ = in_stack_ffffffffffffe086;
    x_17[1]._7_1_ = in_stack_ffffffffffffe087;
    x_17[2]._0_1_ = in_stack_ffffffffffffe088;
    x_17[2]._1_1_ = in_stack_ffffffffffffe089;
    x_17[2]._2_1_ = in_stack_ffffffffffffe08a;
    x_17[2]._3_1_ = in_stack_ffffffffffffe08b;
    x_17[2]._4_1_ = in_stack_ffffffffffffe08c;
    x_17[2]._5_1_ = in_stack_ffffffffffffe08d;
    x_17[2]._6_1_ = in_stack_ffffffffffffe08e;
    x_17[2]._7_1_ = in_stack_ffffffffffffe08f;
    x_17[3]._0_1_ = in_stack_ffffffffffffe090;
    x_17[3]._1_1_ = in_stack_ffffffffffffe091;
    x_17[3]._2_1_ = in_stack_ffffffffffffe092;
    x_17[3]._3_1_ = in_stack_ffffffffffffe093;
    x_17[3]._4_1_ = in_stack_ffffffffffffe094;
    x_17[3]._5_1_ = in_stack_ffffffffffffe095;
    x_17[3]._6_1_ = in_stack_ffffffffffffe096;
    x_17[3]._7_1_ = in_stack_ffffffffffffe097;
    y_17[0]._1_1_ = in_stack_ffffffffffffe059;
    y_17[0]._0_1_ = in_stack_ffffffffffffe058;
    y_17[0]._2_1_ = in_stack_ffffffffffffe05a;
    y_17[0]._3_1_ = in_stack_ffffffffffffe05b;
    y_17[0]._4_1_ = in_stack_ffffffffffffe05c;
    y_17[0]._5_1_ = in_stack_ffffffffffffe05d;
    y_17[0]._6_1_ = in_stack_ffffffffffffe05e;
    y_17[0]._7_1_ = in_stack_ffffffffffffe05f;
    y_17[1]._0_1_ = in_stack_ffffffffffffe060;
    y_17[1]._1_1_ = in_stack_ffffffffffffe061;
    y_17[1]._2_1_ = in_stack_ffffffffffffe062;
    y_17[1]._3_1_ = in_stack_ffffffffffffe063;
    y_17[1]._4_1_ = in_stack_ffffffffffffe064;
    y_17[1]._5_1_ = in_stack_ffffffffffffe065;
    y_17[1]._6_1_ = in_stack_ffffffffffffe066;
    y_17[1]._7_1_ = in_stack_ffffffffffffe067;
    y_17[2]._0_1_ = in_stack_ffffffffffffe068;
    y_17[2]._1_1_ = in_stack_ffffffffffffe069;
    y_17[2]._2_1_ = in_stack_ffffffffffffe06a;
    y_17[2]._3_1_ = in_stack_ffffffffffffe06b;
    y_17[2]._4_1_ = in_stack_ffffffffffffe06c;
    y_17[2]._5_1_ = in_stack_ffffffffffffe06d;
    y_17[2]._6_1_ = in_stack_ffffffffffffe06e;
    y_17[2]._7_1_ = in_stack_ffffffffffffe06f;
    y_17[3]._0_1_ = in_stack_ffffffffffffe070;
    y_17[3]._1_1_ = in_stack_ffffffffffffe071;
    y_17[3]._2_1_ = in_stack_ffffffffffffe072;
    y_17[3]._3_1_ = in_stack_ffffffffffffe073;
    y_17[3]._4_1_ = in_stack_ffffffffffffe074;
    y_17[3]._5_1_ = in_stack_ffffffffffffe075;
    y_17[3]._6_1_ = in_stack_ffffffffffffe076;
    y_17[3]._7_1_ = in_stack_ffffffffffffe077;
    f(x_17,y_17);
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 + 0x10) * 0x20);
    *puVar27 = uVar35;
    puVar27[1] = uVar44;
    puVar27[2] = uVar45;
    puVar27[3] = uVar46;
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 + 0x14) * 0x20);
    uVar35 = *puVar27;
    uVar44 = puVar27[1];
    uVar45 = puVar27[2];
    uVar46 = puVar27[3];
    x_18[0]._1_1_ = in_stack_ffffffffffffe079;
    x_18[0]._0_1_ = in_stack_ffffffffffffe078;
    x_18[0]._2_1_ = in_stack_ffffffffffffe07a;
    x_18[0]._3_1_ = in_stack_ffffffffffffe07b;
    x_18[0]._4_1_ = in_stack_ffffffffffffe07c;
    x_18[0]._5_1_ = in_stack_ffffffffffffe07d;
    x_18[0]._6_1_ = in_stack_ffffffffffffe07e;
    x_18[0]._7_1_ = in_stack_ffffffffffffe07f;
    x_18[1]._0_1_ = in_stack_ffffffffffffe080;
    x_18[1]._1_1_ = in_stack_ffffffffffffe081;
    x_18[1]._2_1_ = in_stack_ffffffffffffe082;
    x_18[1]._3_1_ = in_stack_ffffffffffffe083;
    x_18[1]._4_1_ = in_stack_ffffffffffffe084;
    x_18[1]._5_1_ = in_stack_ffffffffffffe085;
    x_18[1]._6_1_ = in_stack_ffffffffffffe086;
    x_18[1]._7_1_ = in_stack_ffffffffffffe087;
    x_18[2]._0_1_ = in_stack_ffffffffffffe088;
    x_18[2]._1_1_ = in_stack_ffffffffffffe089;
    x_18[2]._2_1_ = in_stack_ffffffffffffe08a;
    x_18[2]._3_1_ = in_stack_ffffffffffffe08b;
    x_18[2]._4_1_ = in_stack_ffffffffffffe08c;
    x_18[2]._5_1_ = in_stack_ffffffffffffe08d;
    x_18[2]._6_1_ = in_stack_ffffffffffffe08e;
    x_18[2]._7_1_ = in_stack_ffffffffffffe08f;
    x_18[3]._0_1_ = in_stack_ffffffffffffe090;
    x_18[3]._1_1_ = in_stack_ffffffffffffe091;
    x_18[3]._2_1_ = in_stack_ffffffffffffe092;
    x_18[3]._3_1_ = in_stack_ffffffffffffe093;
    x_18[3]._4_1_ = in_stack_ffffffffffffe094;
    x_18[3]._5_1_ = in_stack_ffffffffffffe095;
    x_18[3]._6_1_ = in_stack_ffffffffffffe096;
    x_18[3]._7_1_ = in_stack_ffffffffffffe097;
    y_18[0]._1_1_ = in_stack_ffffffffffffe059;
    y_18[0]._0_1_ = in_stack_ffffffffffffe058;
    y_18[0]._2_1_ = in_stack_ffffffffffffe05a;
    y_18[0]._3_1_ = in_stack_ffffffffffffe05b;
    y_18[0]._4_1_ = in_stack_ffffffffffffe05c;
    y_18[0]._5_1_ = in_stack_ffffffffffffe05d;
    y_18[0]._6_1_ = in_stack_ffffffffffffe05e;
    y_18[0]._7_1_ = in_stack_ffffffffffffe05f;
    y_18[1]._0_1_ = in_stack_ffffffffffffe060;
    y_18[1]._1_1_ = in_stack_ffffffffffffe061;
    y_18[1]._2_1_ = in_stack_ffffffffffffe062;
    y_18[1]._3_1_ = in_stack_ffffffffffffe063;
    y_18[1]._4_1_ = in_stack_ffffffffffffe064;
    y_18[1]._5_1_ = in_stack_ffffffffffffe065;
    y_18[1]._6_1_ = in_stack_ffffffffffffe066;
    y_18[1]._7_1_ = in_stack_ffffffffffffe067;
    y_18[2]._0_1_ = in_stack_ffffffffffffe068;
    y_18[2]._1_1_ = in_stack_ffffffffffffe069;
    y_18[2]._2_1_ = in_stack_ffffffffffffe06a;
    y_18[2]._3_1_ = in_stack_ffffffffffffe06b;
    y_18[2]._4_1_ = in_stack_ffffffffffffe06c;
    y_18[2]._5_1_ = in_stack_ffffffffffffe06d;
    y_18[2]._6_1_ = in_stack_ffffffffffffe06e;
    y_18[2]._7_1_ = in_stack_ffffffffffffe06f;
    y_18[3]._0_1_ = in_stack_ffffffffffffe070;
    y_18[3]._1_1_ = in_stack_ffffffffffffe071;
    y_18[3]._2_1_ = in_stack_ffffffffffffe072;
    y_18[3]._3_1_ = in_stack_ffffffffffffe073;
    y_18[3]._4_1_ = in_stack_ffffffffffffe074;
    y_18[3]._5_1_ = in_stack_ffffffffffffe075;
    y_18[3]._6_1_ = in_stack_ffffffffffffe076;
    y_18[3]._7_1_ = in_stack_ffffffffffffe077;
    f(x_18,y_18);
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 + 0x14) * 0x20);
    *puVar27 = uVar35;
    puVar27[1] = uVar44;
    puVar27[2] = uVar45;
    puVar27[3] = uVar46;
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 8) * 0x20);
    local_1520 = *puVar26;
    uStack_1518 = puVar26[1];
    uStack_1510 = puVar26[2];
    uStack_1508 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 0x10) * 0x20);
    local_1540 = *puVar26;
    uStack_1538 = puVar26[1];
    uStack_1530 = puVar26[2];
    uStack_1528 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 8) * 0x20);
    *puVar26 = local_1520 ^ local_1540;
    puVar26[1] = uStack_1518 ^ uStack_1538;
    puVar26[2] = uStack_1510 ^ uStack_1530;
    puVar26[3] = uStack_1508 ^ uStack_1528;
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 0xc) * 0x20);
    local_1560 = *puVar26;
    uStack_1558 = puVar26[1];
    uStack_1550 = puVar26[2];
    uStack_1548 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 0x14) * 0x20);
    local_1580 = *puVar26;
    uStack_1578 = puVar26[1];
    uStack_1570 = puVar26[2];
    uStack_1568 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 0xc) * 0x20);
    *puVar26 = local_1560 ^ local_1580;
    puVar26[1] = uStack_1558 ^ uStack_1578;
    puVar26[2] = uStack_1550 ^ uStack_1570;
    puVar26[3] = uStack_1548 ^ uStack_1568;
    pauVar28 = (undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 8) * 0x20);
    local_cc0 = *(undefined8 *)*pauVar28;
    uStack_cb8 = *(undefined8 *)(*pauVar28 + 8);
    uStack_cb0 = *(undefined8 *)(*pauVar28 + 0x10);
    uStack_ca8 = *(undefined8 *)(*pauVar28 + 0x18);
    local_985 = 3;
    local_986 = 4;
    local_987 = 5;
    local_988 = 6;
    local_989 = 7;
    local_98a = 0;
    local_98b = 1;
    local_98c = 2;
    local_98d = 0xb;
    local_98e = 0xc;
    local_98f = 0xd;
    local_990 = 0xe;
    local_991 = 0xf;
    local_992 = 8;
    local_993 = 9;
    local_994 = 10;
    local_995 = 0x13;
    local_996 = 0x14;
    local_997 = 0x15;
    local_998 = 0x16;
    local_999 = 0x17;
    local_99a = 0x10;
    local_99b = 0x11;
    local_99c = 0x12;
    local_99d = 0x1b;
    local_99e = 0x1c;
    local_99f = 0x1d;
    local_9a0 = 0x1e;
    local_9a1 = 0x1f;
    local_9a2 = 0x18;
    local_9a3 = 0x19;
    local_9a4 = 0x1a;
    local_221 = 0x1a;
    local_222 = 0x19;
    local_223 = 0x18;
    local_224 = 0x1f;
    local_225 = 0x1e;
    local_226 = 0x1d;
    local_227 = 0x1c;
    local_228 = 0x1b;
    local_229 = 0x12;
    local_22a = 0x11;
    local_22b = 0x10;
    local_22c = 0x17;
    local_22d = 0x16;
    local_22e = 0x15;
    local_22f = 0x14;
    local_230 = 0x13;
    local_231 = 10;
    local_232 = 9;
    local_233 = 8;
    local_234 = 0xf;
    local_235 = 0xe;
    local_236 = 0xd;
    local_237 = 0xc;
    local_238 = 0xb;
    local_239 = 2;
    local_23a = 1;
    local_23b = 0;
    local_23c = 7;
    local_23d = 6;
    local_23e = 5;
    local_23f = 4;
    local_240 = 3;
    auVar2 = vpinsrb_avx(ZEXT116(3),4,1);
    auVar2 = vpinsrb_avx(auVar2,5,2);
    auVar2 = vpinsrb_avx(auVar2,6,3);
    auVar2 = vpinsrb_avx(auVar2,7,4);
    auVar2 = vpinsrb_avx(auVar2,0,5);
    auVar2 = vpinsrb_avx(auVar2,1,6);
    auVar2 = vpinsrb_avx(auVar2,2,7);
    auVar2 = vpinsrb_avx(auVar2,0xb,8);
    auVar2 = vpinsrb_avx(auVar2,0xc,9);
    auVar2 = vpinsrb_avx(auVar2,0xd,10);
    auVar2 = vpinsrb_avx(auVar2,0xe,0xb);
    auVar2 = vpinsrb_avx(auVar2,0xf,0xc);
    auVar2 = vpinsrb_avx(auVar2,8,0xd);
    auVar2 = vpinsrb_avx(auVar2,9,0xe);
    local_260 = vpinsrb_avx(auVar2,10,0xf);
    auVar2 = vpinsrb_avx(ZEXT116(0x13),0x14,1);
    auVar2 = vpinsrb_avx(auVar2,0x15,2);
    auVar2 = vpinsrb_avx(auVar2,0x16,3);
    auVar2 = vpinsrb_avx(auVar2,0x17,4);
    auVar2 = vpinsrb_avx(auVar2,0x10,5);
    auVar2 = vpinsrb_avx(auVar2,0x11,6);
    auVar2 = vpinsrb_avx(auVar2,0x12,7);
    auVar2 = vpinsrb_avx(auVar2,0x1b,8);
    auVar2 = vpinsrb_avx(auVar2,0x1c,9);
    auVar2 = vpinsrb_avx(auVar2,0x1d,10);
    auVar2 = vpinsrb_avx(auVar2,0x1e,0xb);
    auVar2 = vpinsrb_avx(auVar2,0x1f,0xc);
    auVar2 = vpinsrb_avx(auVar2,0x18,0xd);
    auVar2 = vpinsrb_avx(auVar2,0x19,0xe);
    auStack_250 = vpinsrb_avx(auVar2,0x1a,0xf);
    local_ce0 = local_260._0_8_;
    uStack_cd8 = local_260._8_8_;
    uStack_cd0 = auStack_250._0_8_;
    uStack_cc8 = auStack_250._8_8_;
    auVar18._16_8_ = auStack_250._0_8_;
    auVar18._0_16_ = local_260;
    auVar18._24_8_ = auStack_250._8_8_;
    auVar4 = vpshufb_avx2(*pauVar28,auVar18);
    *(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 8) * 0x20) = auVar4;
    pauVar28 = (undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0xc) * 0x20);
    local_d00 = *(undefined8 *)*pauVar28;
    uStack_cf8 = *(undefined8 *)(*pauVar28 + 8);
    uStack_cf0 = *(undefined8 *)(*pauVar28 + 0x10);
    uStack_ce8 = *(undefined8 *)(*pauVar28 + 0x18);
    local_9a5 = 3;
    local_9a6 = 4;
    local_9a7 = 5;
    local_9a8 = 6;
    local_9a9 = 7;
    local_9aa = 0;
    local_9ab = 1;
    local_9ac = 2;
    local_9ad = 0xb;
    local_9ae = 0xc;
    local_9af = 0xd;
    local_9b0 = 0xe;
    local_9b1 = 0xf;
    local_9b2 = 8;
    local_9b3 = 9;
    local_9b4 = 10;
    local_9b5 = 0x13;
    local_9b6 = 0x14;
    local_9b7 = 0x15;
    local_9b8 = 0x16;
    local_9b9 = 0x17;
    local_9ba = 0x10;
    local_9bb = 0x11;
    local_9bc = 0x12;
    local_9bd = 0x1b;
    local_9be = 0x1c;
    local_9bf = 0x1d;
    local_9c0 = 0x1e;
    local_9c1 = 0x1f;
    local_9c2 = 0x18;
    local_9c3 = 0x19;
    local_9c4 = 0x1a;
    local_1e1 = 0x1a;
    local_1e2 = 0x19;
    local_1e3 = 0x18;
    local_1e4 = 0x1f;
    local_1e5 = 0x1e;
    local_1e6 = 0x1d;
    local_1e7 = 0x1c;
    local_1e8 = 0x1b;
    local_1e9 = 0x12;
    local_1ea = 0x11;
    local_1eb = 0x10;
    local_1ec = 0x17;
    local_1ed = 0x16;
    local_1ee = 0x15;
    local_1ef = 0x14;
    local_1f0 = 0x13;
    local_1f1 = 10;
    local_1f2 = 9;
    local_1f3 = 8;
    local_1f4 = 0xf;
    local_1f5 = 0xe;
    local_1f6 = 0xd;
    local_1f7 = 0xc;
    local_1f8 = 0xb;
    local_1f9 = 2;
    local_1fa = 1;
    local_1fb = 0;
    local_1fc = 7;
    local_1fd = 6;
    local_1fe = 5;
    local_1ff = 4;
    local_200 = 3;
    auVar2 = vpinsrb_avx(ZEXT116(0x13),0x14,1);
    auVar2 = vpinsrb_avx(auVar2,0x15,2);
    auVar2 = vpinsrb_avx(auVar2,0x16,3);
    auVar2 = vpinsrb_avx(auVar2,0x17,4);
    auVar2 = vpinsrb_avx(auVar2,0x10,5);
    auVar2 = vpinsrb_avx(auVar2,0x11,6);
    auVar2 = vpinsrb_avx(auVar2,0x12,7);
    auVar2 = vpinsrb_avx(auVar2,0x1b,8);
    auVar2 = vpinsrb_avx(auVar2,0x1c,9);
    auVar2 = vpinsrb_avx(auVar2,0x1d,10);
    auVar2 = vpinsrb_avx(auVar2,0x1e,0xb);
    auVar2 = vpinsrb_avx(auVar2,0x1f,0xc);
    auVar2 = vpinsrb_avx(auVar2,0x18,0xd);
    auVar2 = vpinsrb_avx(auVar2,0x19,0xe);
    auVar2 = vpinsrb_avx(auVar2,0x1a,0xf);
    auVar3 = vpinsrb_avx(ZEXT116(3),4,1);
    auVar3 = vpinsrb_avx(auVar3,5,2);
    auVar3 = vpinsrb_avx(auVar3,6,3);
    auVar3 = vpinsrb_avx(auVar3,7,4);
    auVar3 = vpinsrb_avx(auVar3,0,5);
    auVar3 = vpinsrb_avx(auVar3,1,6);
    auVar3 = vpinsrb_avx(auVar3,2,7);
    auVar3 = vpinsrb_avx(auVar3,0xb,8);
    auVar3 = vpinsrb_avx(auVar3,0xc,9);
    auVar3 = vpinsrb_avx(auVar3,0xd,10);
    auVar3 = vpinsrb_avx(auVar3,0xe,0xb);
    auVar3 = vpinsrb_avx(auVar3,0xf,0xc);
    auVar3 = vpinsrb_avx(auVar3,8,0xd);
    auVar3 = vpinsrb_avx(auVar3,9,0xe);
    auVar3 = vpinsrb_avx(auVar3,10,0xf);
    auVar40._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
    auVar40._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
    local_220._16_8_ = auVar40._16_8_;
    local_220._24_8_ = auVar40._24_8_;
    auVar17._16_8_ = local_220._16_8_;
    auVar17._0_16_ = auVar40._0_16_;
    auVar17._24_8_ = local_220._24_8_;
    auVar4 = vpshufb_avx2(*pauVar28,auVar17);
    *(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0xc) * 0x20) = auVar4;
    puVar27 = (undefined8 *)(local_19c8 + (ulong)local_1de4 * 0x20);
    uVar35 = *puVar27;
    uVar44 = puVar27[1];
    uVar45 = puVar27[2];
    uVar46 = puVar27[3];
    x_19[0]._1_1_ = in_stack_ffffffffffffe079;
    x_19[0]._0_1_ = in_stack_ffffffffffffe078;
    x_19[0]._2_1_ = in_stack_ffffffffffffe07a;
    x_19[0]._3_1_ = in_stack_ffffffffffffe07b;
    x_19[0]._4_1_ = in_stack_ffffffffffffe07c;
    x_19[0]._5_1_ = in_stack_ffffffffffffe07d;
    x_19[0]._6_1_ = in_stack_ffffffffffffe07e;
    x_19[0]._7_1_ = in_stack_ffffffffffffe07f;
    x_19[1]._0_1_ = in_stack_ffffffffffffe080;
    x_19[1]._1_1_ = in_stack_ffffffffffffe081;
    x_19[1]._2_1_ = in_stack_ffffffffffffe082;
    x_19[1]._3_1_ = in_stack_ffffffffffffe083;
    x_19[1]._4_1_ = in_stack_ffffffffffffe084;
    x_19[1]._5_1_ = in_stack_ffffffffffffe085;
    x_19[1]._6_1_ = in_stack_ffffffffffffe086;
    x_19[1]._7_1_ = in_stack_ffffffffffffe087;
    x_19[2]._0_1_ = in_stack_ffffffffffffe088;
    x_19[2]._1_1_ = in_stack_ffffffffffffe089;
    x_19[2]._2_1_ = in_stack_ffffffffffffe08a;
    x_19[2]._3_1_ = in_stack_ffffffffffffe08b;
    x_19[2]._4_1_ = in_stack_ffffffffffffe08c;
    x_19[2]._5_1_ = in_stack_ffffffffffffe08d;
    x_19[2]._6_1_ = in_stack_ffffffffffffe08e;
    x_19[2]._7_1_ = in_stack_ffffffffffffe08f;
    x_19[3]._0_1_ = in_stack_ffffffffffffe090;
    x_19[3]._1_1_ = in_stack_ffffffffffffe091;
    x_19[3]._2_1_ = in_stack_ffffffffffffe092;
    x_19[3]._3_1_ = in_stack_ffffffffffffe093;
    x_19[3]._4_1_ = in_stack_ffffffffffffe094;
    x_19[3]._5_1_ = in_stack_ffffffffffffe095;
    x_19[3]._6_1_ = in_stack_ffffffffffffe096;
    x_19[3]._7_1_ = in_stack_ffffffffffffe097;
    y_19[0]._1_1_ = in_stack_ffffffffffffe059;
    y_19[0]._0_1_ = in_stack_ffffffffffffe058;
    y_19[0]._2_1_ = in_stack_ffffffffffffe05a;
    y_19[0]._3_1_ = in_stack_ffffffffffffe05b;
    y_19[0]._4_1_ = in_stack_ffffffffffffe05c;
    y_19[0]._5_1_ = in_stack_ffffffffffffe05d;
    y_19[0]._6_1_ = in_stack_ffffffffffffe05e;
    y_19[0]._7_1_ = in_stack_ffffffffffffe05f;
    y_19[1]._0_1_ = in_stack_ffffffffffffe060;
    y_19[1]._1_1_ = in_stack_ffffffffffffe061;
    y_19[1]._2_1_ = in_stack_ffffffffffffe062;
    y_19[1]._3_1_ = in_stack_ffffffffffffe063;
    y_19[1]._4_1_ = in_stack_ffffffffffffe064;
    y_19[1]._5_1_ = in_stack_ffffffffffffe065;
    y_19[1]._6_1_ = in_stack_ffffffffffffe066;
    y_19[1]._7_1_ = in_stack_ffffffffffffe067;
    y_19[2]._0_1_ = in_stack_ffffffffffffe068;
    y_19[2]._1_1_ = in_stack_ffffffffffffe069;
    y_19[2]._2_1_ = in_stack_ffffffffffffe06a;
    y_19[2]._3_1_ = in_stack_ffffffffffffe06b;
    y_19[2]._4_1_ = in_stack_ffffffffffffe06c;
    y_19[2]._5_1_ = in_stack_ffffffffffffe06d;
    y_19[2]._6_1_ = in_stack_ffffffffffffe06e;
    y_19[2]._7_1_ = in_stack_ffffffffffffe06f;
    y_19[3]._0_1_ = in_stack_ffffffffffffe070;
    y_19[3]._1_1_ = in_stack_ffffffffffffe071;
    y_19[3]._2_1_ = in_stack_ffffffffffffe072;
    y_19[3]._3_1_ = in_stack_ffffffffffffe073;
    y_19[3]._4_1_ = in_stack_ffffffffffffe074;
    y_19[3]._5_1_ = in_stack_ffffffffffffe075;
    y_19[3]._6_1_ = in_stack_ffffffffffffe076;
    y_19[3]._7_1_ = in_stack_ffffffffffffe077;
    local_220 = auVar40;
    local_d20 = auVar40._0_16_;
    auStack_d10 = auVar40._16_16_;
    f(x_19,y_19);
    puVar27 = (undefined8 *)(local_19c8 + (ulong)local_1de4 * 0x20);
    *puVar27 = uVar35;
    puVar27[1] = uVar44;
    puVar27[2] = uVar45;
    puVar27[3] = uVar46;
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 + 4) * 0x20);
    uVar35 = *puVar27;
    uVar44 = puVar27[1];
    uVar45 = puVar27[2];
    uVar46 = puVar27[3];
    x_20[0]._1_1_ = in_stack_ffffffffffffe079;
    x_20[0]._0_1_ = in_stack_ffffffffffffe078;
    x_20[0]._2_1_ = in_stack_ffffffffffffe07a;
    x_20[0]._3_1_ = in_stack_ffffffffffffe07b;
    x_20[0]._4_1_ = in_stack_ffffffffffffe07c;
    x_20[0]._5_1_ = in_stack_ffffffffffffe07d;
    x_20[0]._6_1_ = in_stack_ffffffffffffe07e;
    x_20[0]._7_1_ = in_stack_ffffffffffffe07f;
    x_20[1]._0_1_ = in_stack_ffffffffffffe080;
    x_20[1]._1_1_ = in_stack_ffffffffffffe081;
    x_20[1]._2_1_ = in_stack_ffffffffffffe082;
    x_20[1]._3_1_ = in_stack_ffffffffffffe083;
    x_20[1]._4_1_ = in_stack_ffffffffffffe084;
    x_20[1]._5_1_ = in_stack_ffffffffffffe085;
    x_20[1]._6_1_ = in_stack_ffffffffffffe086;
    x_20[1]._7_1_ = in_stack_ffffffffffffe087;
    x_20[2]._0_1_ = in_stack_ffffffffffffe088;
    x_20[2]._1_1_ = in_stack_ffffffffffffe089;
    x_20[2]._2_1_ = in_stack_ffffffffffffe08a;
    x_20[2]._3_1_ = in_stack_ffffffffffffe08b;
    x_20[2]._4_1_ = in_stack_ffffffffffffe08c;
    x_20[2]._5_1_ = in_stack_ffffffffffffe08d;
    x_20[2]._6_1_ = in_stack_ffffffffffffe08e;
    x_20[2]._7_1_ = in_stack_ffffffffffffe08f;
    x_20[3]._0_1_ = in_stack_ffffffffffffe090;
    x_20[3]._1_1_ = in_stack_ffffffffffffe091;
    x_20[3]._2_1_ = in_stack_ffffffffffffe092;
    x_20[3]._3_1_ = in_stack_ffffffffffffe093;
    x_20[3]._4_1_ = in_stack_ffffffffffffe094;
    x_20[3]._5_1_ = in_stack_ffffffffffffe095;
    x_20[3]._6_1_ = in_stack_ffffffffffffe096;
    x_20[3]._7_1_ = in_stack_ffffffffffffe097;
    y_20[0]._1_1_ = in_stack_ffffffffffffe059;
    y_20[0]._0_1_ = in_stack_ffffffffffffe058;
    y_20[0]._2_1_ = in_stack_ffffffffffffe05a;
    y_20[0]._3_1_ = in_stack_ffffffffffffe05b;
    y_20[0]._4_1_ = in_stack_ffffffffffffe05c;
    y_20[0]._5_1_ = in_stack_ffffffffffffe05d;
    y_20[0]._6_1_ = in_stack_ffffffffffffe05e;
    y_20[0]._7_1_ = in_stack_ffffffffffffe05f;
    y_20[1]._0_1_ = in_stack_ffffffffffffe060;
    y_20[1]._1_1_ = in_stack_ffffffffffffe061;
    y_20[1]._2_1_ = in_stack_ffffffffffffe062;
    y_20[1]._3_1_ = in_stack_ffffffffffffe063;
    y_20[1]._4_1_ = in_stack_ffffffffffffe064;
    y_20[1]._5_1_ = in_stack_ffffffffffffe065;
    y_20[1]._6_1_ = in_stack_ffffffffffffe066;
    y_20[1]._7_1_ = in_stack_ffffffffffffe067;
    y_20[2]._0_1_ = in_stack_ffffffffffffe068;
    y_20[2]._1_1_ = in_stack_ffffffffffffe069;
    y_20[2]._2_1_ = in_stack_ffffffffffffe06a;
    y_20[2]._3_1_ = in_stack_ffffffffffffe06b;
    y_20[2]._4_1_ = in_stack_ffffffffffffe06c;
    y_20[2]._5_1_ = in_stack_ffffffffffffe06d;
    y_20[2]._6_1_ = in_stack_ffffffffffffe06e;
    y_20[2]._7_1_ = in_stack_ffffffffffffe06f;
    y_20[3]._0_1_ = in_stack_ffffffffffffe070;
    y_20[3]._1_1_ = in_stack_ffffffffffffe071;
    y_20[3]._2_1_ = in_stack_ffffffffffffe072;
    y_20[3]._3_1_ = in_stack_ffffffffffffe073;
    y_20[3]._4_1_ = in_stack_ffffffffffffe074;
    y_20[3]._5_1_ = in_stack_ffffffffffffe075;
    y_20[3]._6_1_ = in_stack_ffffffffffffe076;
    y_20[3]._7_1_ = in_stack_ffffffffffffe077;
    f(x_20,y_20);
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 + 4) * 0x20);
    *puVar27 = uVar35;
    puVar27[1] = uVar44;
    puVar27[2] = uVar45;
    puVar27[3] = uVar46;
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 0x18) * 0x20);
    local_15a0 = *puVar26;
    uStack_1598 = puVar26[1];
    uStack_1590 = puVar26[2];
    uStack_1588 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)local_1de4 * 0x20);
    local_15c0 = *puVar26;
    uStack_15b8 = puVar26[1];
    uStack_15b0 = puVar26[2];
    uStack_15a8 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 0x18) * 0x20);
    *puVar26 = local_15a0 ^ local_15c0;
    puVar26[1] = uStack_1598 ^ uStack_15b8;
    puVar26[2] = uStack_1590 ^ uStack_15b0;
    puVar26[3] = uStack_1588 ^ uStack_15a8;
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 0x1c) * 0x20);
    local_15e0 = *puVar26;
    uStack_15d8 = puVar26[1];
    uStack_15d0 = puVar26[2];
    uStack_15c8 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 4) * 0x20);
    local_1600 = *puVar26;
    uStack_15f8 = puVar26[1];
    uStack_15f0 = puVar26[2];
    uStack_15e8 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 0x1c) * 0x20);
    *puVar26 = local_15e0 ^ local_1600;
    puVar26[1] = uStack_15d8 ^ uStack_15f8;
    puVar26[2] = uStack_15d0 ^ uStack_15f0;
    puVar26[3] = uStack_15c8 ^ uStack_15e8;
    pauVar28 = (undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0x18) * 0x20);
    local_d40 = *(undefined8 *)*pauVar28;
    uStack_d38 = *(undefined8 *)(*pauVar28 + 8);
    uStack_d30 = *(undefined8 *)(*pauVar28 + 0x10);
    uStack_d28 = *(undefined8 *)(*pauVar28 + 0x18);
    local_9c5 = 2;
    local_9c6 = 3;
    local_9c7 = 4;
    local_9c8 = 5;
    local_9c9 = 6;
    local_9ca = 7;
    local_9cb = 0;
    local_9cc = 1;
    local_9cd = 10;
    local_9ce = 0xb;
    local_9cf = 0xc;
    local_9d0 = 0xd;
    local_9d1 = 0xe;
    local_9d2 = 0xf;
    local_9d3 = 8;
    local_9d4 = 9;
    local_9d5 = 0x12;
    local_9d6 = 0x13;
    local_9d7 = 0x14;
    local_9d8 = 0x15;
    local_9d9 = 0x16;
    local_9da = 0x17;
    local_9db = 0x10;
    local_9dc = 0x11;
    local_9dd = 0x1a;
    local_9de = 0x1b;
    local_9df = 0x1c;
    local_9e0 = 0x1d;
    local_9e1 = 0x1e;
    local_9e2 = 0x1f;
    local_9e3 = 0x18;
    local_9e4 = 0x19;
    local_1a1 = 0x19;
    local_1a2 = 0x18;
    local_1a3 = 0x1f;
    local_1a4 = 0x1e;
    local_1a5 = 0x1d;
    local_1a6 = 0x1c;
    local_1a7 = 0x1b;
    local_1a8 = 0x1a;
    local_1a9 = 0x11;
    local_1aa = 0x10;
    local_1ab = 0x17;
    local_1ac = 0x16;
    local_1ad = 0x15;
    local_1ae = 0x14;
    local_1af = 0x13;
    local_1b0 = 0x12;
    local_1b1 = 9;
    local_1b2 = 8;
    local_1b3 = 0xf;
    local_1b4 = 0xe;
    local_1b5 = 0xd;
    local_1b6 = 0xc;
    local_1b7 = 0xb;
    local_1b8 = 10;
    local_1b9 = 1;
    local_1ba = 0;
    local_1bb = 7;
    local_1bc = 6;
    local_1bd = 5;
    local_1be = 4;
    local_1bf = 3;
    local_1c0 = 2;
    auVar2 = vpinsrb_avx(ZEXT116(2),3,1);
    auVar2 = vpinsrb_avx(auVar2,4,2);
    auVar2 = vpinsrb_avx(auVar2,5,3);
    auVar2 = vpinsrb_avx(auVar2,6,4);
    auVar2 = vpinsrb_avx(auVar2,7,5);
    auVar2 = vpinsrb_avx(auVar2,0,6);
    auVar2 = vpinsrb_avx(auVar2,1,7);
    auVar2 = vpinsrb_avx(auVar2,10,8);
    auVar2 = vpinsrb_avx(auVar2,0xb,9);
    auVar2 = vpinsrb_avx(auVar2,0xc,10);
    auVar2 = vpinsrb_avx(auVar2,0xd,0xb);
    auVar2 = vpinsrb_avx(auVar2,0xe,0xc);
    auVar2 = vpinsrb_avx(auVar2,0xf,0xd);
    auVar2 = vpinsrb_avx(auVar2,8,0xe);
    local_1e0 = vpinsrb_avx(auVar2,9,0xf);
    auVar2 = vpinsrb_avx(ZEXT116(0x12),0x13,1);
    auVar2 = vpinsrb_avx(auVar2,0x14,2);
    auVar2 = vpinsrb_avx(auVar2,0x15,3);
    auVar2 = vpinsrb_avx(auVar2,0x16,4);
    auVar2 = vpinsrb_avx(auVar2,0x17,5);
    auVar2 = vpinsrb_avx(auVar2,0x10,6);
    auVar2 = vpinsrb_avx(auVar2,0x11,7);
    auVar2 = vpinsrb_avx(auVar2,0x1a,8);
    auVar2 = vpinsrb_avx(auVar2,0x1b,9);
    auVar2 = vpinsrb_avx(auVar2,0x1c,10);
    auVar2 = vpinsrb_avx(auVar2,0x1d,0xb);
    auVar2 = vpinsrb_avx(auVar2,0x1e,0xc);
    auVar2 = vpinsrb_avx(auVar2,0x1f,0xd);
    auVar2 = vpinsrb_avx(auVar2,0x18,0xe);
    auStack_1d0 = vpinsrb_avx(auVar2,0x19,0xf);
    local_d60 = local_1e0._0_8_;
    uStack_d58 = local_1e0._8_8_;
    uStack_d50 = auStack_1d0._0_8_;
    uStack_d48 = auStack_1d0._8_8_;
    auVar16._16_8_ = auStack_1d0._0_8_;
    auVar16._0_16_ = local_1e0;
    auVar16._24_8_ = auStack_1d0._8_8_;
    auVar4 = vpshufb_avx2(*pauVar28,auVar16);
    *(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0x18) * 0x20) = auVar4;
    pauVar28 = (undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0x1c) * 0x20);
    local_d80 = *(undefined8 *)*pauVar28;
    uStack_d78 = *(undefined8 *)(*pauVar28 + 8);
    uStack_d70 = *(undefined8 *)(*pauVar28 + 0x10);
    uStack_d68 = *(undefined8 *)(*pauVar28 + 0x18);
    local_9e5 = 2;
    local_9e6 = 3;
    local_9e7 = 4;
    local_9e8 = 5;
    local_9e9 = 6;
    local_9ea = 7;
    local_9eb = 0;
    local_9ec = 1;
    local_9ed = 10;
    local_9ee = 0xb;
    local_9ef = 0xc;
    local_9f0 = 0xd;
    local_9f1 = 0xe;
    local_9f2 = 0xf;
    local_9f3 = 8;
    local_9f4 = 9;
    local_9f5 = 0x12;
    local_9f6 = 0x13;
    local_9f7 = 0x14;
    local_9f8 = 0x15;
    local_9f9 = 0x16;
    local_9fa = 0x17;
    local_9fb = 0x10;
    local_9fc = 0x11;
    local_9fd = 0x1a;
    local_9fe = 0x1b;
    local_9ff = 0x1c;
    local_a00 = 0x1d;
    local_a01 = 0x1e;
    local_a02 = 0x1f;
    local_a03 = 0x18;
    local_a04 = 0x19;
    local_161 = 0x19;
    local_162 = 0x18;
    local_163 = 0x1f;
    local_164 = 0x1e;
    local_165 = 0x1d;
    local_166 = 0x1c;
    local_167 = 0x1b;
    local_168 = 0x1a;
    local_169 = 0x11;
    local_16a = 0x10;
    local_16b = 0x17;
    local_16c = 0x16;
    local_16d = 0x15;
    local_16e = 0x14;
    local_16f = 0x13;
    local_170 = 0x12;
    local_171 = 9;
    local_172 = 8;
    local_173 = 0xf;
    local_174 = 0xe;
    local_175 = 0xd;
    local_176 = 0xc;
    local_177 = 0xb;
    local_178 = 10;
    local_179 = 1;
    local_17a = 0;
    local_17b = 7;
    local_17c = 6;
    local_17d = 5;
    local_17e = 4;
    local_17f = 3;
    local_180 = 2;
    auVar2 = vpinsrb_avx(ZEXT116(0x12),0x13,1);
    auVar2 = vpinsrb_avx(auVar2,0x14,2);
    auVar2 = vpinsrb_avx(auVar2,0x15,3);
    auVar2 = vpinsrb_avx(auVar2,0x16,4);
    auVar2 = vpinsrb_avx(auVar2,0x17,5);
    auVar2 = vpinsrb_avx(auVar2,0x10,6);
    auVar2 = vpinsrb_avx(auVar2,0x11,7);
    auVar2 = vpinsrb_avx(auVar2,0x1a,8);
    auVar2 = vpinsrb_avx(auVar2,0x1b,9);
    auVar2 = vpinsrb_avx(auVar2,0x1c,10);
    auVar2 = vpinsrb_avx(auVar2,0x1d,0xb);
    auVar2 = vpinsrb_avx(auVar2,0x1e,0xc);
    auVar2 = vpinsrb_avx(auVar2,0x1f,0xd);
    auVar2 = vpinsrb_avx(auVar2,0x18,0xe);
    auVar2 = vpinsrb_avx(auVar2,0x19,0xf);
    auVar3 = vpinsrb_avx(ZEXT116(2),3,1);
    auVar3 = vpinsrb_avx(auVar3,4,2);
    auVar3 = vpinsrb_avx(auVar3,5,3);
    auVar3 = vpinsrb_avx(auVar3,6,4);
    auVar3 = vpinsrb_avx(auVar3,7,5);
    auVar3 = vpinsrb_avx(auVar3,0,6);
    auVar3 = vpinsrb_avx(auVar3,1,7);
    auVar3 = vpinsrb_avx(auVar3,10,8);
    auVar3 = vpinsrb_avx(auVar3,0xb,9);
    auVar3 = vpinsrb_avx(auVar3,0xc,10);
    auVar3 = vpinsrb_avx(auVar3,0xd,0xb);
    auVar3 = vpinsrb_avx(auVar3,0xe,0xc);
    auVar3 = vpinsrb_avx(auVar3,0xf,0xd);
    auVar3 = vpinsrb_avx(auVar3,8,0xe);
    auVar3 = vpinsrb_avx(auVar3,9,0xf);
    auVar41._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
    auVar41._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
    local_1a0._16_8_ = auVar41._16_8_;
    local_1a0._24_8_ = auVar41._24_8_;
    auVar15._16_8_ = local_1a0._16_8_;
    auVar15._0_16_ = auVar41._0_16_;
    auVar15._24_8_ = local_1a0._24_8_;
    auVar4 = vpshufb_avx2(*pauVar28,auVar15);
    *(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0x1c) * 0x20) = auVar4;
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 + 0x10) * 0x20);
    uVar35 = *puVar27;
    uVar44 = puVar27[1];
    uVar45 = puVar27[2];
    uVar46 = puVar27[3];
    x_21[0]._1_1_ = in_stack_ffffffffffffe079;
    x_21[0]._0_1_ = in_stack_ffffffffffffe078;
    x_21[0]._2_1_ = in_stack_ffffffffffffe07a;
    x_21[0]._3_1_ = in_stack_ffffffffffffe07b;
    x_21[0]._4_1_ = in_stack_ffffffffffffe07c;
    x_21[0]._5_1_ = in_stack_ffffffffffffe07d;
    x_21[0]._6_1_ = in_stack_ffffffffffffe07e;
    x_21[0]._7_1_ = in_stack_ffffffffffffe07f;
    x_21[1]._0_1_ = in_stack_ffffffffffffe080;
    x_21[1]._1_1_ = in_stack_ffffffffffffe081;
    x_21[1]._2_1_ = in_stack_ffffffffffffe082;
    x_21[1]._3_1_ = in_stack_ffffffffffffe083;
    x_21[1]._4_1_ = in_stack_ffffffffffffe084;
    x_21[1]._5_1_ = in_stack_ffffffffffffe085;
    x_21[1]._6_1_ = in_stack_ffffffffffffe086;
    x_21[1]._7_1_ = in_stack_ffffffffffffe087;
    x_21[2]._0_1_ = in_stack_ffffffffffffe088;
    x_21[2]._1_1_ = in_stack_ffffffffffffe089;
    x_21[2]._2_1_ = in_stack_ffffffffffffe08a;
    x_21[2]._3_1_ = in_stack_ffffffffffffe08b;
    x_21[2]._4_1_ = in_stack_ffffffffffffe08c;
    x_21[2]._5_1_ = in_stack_ffffffffffffe08d;
    x_21[2]._6_1_ = in_stack_ffffffffffffe08e;
    x_21[2]._7_1_ = in_stack_ffffffffffffe08f;
    x_21[3]._0_1_ = in_stack_ffffffffffffe090;
    x_21[3]._1_1_ = in_stack_ffffffffffffe091;
    x_21[3]._2_1_ = in_stack_ffffffffffffe092;
    x_21[3]._3_1_ = in_stack_ffffffffffffe093;
    x_21[3]._4_1_ = in_stack_ffffffffffffe094;
    x_21[3]._5_1_ = in_stack_ffffffffffffe095;
    x_21[3]._6_1_ = in_stack_ffffffffffffe096;
    x_21[3]._7_1_ = in_stack_ffffffffffffe097;
    y_21[0]._1_1_ = in_stack_ffffffffffffe059;
    y_21[0]._0_1_ = in_stack_ffffffffffffe058;
    y_21[0]._2_1_ = in_stack_ffffffffffffe05a;
    y_21[0]._3_1_ = in_stack_ffffffffffffe05b;
    y_21[0]._4_1_ = in_stack_ffffffffffffe05c;
    y_21[0]._5_1_ = in_stack_ffffffffffffe05d;
    y_21[0]._6_1_ = in_stack_ffffffffffffe05e;
    y_21[0]._7_1_ = in_stack_ffffffffffffe05f;
    y_21[1]._0_1_ = in_stack_ffffffffffffe060;
    y_21[1]._1_1_ = in_stack_ffffffffffffe061;
    y_21[1]._2_1_ = in_stack_ffffffffffffe062;
    y_21[1]._3_1_ = in_stack_ffffffffffffe063;
    y_21[1]._4_1_ = in_stack_ffffffffffffe064;
    y_21[1]._5_1_ = in_stack_ffffffffffffe065;
    y_21[1]._6_1_ = in_stack_ffffffffffffe066;
    y_21[1]._7_1_ = in_stack_ffffffffffffe067;
    y_21[2]._0_1_ = in_stack_ffffffffffffe068;
    y_21[2]._1_1_ = in_stack_ffffffffffffe069;
    y_21[2]._2_1_ = in_stack_ffffffffffffe06a;
    y_21[2]._3_1_ = in_stack_ffffffffffffe06b;
    y_21[2]._4_1_ = in_stack_ffffffffffffe06c;
    y_21[2]._5_1_ = in_stack_ffffffffffffe06d;
    y_21[2]._6_1_ = in_stack_ffffffffffffe06e;
    y_21[2]._7_1_ = in_stack_ffffffffffffe06f;
    y_21[3]._0_1_ = in_stack_ffffffffffffe070;
    y_21[3]._1_1_ = in_stack_ffffffffffffe071;
    y_21[3]._2_1_ = in_stack_ffffffffffffe072;
    y_21[3]._3_1_ = in_stack_ffffffffffffe073;
    y_21[3]._4_1_ = in_stack_ffffffffffffe074;
    y_21[3]._5_1_ = in_stack_ffffffffffffe075;
    y_21[3]._6_1_ = in_stack_ffffffffffffe076;
    y_21[3]._7_1_ = in_stack_ffffffffffffe077;
    local_1a0 = auVar41;
    local_da0 = auVar41._0_16_;
    auStack_d90 = auVar41._16_16_;
    f(x_21,y_21);
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 + 0x10) * 0x20);
    *puVar27 = uVar35;
    puVar27[1] = uVar44;
    puVar27[2] = uVar45;
    puVar27[3] = uVar46;
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 + 0x14) * 0x20);
    uVar35 = *puVar27;
    uVar44 = puVar27[1];
    uVar45 = puVar27[2];
    uVar46 = puVar27[3];
    x_22[0]._1_1_ = in_stack_ffffffffffffe079;
    x_22[0]._0_1_ = in_stack_ffffffffffffe078;
    x_22[0]._2_1_ = in_stack_ffffffffffffe07a;
    x_22[0]._3_1_ = in_stack_ffffffffffffe07b;
    x_22[0]._4_1_ = in_stack_ffffffffffffe07c;
    x_22[0]._5_1_ = in_stack_ffffffffffffe07d;
    x_22[0]._6_1_ = in_stack_ffffffffffffe07e;
    x_22[0]._7_1_ = in_stack_ffffffffffffe07f;
    x_22[1]._0_1_ = in_stack_ffffffffffffe080;
    x_22[1]._1_1_ = in_stack_ffffffffffffe081;
    x_22[1]._2_1_ = in_stack_ffffffffffffe082;
    x_22[1]._3_1_ = in_stack_ffffffffffffe083;
    x_22[1]._4_1_ = in_stack_ffffffffffffe084;
    x_22[1]._5_1_ = in_stack_ffffffffffffe085;
    x_22[1]._6_1_ = in_stack_ffffffffffffe086;
    x_22[1]._7_1_ = in_stack_ffffffffffffe087;
    x_22[2]._0_1_ = in_stack_ffffffffffffe088;
    x_22[2]._1_1_ = in_stack_ffffffffffffe089;
    x_22[2]._2_1_ = in_stack_ffffffffffffe08a;
    x_22[2]._3_1_ = in_stack_ffffffffffffe08b;
    x_22[2]._4_1_ = in_stack_ffffffffffffe08c;
    x_22[2]._5_1_ = in_stack_ffffffffffffe08d;
    x_22[2]._6_1_ = in_stack_ffffffffffffe08e;
    x_22[2]._7_1_ = in_stack_ffffffffffffe08f;
    x_22[3]._0_1_ = in_stack_ffffffffffffe090;
    x_22[3]._1_1_ = in_stack_ffffffffffffe091;
    x_22[3]._2_1_ = in_stack_ffffffffffffe092;
    x_22[3]._3_1_ = in_stack_ffffffffffffe093;
    x_22[3]._4_1_ = in_stack_ffffffffffffe094;
    x_22[3]._5_1_ = in_stack_ffffffffffffe095;
    x_22[3]._6_1_ = in_stack_ffffffffffffe096;
    x_22[3]._7_1_ = in_stack_ffffffffffffe097;
    y_22[0]._1_1_ = in_stack_ffffffffffffe059;
    y_22[0]._0_1_ = in_stack_ffffffffffffe058;
    y_22[0]._2_1_ = in_stack_ffffffffffffe05a;
    y_22[0]._3_1_ = in_stack_ffffffffffffe05b;
    y_22[0]._4_1_ = in_stack_ffffffffffffe05c;
    y_22[0]._5_1_ = in_stack_ffffffffffffe05d;
    y_22[0]._6_1_ = in_stack_ffffffffffffe05e;
    y_22[0]._7_1_ = in_stack_ffffffffffffe05f;
    y_22[1]._0_1_ = in_stack_ffffffffffffe060;
    y_22[1]._1_1_ = in_stack_ffffffffffffe061;
    y_22[1]._2_1_ = in_stack_ffffffffffffe062;
    y_22[1]._3_1_ = in_stack_ffffffffffffe063;
    y_22[1]._4_1_ = in_stack_ffffffffffffe064;
    y_22[1]._5_1_ = in_stack_ffffffffffffe065;
    y_22[1]._6_1_ = in_stack_ffffffffffffe066;
    y_22[1]._7_1_ = in_stack_ffffffffffffe067;
    y_22[2]._0_1_ = in_stack_ffffffffffffe068;
    y_22[2]._1_1_ = in_stack_ffffffffffffe069;
    y_22[2]._2_1_ = in_stack_ffffffffffffe06a;
    y_22[2]._3_1_ = in_stack_ffffffffffffe06b;
    y_22[2]._4_1_ = in_stack_ffffffffffffe06c;
    y_22[2]._5_1_ = in_stack_ffffffffffffe06d;
    y_22[2]._6_1_ = in_stack_ffffffffffffe06e;
    y_22[2]._7_1_ = in_stack_ffffffffffffe06f;
    y_22[3]._0_1_ = in_stack_ffffffffffffe070;
    y_22[3]._1_1_ = in_stack_ffffffffffffe071;
    y_22[3]._2_1_ = in_stack_ffffffffffffe072;
    y_22[3]._3_1_ = in_stack_ffffffffffffe073;
    y_22[3]._4_1_ = in_stack_ffffffffffffe074;
    y_22[3]._5_1_ = in_stack_ffffffffffffe075;
    y_22[3]._6_1_ = in_stack_ffffffffffffe076;
    y_22[3]._7_1_ = in_stack_ffffffffffffe077;
    f(x_22,y_22);
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 + 0x14) * 0x20);
    *puVar27 = uVar35;
    puVar27[1] = uVar44;
    puVar27[2] = uVar45;
    puVar27[3] = uVar46;
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 8) * 0x20);
    local_1620 = *puVar26;
    uStack_1618 = puVar26[1];
    uStack_1610 = puVar26[2];
    uStack_1608 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 0x10) * 0x20);
    local_1640 = *puVar26;
    uStack_1638 = puVar26[1];
    uStack_1630 = puVar26[2];
    uStack_1628 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 8) * 0x20);
    *puVar26 = local_1620 ^ local_1640;
    puVar26[1] = uStack_1618 ^ uStack_1638;
    puVar26[2] = uStack_1610 ^ uStack_1630;
    puVar26[3] = uStack_1608 ^ uStack_1628;
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 0xc) * 0x20);
    local_1660 = *puVar26;
    uStack_1658 = puVar26[1];
    uStack_1650 = puVar26[2];
    uStack_1648 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 0x14) * 0x20);
    local_1680 = *puVar26;
    uStack_1678 = puVar26[1];
    uStack_1670 = puVar26[2];
    uStack_1668 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 0xc) * 0x20);
    *puVar26 = local_1660 ^ local_1680;
    puVar26[1] = uStack_1658 ^ uStack_1678;
    puVar26[2] = uStack_1650 ^ uStack_1670;
    puVar26[3] = uStack_1648 ^ uStack_1668;
    pauVar28 = (undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 8) * 0x20);
    local_7c0 = *(undefined8 *)*pauVar28;
    uStack_7b8 = *(undefined8 *)(*pauVar28 + 8);
    uStack_7b0 = *(undefined8 *)(*pauVar28 + 0x10);
    uStack_7a8 = *(undefined8 *)(*pauVar28 + 0x18);
    local_7c4 = 0x3f;
    local_16a0 = vpsrlq_avx2(*pauVar28,ZEXT416(0x3f));
    pauVar28 = (undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 8) * 0x20);
    local_5c0 = *(undefined8 *)*pauVar28;
    uStack_5b8 = *(undefined8 *)(*pauVar28 + 8);
    uStack_5b0 = *(undefined8 *)(*pauVar28 + 0x10);
    uStack_5a8 = *(undefined8 *)(*pauVar28 + 0x18);
    pauVar29 = (undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 8) * 0x20);
    local_5e0 = *(undefined8 *)*pauVar29;
    uStack_5d8 = *(undefined8 *)(*pauVar29 + 8);
    uStack_5d0 = *(undefined8 *)(*pauVar29 + 0x10);
    uStack_5c8 = *(undefined8 *)(*pauVar29 + 0x18);
    local_16c0 = vpaddq_avx2(*pauVar28,*pauVar29);
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 8) * 0x20);
    *puVar26 = local_16a0._0_8_ ^ local_16c0._0_8_;
    puVar26[1] = local_16a0._8_8_ ^ local_16c0._8_8_;
    puVar26[2] = local_16a0._16_8_ ^ local_16c0._16_8_;
    puVar26[3] = local_16a0._24_8_ ^ local_16c0._24_8_;
    pauVar28 = (undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0xc) * 0x20);
    local_800 = *(undefined8 *)*pauVar28;
    uStack_7f8 = *(undefined8 *)(*pauVar28 + 8);
    uStack_7f0 = *(undefined8 *)(*pauVar28 + 0x10);
    uStack_7e8 = *(undefined8 *)(*pauVar28 + 0x18);
    local_804 = 0x3f;
    local_16e0 = vpsrlq_avx2(*pauVar28,ZEXT416(0x3f));
    pauVar28 = (undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0xc) * 0x20);
    local_600 = *(undefined8 *)*pauVar28;
    uStack_5f8 = *(undefined8 *)(*pauVar28 + 8);
    uStack_5f0 = *(undefined8 *)(*pauVar28 + 0x10);
    uStack_5e8 = *(undefined8 *)(*pauVar28 + 0x18);
    pauVar29 = (undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0xc) * 0x20);
    local_620 = *(undefined8 *)*pauVar29;
    uStack_618 = *(undefined8 *)(*pauVar29 + 8);
    uStack_610 = *(undefined8 *)(*pauVar29 + 0x10);
    uStack_608 = *(undefined8 *)(*pauVar29 + 0x18);
    local_1700 = vpaddq_avx2(*pauVar28,*pauVar29);
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 0xc) * 0x20);
    *puVar26 = local_16e0._0_8_ ^ local_1700._0_8_;
    puVar26[1] = local_16e0._8_8_ ^ local_1700._8_8_;
    puVar26[2] = local_16e0._16_8_ ^ local_1700._16_8_;
    puVar26[3] = local_16e0._24_8_ ^ local_1700._24_8_;
    auVar4 = vpblendd_avx2(*(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 8) * 0x20),
                           *(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0xc) * 0x20),
                           0xcc);
    auVar5 = vpblendd_avx2(*(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0xc) * 0x20),
                           *(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 8) * 0x20),0xcc)
    ;
    auVar4 = vpshufd_avx2(auVar4,0x4e);
    *(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0xc) * 0x20) = auVar4;
    auVar4 = vpshufd_avx2(auVar5,0x4e);
    *(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 8) * 0x20) = auVar4;
    pauVar1 = (undefined1 (*) [24])(local_19c8 + (ulong)(local_1de4 + 0x10) * 0x20);
    auVar25 = *pauVar1;
    uVar35 = *(undefined8 *)pauVar1[1];
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 + 0x14) * 0x20);
    uVar44 = puVar27[1];
    uVar45 = puVar27[2];
    uVar46 = puVar27[3];
    puVar34 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 + 0x10) * 0x20);
    *puVar34 = *puVar27;
    puVar34[1] = uVar44;
    puVar34[2] = uVar45;
    puVar34[3] = uVar46;
    local_1e20 = auVar25._0_8_;
    uStack_1e18 = auVar25._8_8_;
    uStack_1e10 = auVar25._16_8_;
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 + 0x14) * 0x20);
    *puVar27 = local_1e20;
    puVar27[1] = uStack_1e18;
    puVar27[2] = uStack_1e10;
    puVar27[3] = uVar35;
    auVar4 = vpblendd_avx2(*(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0x18) * 0x20),
                           *(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0x1c) * 0x20),
                           0xcc);
    auVar5 = vpblendd_avx2(*(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0x1c) * 0x20),
                           *(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0x18) * 0x20),
                           0xcc);
    auVar4 = vpshufd_avx2(auVar4,0x4e);
    *(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0x18) * 0x20) = auVar4;
    auVar4 = vpshufd_avx2(auVar5,0x4e);
    *(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0x1c) * 0x20) = auVar4;
    puVar27 = (undefined8 *)(local_19c8 + (ulong)local_1de4 * 0x20);
    uVar35 = *puVar27;
    uVar44 = puVar27[1];
    uVar45 = puVar27[2];
    uVar46 = puVar27[3];
    x_23[0]._1_1_ = in_stack_ffffffffffffe079;
    x_23[0]._0_1_ = in_stack_ffffffffffffe078;
    x_23[0]._2_1_ = in_stack_ffffffffffffe07a;
    x_23[0]._3_1_ = in_stack_ffffffffffffe07b;
    x_23[0]._4_1_ = in_stack_ffffffffffffe07c;
    x_23[0]._5_1_ = in_stack_ffffffffffffe07d;
    x_23[0]._6_1_ = in_stack_ffffffffffffe07e;
    x_23[0]._7_1_ = in_stack_ffffffffffffe07f;
    x_23[1]._0_1_ = in_stack_ffffffffffffe080;
    x_23[1]._1_1_ = in_stack_ffffffffffffe081;
    x_23[1]._2_1_ = in_stack_ffffffffffffe082;
    x_23[1]._3_1_ = in_stack_ffffffffffffe083;
    x_23[1]._4_1_ = in_stack_ffffffffffffe084;
    x_23[1]._5_1_ = in_stack_ffffffffffffe085;
    x_23[1]._6_1_ = in_stack_ffffffffffffe086;
    x_23[1]._7_1_ = in_stack_ffffffffffffe087;
    x_23[2]._0_1_ = in_stack_ffffffffffffe088;
    x_23[2]._1_1_ = in_stack_ffffffffffffe089;
    x_23[2]._2_1_ = in_stack_ffffffffffffe08a;
    x_23[2]._3_1_ = in_stack_ffffffffffffe08b;
    x_23[2]._4_1_ = in_stack_ffffffffffffe08c;
    x_23[2]._5_1_ = in_stack_ffffffffffffe08d;
    x_23[2]._6_1_ = in_stack_ffffffffffffe08e;
    x_23[2]._7_1_ = in_stack_ffffffffffffe08f;
    x_23[3]._0_1_ = in_stack_ffffffffffffe090;
    x_23[3]._1_1_ = in_stack_ffffffffffffe091;
    x_23[3]._2_1_ = in_stack_ffffffffffffe092;
    x_23[3]._3_1_ = in_stack_ffffffffffffe093;
    x_23[3]._4_1_ = in_stack_ffffffffffffe094;
    x_23[3]._5_1_ = in_stack_ffffffffffffe095;
    x_23[3]._6_1_ = in_stack_ffffffffffffe096;
    x_23[3]._7_1_ = in_stack_ffffffffffffe097;
    y_23[0]._1_1_ = in_stack_ffffffffffffe059;
    y_23[0]._0_1_ = in_stack_ffffffffffffe058;
    y_23[0]._2_1_ = in_stack_ffffffffffffe05a;
    y_23[0]._3_1_ = in_stack_ffffffffffffe05b;
    y_23[0]._4_1_ = in_stack_ffffffffffffe05c;
    y_23[0]._5_1_ = in_stack_ffffffffffffe05d;
    y_23[0]._6_1_ = in_stack_ffffffffffffe05e;
    y_23[0]._7_1_ = in_stack_ffffffffffffe05f;
    y_23[1]._0_1_ = in_stack_ffffffffffffe060;
    y_23[1]._1_1_ = in_stack_ffffffffffffe061;
    y_23[1]._2_1_ = in_stack_ffffffffffffe062;
    y_23[1]._3_1_ = in_stack_ffffffffffffe063;
    y_23[1]._4_1_ = in_stack_ffffffffffffe064;
    y_23[1]._5_1_ = in_stack_ffffffffffffe065;
    y_23[1]._6_1_ = in_stack_ffffffffffffe066;
    y_23[1]._7_1_ = in_stack_ffffffffffffe067;
    y_23[2]._0_1_ = in_stack_ffffffffffffe068;
    y_23[2]._1_1_ = in_stack_ffffffffffffe069;
    y_23[2]._2_1_ = in_stack_ffffffffffffe06a;
    y_23[2]._3_1_ = in_stack_ffffffffffffe06b;
    y_23[2]._4_1_ = in_stack_ffffffffffffe06c;
    y_23[2]._5_1_ = in_stack_ffffffffffffe06d;
    y_23[2]._6_1_ = in_stack_ffffffffffffe06e;
    y_23[2]._7_1_ = in_stack_ffffffffffffe06f;
    y_23[3]._0_1_ = in_stack_ffffffffffffe070;
    y_23[3]._1_1_ = in_stack_ffffffffffffe071;
    y_23[3]._2_1_ = in_stack_ffffffffffffe072;
    y_23[3]._3_1_ = in_stack_ffffffffffffe073;
    y_23[3]._4_1_ = in_stack_ffffffffffffe074;
    y_23[3]._5_1_ = in_stack_ffffffffffffe075;
    y_23[3]._6_1_ = in_stack_ffffffffffffe076;
    y_23[3]._7_1_ = in_stack_ffffffffffffe077;
    f(x_23,y_23);
    puVar27 = (undefined8 *)(local_19c8 + (ulong)local_1de4 * 0x20);
    *puVar27 = uVar35;
    puVar27[1] = uVar44;
    puVar27[2] = uVar45;
    puVar27[3] = uVar46;
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 + 4) * 0x20);
    uVar35 = *puVar27;
    uVar44 = puVar27[1];
    uVar45 = puVar27[2];
    uVar46 = puVar27[3];
    x_24[0]._1_1_ = in_stack_ffffffffffffe079;
    x_24[0]._0_1_ = in_stack_ffffffffffffe078;
    x_24[0]._2_1_ = in_stack_ffffffffffffe07a;
    x_24[0]._3_1_ = in_stack_ffffffffffffe07b;
    x_24[0]._4_1_ = in_stack_ffffffffffffe07c;
    x_24[0]._5_1_ = in_stack_ffffffffffffe07d;
    x_24[0]._6_1_ = in_stack_ffffffffffffe07e;
    x_24[0]._7_1_ = in_stack_ffffffffffffe07f;
    x_24[1]._0_1_ = in_stack_ffffffffffffe080;
    x_24[1]._1_1_ = in_stack_ffffffffffffe081;
    x_24[1]._2_1_ = in_stack_ffffffffffffe082;
    x_24[1]._3_1_ = in_stack_ffffffffffffe083;
    x_24[1]._4_1_ = in_stack_ffffffffffffe084;
    x_24[1]._5_1_ = in_stack_ffffffffffffe085;
    x_24[1]._6_1_ = in_stack_ffffffffffffe086;
    x_24[1]._7_1_ = in_stack_ffffffffffffe087;
    x_24[2]._0_1_ = in_stack_ffffffffffffe088;
    x_24[2]._1_1_ = in_stack_ffffffffffffe089;
    x_24[2]._2_1_ = in_stack_ffffffffffffe08a;
    x_24[2]._3_1_ = in_stack_ffffffffffffe08b;
    x_24[2]._4_1_ = in_stack_ffffffffffffe08c;
    x_24[2]._5_1_ = in_stack_ffffffffffffe08d;
    x_24[2]._6_1_ = in_stack_ffffffffffffe08e;
    x_24[2]._7_1_ = in_stack_ffffffffffffe08f;
    x_24[3]._0_1_ = in_stack_ffffffffffffe090;
    x_24[3]._1_1_ = in_stack_ffffffffffffe091;
    x_24[3]._2_1_ = in_stack_ffffffffffffe092;
    x_24[3]._3_1_ = in_stack_ffffffffffffe093;
    x_24[3]._4_1_ = in_stack_ffffffffffffe094;
    x_24[3]._5_1_ = in_stack_ffffffffffffe095;
    x_24[3]._6_1_ = in_stack_ffffffffffffe096;
    x_24[3]._7_1_ = in_stack_ffffffffffffe097;
    y_24[0]._1_1_ = in_stack_ffffffffffffe059;
    y_24[0]._0_1_ = in_stack_ffffffffffffe058;
    y_24[0]._2_1_ = in_stack_ffffffffffffe05a;
    y_24[0]._3_1_ = in_stack_ffffffffffffe05b;
    y_24[0]._4_1_ = in_stack_ffffffffffffe05c;
    y_24[0]._5_1_ = in_stack_ffffffffffffe05d;
    y_24[0]._6_1_ = in_stack_ffffffffffffe05e;
    y_24[0]._7_1_ = in_stack_ffffffffffffe05f;
    y_24[1]._0_1_ = in_stack_ffffffffffffe060;
    y_24[1]._1_1_ = in_stack_ffffffffffffe061;
    y_24[1]._2_1_ = in_stack_ffffffffffffe062;
    y_24[1]._3_1_ = in_stack_ffffffffffffe063;
    y_24[1]._4_1_ = in_stack_ffffffffffffe064;
    y_24[1]._5_1_ = in_stack_ffffffffffffe065;
    y_24[1]._6_1_ = in_stack_ffffffffffffe066;
    y_24[1]._7_1_ = in_stack_ffffffffffffe067;
    y_24[2]._0_1_ = in_stack_ffffffffffffe068;
    y_24[2]._1_1_ = in_stack_ffffffffffffe069;
    y_24[2]._2_1_ = in_stack_ffffffffffffe06a;
    y_24[2]._3_1_ = in_stack_ffffffffffffe06b;
    y_24[2]._4_1_ = in_stack_ffffffffffffe06c;
    y_24[2]._5_1_ = in_stack_ffffffffffffe06d;
    y_24[2]._6_1_ = in_stack_ffffffffffffe06e;
    y_24[2]._7_1_ = in_stack_ffffffffffffe06f;
    y_24[3]._0_1_ = in_stack_ffffffffffffe070;
    y_24[3]._1_1_ = in_stack_ffffffffffffe071;
    y_24[3]._2_1_ = in_stack_ffffffffffffe072;
    y_24[3]._3_1_ = in_stack_ffffffffffffe073;
    y_24[3]._4_1_ = in_stack_ffffffffffffe074;
    y_24[3]._5_1_ = in_stack_ffffffffffffe075;
    y_24[3]._6_1_ = in_stack_ffffffffffffe076;
    y_24[3]._7_1_ = in_stack_ffffffffffffe077;
    f(x_24,y_24);
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 + 4) * 0x20);
    *puVar27 = uVar35;
    puVar27[1] = uVar44;
    puVar27[2] = uVar45;
    puVar27[3] = uVar46;
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 0x18) * 0x20);
    local_1720 = *puVar26;
    uStack_1718 = puVar26[1];
    uStack_1710 = puVar26[2];
    uStack_1708 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)local_1de4 * 0x20);
    local_1740 = *puVar26;
    uStack_1738 = puVar26[1];
    uStack_1730 = puVar26[2];
    uStack_1728 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 0x18) * 0x20);
    *puVar26 = local_1720 ^ local_1740;
    puVar26[1] = uStack_1718 ^ uStack_1738;
    puVar26[2] = uStack_1710 ^ uStack_1730;
    puVar26[3] = uStack_1708 ^ uStack_1728;
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 0x1c) * 0x20);
    local_1760 = *puVar26;
    uStack_1758 = puVar26[1];
    uStack_1750 = puVar26[2];
    uStack_1748 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 4) * 0x20);
    local_1780 = *puVar26;
    uStack_1778 = puVar26[1];
    uStack_1770 = puVar26[2];
    uStack_1768 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 0x1c) * 0x20);
    *puVar26 = local_1760 ^ local_1780;
    puVar26[1] = uStack_1758 ^ uStack_1778;
    puVar26[2] = uStack_1750 ^ uStack_1770;
    puVar26[3] = uStack_1748 ^ uStack_1768;
    lVar32 = (ulong)(local_1de4 + 0x18) * 0x20;
    auVar4 = vpshufd_avx2(*(undefined1 (*) [32])(local_19c8 + lVar32),0xb1);
    *(undefined1 (*) [32])(local_19c8 + lVar32) = auVar4;
    lVar32 = (ulong)(local_1de4 + 0x1c) * 0x20;
    auVar4 = vpshufd_avx2(*(undefined1 (*) [32])(local_19c8 + lVar32),0xb1);
    *(undefined1 (*) [32])(local_19c8 + lVar32) = auVar4;
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 + 0x10) * 0x20);
    uVar35 = *puVar27;
    uVar44 = puVar27[1];
    uVar45 = puVar27[2];
    uVar46 = puVar27[3];
    x_25[0]._1_1_ = in_stack_ffffffffffffe079;
    x_25[0]._0_1_ = in_stack_ffffffffffffe078;
    x_25[0]._2_1_ = in_stack_ffffffffffffe07a;
    x_25[0]._3_1_ = in_stack_ffffffffffffe07b;
    x_25[0]._4_1_ = in_stack_ffffffffffffe07c;
    x_25[0]._5_1_ = in_stack_ffffffffffffe07d;
    x_25[0]._6_1_ = in_stack_ffffffffffffe07e;
    x_25[0]._7_1_ = in_stack_ffffffffffffe07f;
    x_25[1]._0_1_ = in_stack_ffffffffffffe080;
    x_25[1]._1_1_ = in_stack_ffffffffffffe081;
    x_25[1]._2_1_ = in_stack_ffffffffffffe082;
    x_25[1]._3_1_ = in_stack_ffffffffffffe083;
    x_25[1]._4_1_ = in_stack_ffffffffffffe084;
    x_25[1]._5_1_ = in_stack_ffffffffffffe085;
    x_25[1]._6_1_ = in_stack_ffffffffffffe086;
    x_25[1]._7_1_ = in_stack_ffffffffffffe087;
    x_25[2]._0_1_ = in_stack_ffffffffffffe088;
    x_25[2]._1_1_ = in_stack_ffffffffffffe089;
    x_25[2]._2_1_ = in_stack_ffffffffffffe08a;
    x_25[2]._3_1_ = in_stack_ffffffffffffe08b;
    x_25[2]._4_1_ = in_stack_ffffffffffffe08c;
    x_25[2]._5_1_ = in_stack_ffffffffffffe08d;
    x_25[2]._6_1_ = in_stack_ffffffffffffe08e;
    x_25[2]._7_1_ = in_stack_ffffffffffffe08f;
    x_25[3]._0_1_ = in_stack_ffffffffffffe090;
    x_25[3]._1_1_ = in_stack_ffffffffffffe091;
    x_25[3]._2_1_ = in_stack_ffffffffffffe092;
    x_25[3]._3_1_ = in_stack_ffffffffffffe093;
    x_25[3]._4_1_ = in_stack_ffffffffffffe094;
    x_25[3]._5_1_ = in_stack_ffffffffffffe095;
    x_25[3]._6_1_ = in_stack_ffffffffffffe096;
    x_25[3]._7_1_ = in_stack_ffffffffffffe097;
    y_25[0]._1_1_ = in_stack_ffffffffffffe059;
    y_25[0]._0_1_ = in_stack_ffffffffffffe058;
    y_25[0]._2_1_ = in_stack_ffffffffffffe05a;
    y_25[0]._3_1_ = in_stack_ffffffffffffe05b;
    y_25[0]._4_1_ = in_stack_ffffffffffffe05c;
    y_25[0]._5_1_ = in_stack_ffffffffffffe05d;
    y_25[0]._6_1_ = in_stack_ffffffffffffe05e;
    y_25[0]._7_1_ = in_stack_ffffffffffffe05f;
    y_25[1]._0_1_ = in_stack_ffffffffffffe060;
    y_25[1]._1_1_ = in_stack_ffffffffffffe061;
    y_25[1]._2_1_ = in_stack_ffffffffffffe062;
    y_25[1]._3_1_ = in_stack_ffffffffffffe063;
    y_25[1]._4_1_ = in_stack_ffffffffffffe064;
    y_25[1]._5_1_ = in_stack_ffffffffffffe065;
    y_25[1]._6_1_ = in_stack_ffffffffffffe066;
    y_25[1]._7_1_ = in_stack_ffffffffffffe067;
    y_25[2]._0_1_ = in_stack_ffffffffffffe068;
    y_25[2]._1_1_ = in_stack_ffffffffffffe069;
    y_25[2]._2_1_ = in_stack_ffffffffffffe06a;
    y_25[2]._3_1_ = in_stack_ffffffffffffe06b;
    y_25[2]._4_1_ = in_stack_ffffffffffffe06c;
    y_25[2]._5_1_ = in_stack_ffffffffffffe06d;
    y_25[2]._6_1_ = in_stack_ffffffffffffe06e;
    y_25[2]._7_1_ = in_stack_ffffffffffffe06f;
    y_25[3]._0_1_ = in_stack_ffffffffffffe070;
    y_25[3]._1_1_ = in_stack_ffffffffffffe071;
    y_25[3]._2_1_ = in_stack_ffffffffffffe072;
    y_25[3]._3_1_ = in_stack_ffffffffffffe073;
    y_25[3]._4_1_ = in_stack_ffffffffffffe074;
    y_25[3]._5_1_ = in_stack_ffffffffffffe075;
    y_25[3]._6_1_ = in_stack_ffffffffffffe076;
    y_25[3]._7_1_ = in_stack_ffffffffffffe077;
    f(x_25,y_25);
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 + 0x10) * 0x20);
    *puVar27 = uVar35;
    puVar27[1] = uVar44;
    puVar27[2] = uVar45;
    puVar27[3] = uVar46;
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 + 0x14) * 0x20);
    uVar35 = *puVar27;
    uVar44 = puVar27[1];
    uVar45 = puVar27[2];
    uVar46 = puVar27[3];
    x_26[0]._1_1_ = in_stack_ffffffffffffe079;
    x_26[0]._0_1_ = in_stack_ffffffffffffe078;
    x_26[0]._2_1_ = in_stack_ffffffffffffe07a;
    x_26[0]._3_1_ = in_stack_ffffffffffffe07b;
    x_26[0]._4_1_ = in_stack_ffffffffffffe07c;
    x_26[0]._5_1_ = in_stack_ffffffffffffe07d;
    x_26[0]._6_1_ = in_stack_ffffffffffffe07e;
    x_26[0]._7_1_ = in_stack_ffffffffffffe07f;
    x_26[1]._0_1_ = in_stack_ffffffffffffe080;
    x_26[1]._1_1_ = in_stack_ffffffffffffe081;
    x_26[1]._2_1_ = in_stack_ffffffffffffe082;
    x_26[1]._3_1_ = in_stack_ffffffffffffe083;
    x_26[1]._4_1_ = in_stack_ffffffffffffe084;
    x_26[1]._5_1_ = in_stack_ffffffffffffe085;
    x_26[1]._6_1_ = in_stack_ffffffffffffe086;
    x_26[1]._7_1_ = in_stack_ffffffffffffe087;
    x_26[2]._0_1_ = in_stack_ffffffffffffe088;
    x_26[2]._1_1_ = in_stack_ffffffffffffe089;
    x_26[2]._2_1_ = in_stack_ffffffffffffe08a;
    x_26[2]._3_1_ = in_stack_ffffffffffffe08b;
    x_26[2]._4_1_ = in_stack_ffffffffffffe08c;
    x_26[2]._5_1_ = in_stack_ffffffffffffe08d;
    x_26[2]._6_1_ = in_stack_ffffffffffffe08e;
    x_26[2]._7_1_ = in_stack_ffffffffffffe08f;
    x_26[3]._0_1_ = in_stack_ffffffffffffe090;
    x_26[3]._1_1_ = in_stack_ffffffffffffe091;
    x_26[3]._2_1_ = in_stack_ffffffffffffe092;
    x_26[3]._3_1_ = in_stack_ffffffffffffe093;
    x_26[3]._4_1_ = in_stack_ffffffffffffe094;
    x_26[3]._5_1_ = in_stack_ffffffffffffe095;
    x_26[3]._6_1_ = in_stack_ffffffffffffe096;
    x_26[3]._7_1_ = in_stack_ffffffffffffe097;
    y_26[0]._1_1_ = in_stack_ffffffffffffe059;
    y_26[0]._0_1_ = in_stack_ffffffffffffe058;
    y_26[0]._2_1_ = in_stack_ffffffffffffe05a;
    y_26[0]._3_1_ = in_stack_ffffffffffffe05b;
    y_26[0]._4_1_ = in_stack_ffffffffffffe05c;
    y_26[0]._5_1_ = in_stack_ffffffffffffe05d;
    y_26[0]._6_1_ = in_stack_ffffffffffffe05e;
    y_26[0]._7_1_ = in_stack_ffffffffffffe05f;
    y_26[1]._0_1_ = in_stack_ffffffffffffe060;
    y_26[1]._1_1_ = in_stack_ffffffffffffe061;
    y_26[1]._2_1_ = in_stack_ffffffffffffe062;
    y_26[1]._3_1_ = in_stack_ffffffffffffe063;
    y_26[1]._4_1_ = in_stack_ffffffffffffe064;
    y_26[1]._5_1_ = in_stack_ffffffffffffe065;
    y_26[1]._6_1_ = in_stack_ffffffffffffe066;
    y_26[1]._7_1_ = in_stack_ffffffffffffe067;
    y_26[2]._0_1_ = in_stack_ffffffffffffe068;
    y_26[2]._1_1_ = in_stack_ffffffffffffe069;
    y_26[2]._2_1_ = in_stack_ffffffffffffe06a;
    y_26[2]._3_1_ = in_stack_ffffffffffffe06b;
    y_26[2]._4_1_ = in_stack_ffffffffffffe06c;
    y_26[2]._5_1_ = in_stack_ffffffffffffe06d;
    y_26[2]._6_1_ = in_stack_ffffffffffffe06e;
    y_26[2]._7_1_ = in_stack_ffffffffffffe06f;
    y_26[3]._0_1_ = in_stack_ffffffffffffe070;
    y_26[3]._1_1_ = in_stack_ffffffffffffe071;
    y_26[3]._2_1_ = in_stack_ffffffffffffe072;
    y_26[3]._3_1_ = in_stack_ffffffffffffe073;
    y_26[3]._4_1_ = in_stack_ffffffffffffe074;
    y_26[3]._5_1_ = in_stack_ffffffffffffe075;
    y_26[3]._6_1_ = in_stack_ffffffffffffe076;
    y_26[3]._7_1_ = in_stack_ffffffffffffe077;
    f(x_26,y_26);
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 + 0x14) * 0x20);
    *puVar27 = uVar35;
    puVar27[1] = uVar44;
    puVar27[2] = uVar45;
    puVar27[3] = uVar46;
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 8) * 0x20);
    local_17a0 = *puVar26;
    uStack_1798 = puVar26[1];
    uStack_1790 = puVar26[2];
    uStack_1788 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 0x10) * 0x20);
    local_17c0 = *puVar26;
    uStack_17b8 = puVar26[1];
    uStack_17b0 = puVar26[2];
    uStack_17a8 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 8) * 0x20);
    *puVar26 = local_17a0 ^ local_17c0;
    puVar26[1] = uStack_1798 ^ uStack_17b8;
    puVar26[2] = uStack_1790 ^ uStack_17b0;
    puVar26[3] = uStack_1788 ^ uStack_17a8;
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 0xc) * 0x20);
    local_17e0 = *puVar26;
    uStack_17d8 = puVar26[1];
    uStack_17d0 = puVar26[2];
    uStack_17c8 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 0x14) * 0x20);
    local_1800 = *puVar26;
    uStack_17f8 = puVar26[1];
    uStack_17f0 = puVar26[2];
    uStack_17e8 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 0xc) * 0x20);
    *puVar26 = local_17e0 ^ local_1800;
    puVar26[1] = uStack_17d8 ^ uStack_17f8;
    puVar26[2] = uStack_17d0 ^ uStack_17f0;
    puVar26[3] = uStack_17c8 ^ uStack_17e8;
    pauVar28 = (undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 8) * 0x20);
    local_dc0 = *(undefined8 *)*pauVar28;
    uStack_db8 = *(undefined8 *)(*pauVar28 + 8);
    uStack_db0 = *(undefined8 *)(*pauVar28 + 0x10);
    uStack_da8 = *(undefined8 *)(*pauVar28 + 0x18);
    local_a05 = 3;
    local_a06 = 4;
    local_a07 = 5;
    local_a08 = 6;
    local_a09 = 7;
    local_a0a = 0;
    local_a0b = 1;
    local_a0c = 2;
    local_a0d = 0xb;
    local_a0e = 0xc;
    local_a0f = 0xd;
    local_a10 = 0xe;
    local_a11 = 0xf;
    local_a12 = 8;
    local_a13 = 9;
    local_a14 = 10;
    local_a15 = 0x13;
    local_a16 = 0x14;
    local_a17 = 0x15;
    local_a18 = 0x16;
    local_a19 = 0x17;
    local_a1a = 0x10;
    local_a1b = 0x11;
    local_a1c = 0x12;
    local_a1d = 0x1b;
    local_a1e = 0x1c;
    local_a1f = 0x1d;
    local_a20 = 0x1e;
    local_a21 = 0x1f;
    local_a22 = 0x18;
    local_a23 = 0x19;
    local_a24 = 0x1a;
    in_stack_ffffffffffffe076 = 0x1a;
    in_stack_ffffffffffffe077 = 0x19;
    in_stack_ffffffffffffe078 = 0x18;
    in_stack_ffffffffffffe079 = 0x1f;
    in_stack_ffffffffffffe07a = 0x1e;
    in_stack_ffffffffffffe07b = 0x1d;
    in_stack_ffffffffffffe07c = 0x1c;
    in_stack_ffffffffffffe07d = 0x1b;
    in_stack_ffffffffffffe07e = 0x12;
    in_stack_ffffffffffffe07f = 0x11;
    in_stack_ffffffffffffe080 = 0x10;
    in_stack_ffffffffffffe081 = 0x17;
    in_stack_ffffffffffffe082 = 0x16;
    in_stack_ffffffffffffe083 = 0x15;
    in_stack_ffffffffffffe084 = 0x14;
    in_stack_ffffffffffffe085 = 0x13;
    in_stack_ffffffffffffe086 = 10;
    in_stack_ffffffffffffe087 = 9;
    in_stack_ffffffffffffe088 = 3;
    local_121 = 0x1a;
    local_122 = 0x19;
    local_123 = 0x18;
    local_124 = 0x1f;
    local_125 = 0x1e;
    local_126 = 0x1d;
    local_127 = 0x1c;
    local_128 = 0x1b;
    local_129 = 0x12;
    local_12a = 0x11;
    local_12b = 0x10;
    local_12c = 0x17;
    local_12d = 0x16;
    local_12e = 0x15;
    local_12f = 0x14;
    local_130 = 0x13;
    local_131 = 10;
    local_132 = 9;
    local_133 = 8;
    local_134 = 0xf;
    local_135 = 0xe;
    local_136 = 0xd;
    local_137 = 0xc;
    local_138 = 0xb;
    local_139 = 2;
    local_13a = 1;
    local_13b = 0;
    local_13c = 7;
    local_13d = 6;
    local_13e = 5;
    local_13f = 4;
    local_140 = 3;
    auVar2 = vpinsrb_avx(ZEXT116(3),4,1);
    auVar2 = vpinsrb_avx(auVar2,5,2);
    auVar2 = vpinsrb_avx(auVar2,6,3);
    auVar2 = vpinsrb_avx(auVar2,7,4);
    auVar2 = vpinsrb_avx(auVar2,0,5);
    auVar2 = vpinsrb_avx(auVar2,1,6);
    auVar2 = vpinsrb_avx(auVar2,2,7);
    auVar2 = vpinsrb_avx(auVar2,0xb,8);
    auVar2 = vpinsrb_avx(auVar2,0xc,9);
    auVar2 = vpinsrb_avx(auVar2,0xd,10);
    auVar2 = vpinsrb_avx(auVar2,0xe,0xb);
    auVar2 = vpinsrb_avx(auVar2,0xf,0xc);
    auVar2 = vpinsrb_avx(auVar2,8,0xd);
    auVar2 = vpinsrb_avx(auVar2,9,0xe);
    local_160 = vpinsrb_avx(auVar2,10,0xf);
    auVar2 = vpinsrb_avx(ZEXT116(0x13),0x14,1);
    auVar2 = vpinsrb_avx(auVar2,0x15,2);
    auVar2 = vpinsrb_avx(auVar2,0x16,3);
    auVar2 = vpinsrb_avx(auVar2,0x17,4);
    auVar2 = vpinsrb_avx(auVar2,0x10,5);
    auVar2 = vpinsrb_avx(auVar2,0x11,6);
    auVar2 = vpinsrb_avx(auVar2,0x12,7);
    auVar2 = vpinsrb_avx(auVar2,0x1b,8);
    auVar2 = vpinsrb_avx(auVar2,0x1c,9);
    auVar2 = vpinsrb_avx(auVar2,0x1d,10);
    auVar2 = vpinsrb_avx(auVar2,0x1e,0xb);
    auVar2 = vpinsrb_avx(auVar2,0x1f,0xc);
    auVar2 = vpinsrb_avx(auVar2,0x18,0xd);
    auVar2 = vpinsrb_avx(auVar2,0x19,0xe);
    auStack_150 = vpinsrb_avx(auVar2,0x1a,0xf);
    local_de0 = local_160._0_8_;
    uStack_dd8 = local_160._8_8_;
    uStack_dd0 = auStack_150._0_8_;
    uStack_dc8 = auStack_150._8_8_;
    auVar14._16_8_ = auStack_150._0_8_;
    auVar14._0_16_ = local_160;
    auVar14._24_8_ = auStack_150._8_8_;
    auVar4 = vpshufb_avx2(*pauVar28,auVar14);
    *(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 8) * 0x20) = auVar4;
    pauVar28 = (undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0xc) * 0x20);
    local_e00 = *(undefined8 *)*pauVar28;
    uStack_df8 = *(undefined8 *)(*pauVar28 + 8);
    uStack_df0 = *(undefined8 *)(*pauVar28 + 0x10);
    uStack_de8 = *(undefined8 *)(*pauVar28 + 0x18);
    local_a25 = 3;
    local_a26 = 4;
    local_a27 = 5;
    local_a28 = 6;
    local_a29 = 7;
    local_a2a = 0;
    local_a2b = 1;
    local_a2c = 2;
    local_a2d = 0xb;
    local_a2e = 0xc;
    local_a2f = 0xd;
    local_a30 = 0xe;
    local_a31 = 0xf;
    local_a32 = 8;
    local_a33 = 9;
    local_a34 = 10;
    local_a35 = 0x13;
    local_a36 = 0x14;
    local_a37 = 0x15;
    local_a38 = 0x16;
    local_a39 = 0x17;
    local_a3a = 0x10;
    local_a3b = 0x11;
    local_a3c = 0x12;
    local_a3d = 0x1b;
    local_a3e = 0x1c;
    local_a3f = 0x1d;
    local_a40 = 0x1e;
    local_a41 = 0x1f;
    local_a42 = 0x18;
    local_a43 = 0x19;
    local_a44 = 0x1a;
    in_stack_ffffffffffffe089 = 0x1a;
    in_stack_ffffffffffffe08a = 0x19;
    in_stack_ffffffffffffe08b = 0x18;
    in_stack_ffffffffffffe08c = 0x1f;
    in_stack_ffffffffffffe08d = 0x1e;
    in_stack_ffffffffffffe08e = 0x1d;
    in_stack_ffffffffffffe08f = 0x1c;
    in_stack_ffffffffffffe090 = 0x1b;
    in_stack_ffffffffffffe091 = 0x12;
    in_stack_ffffffffffffe092 = 0x11;
    in_stack_ffffffffffffe093 = 0x10;
    in_stack_ffffffffffffe094 = 0x17;
    in_stack_ffffffffffffe095 = 0x16;
    in_stack_ffffffffffffe096 = 0x15;
    in_stack_ffffffffffffe097 = 0x14;
    local_e1 = 0x1a;
    local_e2 = 0x19;
    local_e3 = 0x18;
    local_e4 = 0x1f;
    local_e5 = 0x1e;
    local_e6 = 0x1d;
    local_e7 = 0x1c;
    local_e8 = 0x1b;
    local_e9 = 0x12;
    local_ea = 0x11;
    local_eb = 0x10;
    local_ec = 0x17;
    local_ed = 0x16;
    local_ee = 0x15;
    local_ef = 0x14;
    local_f0 = 0x13;
    local_f1 = 10;
    local_f2 = 9;
    local_f3 = 8;
    local_f4 = 0xf;
    local_f5 = 0xe;
    local_f6 = 0xd;
    local_f7 = 0xc;
    local_f8 = 0xb;
    local_f9 = 2;
    local_fa = 1;
    local_fb = 0;
    local_fc = 7;
    local_fd = 6;
    local_fe = 5;
    local_ff = 4;
    local_100 = 3;
    auVar2 = vpinsrb_avx(ZEXT116(0x13),0x14,1);
    auVar2 = vpinsrb_avx(auVar2,0x15,2);
    auVar2 = vpinsrb_avx(auVar2,0x16,3);
    auVar2 = vpinsrb_avx(auVar2,0x17,4);
    auVar2 = vpinsrb_avx(auVar2,0x10,5);
    auVar2 = vpinsrb_avx(auVar2,0x11,6);
    auVar2 = vpinsrb_avx(auVar2,0x12,7);
    auVar2 = vpinsrb_avx(auVar2,0x1b,8);
    auVar2 = vpinsrb_avx(auVar2,0x1c,9);
    auVar2 = vpinsrb_avx(auVar2,0x1d,10);
    auVar2 = vpinsrb_avx(auVar2,0x1e,0xb);
    auVar2 = vpinsrb_avx(auVar2,0x1f,0xc);
    auVar2 = vpinsrb_avx(auVar2,0x18,0xd);
    auVar2 = vpinsrb_avx(auVar2,0x19,0xe);
    auVar2 = vpinsrb_avx(auVar2,0x1a,0xf);
    auVar3 = vpinsrb_avx(ZEXT116(3),4,1);
    auVar3 = vpinsrb_avx(auVar3,5,2);
    auVar3 = vpinsrb_avx(auVar3,6,3);
    auVar3 = vpinsrb_avx(auVar3,7,4);
    auVar3 = vpinsrb_avx(auVar3,0,5);
    auVar3 = vpinsrb_avx(auVar3,1,6);
    auVar3 = vpinsrb_avx(auVar3,2,7);
    auVar3 = vpinsrb_avx(auVar3,0xb,8);
    auVar3 = vpinsrb_avx(auVar3,0xc,9);
    auVar3 = vpinsrb_avx(auVar3,0xd,10);
    auVar3 = vpinsrb_avx(auVar3,0xe,0xb);
    auVar3 = vpinsrb_avx(auVar3,0xf,0xc);
    auVar3 = vpinsrb_avx(auVar3,8,0xd);
    auVar3 = vpinsrb_avx(auVar3,9,0xe);
    auVar3 = vpinsrb_avx(auVar3,10,0xf);
    auVar42._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
    auVar42._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
    local_120._16_8_ = auVar42._16_8_;
    local_120._24_8_ = auVar42._24_8_;
    auVar13._16_8_ = local_120._16_8_;
    auVar13._0_16_ = auVar42._0_16_;
    auVar13._24_8_ = local_120._24_8_;
    auVar4 = vpshufb_avx2(*pauVar28,auVar13);
    *(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0xc) * 0x20) = auVar4;
    puVar27 = (undefined8 *)(local_19c8 + (ulong)local_1de4 * 0x20);
    uVar35 = *puVar27;
    uVar44 = puVar27[1];
    uVar45 = puVar27[2];
    uVar46 = puVar27[3];
    x_27[1]._0_1_ = 0x10;
    x_27[0] = 0x11121b1c1d1e1f18;
    x_27[1]._1_1_ = 0x17;
    x_27[1]._2_1_ = 0x16;
    x_27[1]._3_1_ = 0x15;
    x_27[1]._4_1_ = 0x14;
    x_27[1]._5_1_ = 0x13;
    x_27[1]._6_1_ = 10;
    x_27[1]._7_1_ = 9;
    x_27[2]._0_1_ = 3;
    x_27[2]._1_1_ = 0x1a;
    x_27[2]._2_1_ = 0x19;
    x_27[2]._3_1_ = 0x18;
    x_27[2]._4_1_ = 0x1f;
    x_27[2]._5_1_ = 0x1e;
    x_27[2]._6_1_ = 0x1d;
    x_27[2]._7_1_ = 0x1c;
    x_27[3]._0_1_ = 0x1b;
    x_27[3]._1_1_ = 0x12;
    x_27[3]._2_1_ = 0x11;
    x_27[3]._3_1_ = 0x10;
    x_27[3]._4_1_ = 0x17;
    x_27[3]._5_1_ = 0x16;
    x_27[3]._6_1_ = 0x15;
    x_27[3]._7_1_ = 0x14;
    y_27[0]._1_1_ = in_stack_ffffffffffffe059;
    y_27[0]._0_1_ = in_stack_ffffffffffffe058;
    y_27[0]._2_1_ = in_stack_ffffffffffffe05a;
    y_27[0]._3_1_ = in_stack_ffffffffffffe05b;
    y_27[0]._4_1_ = in_stack_ffffffffffffe05c;
    y_27[0]._5_1_ = in_stack_ffffffffffffe05d;
    y_27[0]._6_1_ = in_stack_ffffffffffffe05e;
    y_27[0]._7_1_ = in_stack_ffffffffffffe05f;
    y_27[1]._0_1_ = in_stack_ffffffffffffe060;
    y_27[1]._1_1_ = in_stack_ffffffffffffe061;
    y_27[1]._2_1_ = in_stack_ffffffffffffe062;
    y_27[1]._3_1_ = in_stack_ffffffffffffe063;
    y_27[1]._4_1_ = in_stack_ffffffffffffe064;
    y_27[1]._5_1_ = in_stack_ffffffffffffe065;
    y_27[1]._6_1_ = in_stack_ffffffffffffe066;
    y_27[1]._7_1_ = in_stack_ffffffffffffe067;
    y_27[2]._0_1_ = in_stack_ffffffffffffe068;
    y_27[2]._1_1_ = in_stack_ffffffffffffe069;
    y_27[2]._2_1_ = in_stack_ffffffffffffe06a;
    y_27[2]._3_1_ = in_stack_ffffffffffffe06b;
    y_27[2]._4_1_ = in_stack_ffffffffffffe06c;
    y_27[2]._5_1_ = in_stack_ffffffffffffe06d;
    y_27[2]._6_1_ = in_stack_ffffffffffffe06e;
    y_27[2]._7_1_ = in_stack_ffffffffffffe06f;
    y_27[3]._0_1_ = in_stack_ffffffffffffe070;
    y_27[3]._1_1_ = in_stack_ffffffffffffe071;
    y_27[3]._2_1_ = in_stack_ffffffffffffe072;
    y_27[3]._3_1_ = in_stack_ffffffffffffe073;
    y_27[3]._4_1_ = in_stack_ffffffffffffe074;
    y_27[3]._5_1_ = in_stack_ffffffffffffe075;
    y_27[3]._6_1_ = 0x1a;
    y_27[3]._7_1_ = 0x19;
    local_120 = auVar42;
    local_e20 = auVar42._0_16_;
    auStack_e10 = auVar42._16_16_;
    f(x_27,y_27);
    puVar27 = (undefined8 *)(local_19c8 + (ulong)local_1de4 * 0x20);
    *puVar27 = uVar35;
    puVar27[1] = uVar44;
    puVar27[2] = uVar45;
    puVar27[3] = uVar46;
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 + 4) * 0x20);
    uVar35 = *puVar27;
    uVar44 = puVar27[1];
    uVar45 = puVar27[2];
    uVar46 = puVar27[3];
    x_28[0]._1_1_ = in_stack_ffffffffffffe079;
    x_28[0]._0_1_ = in_stack_ffffffffffffe078;
    x_28[0]._2_1_ = in_stack_ffffffffffffe07a;
    x_28[0]._3_1_ = in_stack_ffffffffffffe07b;
    x_28[0]._4_1_ = in_stack_ffffffffffffe07c;
    x_28[0]._5_1_ = in_stack_ffffffffffffe07d;
    x_28[0]._6_1_ = in_stack_ffffffffffffe07e;
    x_28[0]._7_1_ = in_stack_ffffffffffffe07f;
    x_28[1]._0_1_ = in_stack_ffffffffffffe080;
    x_28[1]._1_1_ = in_stack_ffffffffffffe081;
    x_28[1]._2_1_ = in_stack_ffffffffffffe082;
    x_28[1]._3_1_ = in_stack_ffffffffffffe083;
    x_28[1]._4_1_ = in_stack_ffffffffffffe084;
    x_28[1]._5_1_ = in_stack_ffffffffffffe085;
    x_28[1]._6_1_ = in_stack_ffffffffffffe086;
    x_28[1]._7_1_ = in_stack_ffffffffffffe087;
    x_28[2]._0_1_ = in_stack_ffffffffffffe088;
    x_28[2]._1_1_ = in_stack_ffffffffffffe089;
    x_28[2]._2_1_ = in_stack_ffffffffffffe08a;
    x_28[2]._3_1_ = in_stack_ffffffffffffe08b;
    x_28[2]._4_1_ = in_stack_ffffffffffffe08c;
    x_28[2]._5_1_ = in_stack_ffffffffffffe08d;
    x_28[2]._6_1_ = in_stack_ffffffffffffe08e;
    x_28[2]._7_1_ = in_stack_ffffffffffffe08f;
    x_28[3]._0_1_ = in_stack_ffffffffffffe090;
    x_28[3]._1_1_ = in_stack_ffffffffffffe091;
    x_28[3]._2_1_ = in_stack_ffffffffffffe092;
    x_28[3]._3_1_ = in_stack_ffffffffffffe093;
    x_28[3]._4_1_ = in_stack_ffffffffffffe094;
    x_28[3]._5_1_ = in_stack_ffffffffffffe095;
    x_28[3]._6_1_ = in_stack_ffffffffffffe096;
    x_28[3]._7_1_ = in_stack_ffffffffffffe097;
    y_28[0]._1_1_ = in_stack_ffffffffffffe059;
    y_28[0]._0_1_ = in_stack_ffffffffffffe058;
    y_28[0]._2_1_ = in_stack_ffffffffffffe05a;
    y_28[0]._3_1_ = in_stack_ffffffffffffe05b;
    y_28[0]._4_1_ = in_stack_ffffffffffffe05c;
    y_28[0]._5_1_ = in_stack_ffffffffffffe05d;
    y_28[0]._6_1_ = in_stack_ffffffffffffe05e;
    y_28[0]._7_1_ = in_stack_ffffffffffffe05f;
    y_28[1]._0_1_ = in_stack_ffffffffffffe060;
    y_28[1]._1_1_ = in_stack_ffffffffffffe061;
    y_28[1]._2_1_ = in_stack_ffffffffffffe062;
    y_28[1]._3_1_ = in_stack_ffffffffffffe063;
    y_28[1]._4_1_ = in_stack_ffffffffffffe064;
    y_28[1]._5_1_ = in_stack_ffffffffffffe065;
    y_28[1]._6_1_ = in_stack_ffffffffffffe066;
    y_28[1]._7_1_ = in_stack_ffffffffffffe067;
    y_28[2]._0_1_ = in_stack_ffffffffffffe068;
    y_28[2]._1_1_ = in_stack_ffffffffffffe069;
    y_28[2]._2_1_ = in_stack_ffffffffffffe06a;
    y_28[2]._3_1_ = in_stack_ffffffffffffe06b;
    y_28[2]._4_1_ = in_stack_ffffffffffffe06c;
    y_28[2]._5_1_ = in_stack_ffffffffffffe06d;
    y_28[2]._6_1_ = in_stack_ffffffffffffe06e;
    y_28[2]._7_1_ = in_stack_ffffffffffffe06f;
    y_28[3]._0_1_ = in_stack_ffffffffffffe070;
    y_28[3]._1_1_ = in_stack_ffffffffffffe071;
    y_28[3]._2_1_ = in_stack_ffffffffffffe072;
    y_28[3]._3_1_ = in_stack_ffffffffffffe073;
    y_28[3]._4_1_ = in_stack_ffffffffffffe074;
    y_28[3]._5_1_ = in_stack_ffffffffffffe075;
    y_28[3]._6_1_ = in_stack_ffffffffffffe076;
    y_28[3]._7_1_ = in_stack_ffffffffffffe077;
    f(x_28,y_28);
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 + 4) * 0x20);
    *puVar27 = uVar35;
    puVar27[1] = uVar44;
    puVar27[2] = uVar45;
    puVar27[3] = uVar46;
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 0x18) * 0x20);
    local_1820 = *puVar26;
    uStack_1818 = puVar26[1];
    uStack_1810 = puVar26[2];
    uStack_1808 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)local_1de4 * 0x20);
    local_1840 = *puVar26;
    uStack_1838 = puVar26[1];
    uStack_1830 = puVar26[2];
    uStack_1828 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 0x18) * 0x20);
    *puVar26 = local_1820 ^ local_1840;
    puVar26[1] = uStack_1818 ^ uStack_1838;
    puVar26[2] = uStack_1810 ^ uStack_1830;
    puVar26[3] = uStack_1808 ^ uStack_1828;
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 0x1c) * 0x20);
    local_1860 = *puVar26;
    uStack_1858 = puVar26[1];
    uStack_1850 = puVar26[2];
    uStack_1848 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 4) * 0x20);
    local_1880 = *puVar26;
    uStack_1878 = puVar26[1];
    uStack_1870 = puVar26[2];
    uStack_1868 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 0x1c) * 0x20);
    *puVar26 = local_1860 ^ local_1880;
    puVar26[1] = uStack_1858 ^ uStack_1878;
    puVar26[2] = uStack_1850 ^ uStack_1870;
    puVar26[3] = uStack_1848 ^ uStack_1868;
    pauVar28 = (undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0x18) * 0x20);
    local_e40 = *(undefined8 *)*pauVar28;
    uStack_e38 = *(undefined8 *)(*pauVar28 + 8);
    uStack_e30 = *(undefined8 *)(*pauVar28 + 0x10);
    uStack_e28 = *(undefined8 *)(*pauVar28 + 0x18);
    local_a45 = 2;
    local_a46 = 3;
    local_a47 = 4;
    local_a48 = 5;
    local_a49 = 6;
    local_a4a = 7;
    local_a4b = 0;
    local_a4c = 1;
    local_a4d = 10;
    local_a4e = 0xb;
    local_a4f = 0xc;
    local_a50 = 0xd;
    local_a51 = 0xe;
    local_a52 = 0xf;
    local_a53 = 8;
    local_a54 = 9;
    local_a55 = 0x12;
    local_a56 = 0x13;
    local_a57 = 0x14;
    local_a58 = 0x15;
    local_a59 = 0x16;
    local_a5a = 0x17;
    local_a5b = 0x10;
    local_a5c = 0x11;
    local_a5d = 0x1a;
    local_a5e = 0x1b;
    local_a5f = 0x1c;
    local_a60 = 0x1d;
    local_a61 = 0x1e;
    local_a62 = 0x1f;
    local_a63 = 0x18;
    local_a64 = 0x19;
    in_stack_ffffffffffffe058 = 0x11;
    in_stack_ffffffffffffe059 = 0x10;
    in_stack_ffffffffffffe05a = 0x17;
    in_stack_ffffffffffffe05b = 0x16;
    in_stack_ffffffffffffe05c = 0x15;
    in_stack_ffffffffffffe05d = 0x14;
    in_stack_ffffffffffffe05e = 0x13;
    in_stack_ffffffffffffe05f = 0x12;
    in_stack_ffffffffffffe060 = 9;
    in_stack_ffffffffffffe061 = 8;
    in_stack_ffffffffffffe062 = 2;
    local_a1 = 0x19;
    local_a2 = 0x18;
    local_a3 = 0x1f;
    local_a4 = 0x1e;
    local_a5 = 0x1d;
    local_a6 = 0x1c;
    local_a7 = 0x1b;
    local_a8 = 0x1a;
    local_a9 = 0x11;
    local_aa = 0x10;
    local_ab = 0x17;
    local_ac = 0x16;
    local_ad = 0x15;
    local_ae = 0x14;
    local_af = 0x13;
    local_b0 = 0x12;
    local_b1 = 9;
    local_b2 = 8;
    local_b3 = 0xf;
    local_b4 = 0xe;
    local_b5 = 0xd;
    local_b6 = 0xc;
    local_b7 = 0xb;
    local_b8 = 10;
    local_b9 = 1;
    local_ba = 0;
    local_bb = 7;
    local_bc = 6;
    local_bd = 5;
    local_be = 4;
    local_bf = 3;
    local_c0 = 2;
    auVar2 = vpinsrb_avx(ZEXT116(2),3,1);
    auVar2 = vpinsrb_avx(auVar2,4,2);
    auVar2 = vpinsrb_avx(auVar2,5,3);
    auVar2 = vpinsrb_avx(auVar2,6,4);
    auVar2 = vpinsrb_avx(auVar2,7,5);
    auVar2 = vpinsrb_avx(auVar2,0,6);
    auVar2 = vpinsrb_avx(auVar2,1,7);
    auVar2 = vpinsrb_avx(auVar2,10,8);
    auVar2 = vpinsrb_avx(auVar2,0xb,9);
    auVar2 = vpinsrb_avx(auVar2,0xc,10);
    auVar2 = vpinsrb_avx(auVar2,0xd,0xb);
    auVar2 = vpinsrb_avx(auVar2,0xe,0xc);
    auVar2 = vpinsrb_avx(auVar2,0xf,0xd);
    auVar2 = vpinsrb_avx(auVar2,8,0xe);
    local_e0 = vpinsrb_avx(auVar2,9,0xf);
    auVar2 = vpinsrb_avx(ZEXT116(0x12),0x13,1);
    auVar2 = vpinsrb_avx(auVar2,0x14,2);
    auVar2 = vpinsrb_avx(auVar2,0x15,3);
    auVar2 = vpinsrb_avx(auVar2,0x16,4);
    auVar2 = vpinsrb_avx(auVar2,0x17,5);
    auVar2 = vpinsrb_avx(auVar2,0x10,6);
    auVar2 = vpinsrb_avx(auVar2,0x11,7);
    auVar2 = vpinsrb_avx(auVar2,0x1a,8);
    auVar2 = vpinsrb_avx(auVar2,0x1b,9);
    auVar2 = vpinsrb_avx(auVar2,0x1c,10);
    auVar2 = vpinsrb_avx(auVar2,0x1d,0xb);
    auVar2 = vpinsrb_avx(auVar2,0x1e,0xc);
    auVar2 = vpinsrb_avx(auVar2,0x1f,0xd);
    auVar2 = vpinsrb_avx(auVar2,0x18,0xe);
    auStack_d0 = vpinsrb_avx(auVar2,0x19,0xf);
    local_e60 = local_e0._0_8_;
    uStack_e58 = local_e0._8_8_;
    uStack_e50 = auStack_d0._0_8_;
    uStack_e48 = auStack_d0._8_8_;
    auVar12._16_8_ = auStack_d0._0_8_;
    auVar12._0_16_ = local_e0;
    auVar12._24_8_ = auStack_d0._8_8_;
    auVar4 = vpshufb_avx2(*pauVar28,auVar12);
    *(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0x18) * 0x20) = auVar4;
    pauVar28 = (undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0x1c) * 0x20);
    local_e80 = *(undefined8 *)*pauVar28;
    uStack_e78 = *(undefined8 *)(*pauVar28 + 8);
    uStack_e70 = *(undefined8 *)(*pauVar28 + 0x10);
    uStack_e68 = *(undefined8 *)(*pauVar28 + 0x18);
    local_a65 = 2;
    local_a66 = 3;
    local_a67 = 4;
    local_a68 = 5;
    local_a69 = 6;
    local_a6a = 7;
    local_a6b = 0;
    local_a6c = 1;
    local_a6d = 10;
    local_a6e = 0xb;
    local_a6f = 0xc;
    local_a70 = 0xd;
    local_a71 = 0xe;
    local_a72 = 0xf;
    local_a73 = 8;
    local_a74 = 9;
    local_a75 = 0x12;
    local_a76 = 0x13;
    local_a77 = 0x14;
    local_a78 = 0x15;
    local_a79 = 0x16;
    local_a7a = 0x17;
    local_a7b = 0x10;
    local_a7c = 0x11;
    local_a7d = 0x1a;
    local_a7e = 0x1b;
    local_a7f = 0x1c;
    local_a80 = 0x1d;
    local_a81 = 0x1e;
    local_a82 = 0x1f;
    local_a83 = 0x18;
    local_a84 = 0x19;
    in_stack_ffffffffffffe063 = 0x19;
    in_stack_ffffffffffffe064 = 0x18;
    in_stack_ffffffffffffe065 = 0x1f;
    in_stack_ffffffffffffe066 = 0x1e;
    in_stack_ffffffffffffe067 = 0x1d;
    in_stack_ffffffffffffe068 = 0x1c;
    in_stack_ffffffffffffe069 = 0x1b;
    in_stack_ffffffffffffe06a = 0x1a;
    in_stack_ffffffffffffe06b = 0x11;
    in_stack_ffffffffffffe06c = 0x10;
    in_stack_ffffffffffffe06d = 0x17;
    in_stack_ffffffffffffe06e = 0x16;
    in_stack_ffffffffffffe06f = 0x15;
    in_stack_ffffffffffffe070 = 0x14;
    in_stack_ffffffffffffe071 = 0x13;
    in_stack_ffffffffffffe072 = 0x12;
    in_stack_ffffffffffffe073 = 9;
    in_stack_ffffffffffffe074 = 8;
    in_stack_ffffffffffffe075 = 2;
    local_59 = 0x19;
    local_5a = 0x18;
    local_5b = 0x1f;
    local_5c = 0x1e;
    local_5d = 0x1d;
    local_5e = 0x1c;
    local_5f = 0x1b;
    local_60 = 0x1a;
    local_61 = 0x11;
    local_62 = 0x10;
    local_63 = 0x17;
    local_64 = 0x16;
    local_65 = 0x15;
    local_66 = 0x14;
    local_67 = 0x13;
    local_68 = 0x12;
    local_69 = 9;
    local_6a = 8;
    local_6b = 0xf;
    local_6c = 0xe;
    local_6d = 0xd;
    local_6e = 0xc;
    local_6f = 0xb;
    local_70 = 10;
    local_71 = 1;
    local_72 = 0;
    local_73 = 7;
    local_74 = 6;
    local_75 = 5;
    local_76 = 4;
    local_77 = 3;
    local_78 = 2;
    auVar2 = vpinsrb_avx(ZEXT116(0x12),0x13,1);
    auVar2 = vpinsrb_avx(auVar2,0x14,2);
    auVar2 = vpinsrb_avx(auVar2,0x15,3);
    auVar2 = vpinsrb_avx(auVar2,0x16,4);
    auVar2 = vpinsrb_avx(auVar2,0x17,5);
    auVar2 = vpinsrb_avx(auVar2,0x10,6);
    auVar2 = vpinsrb_avx(auVar2,0x11,7);
    auVar2 = vpinsrb_avx(auVar2,0x1a,8);
    auVar2 = vpinsrb_avx(auVar2,0x1b,9);
    auVar2 = vpinsrb_avx(auVar2,0x1c,10);
    auVar2 = vpinsrb_avx(auVar2,0x1d,0xb);
    auVar2 = vpinsrb_avx(auVar2,0x1e,0xc);
    auVar2 = vpinsrb_avx(auVar2,0x1f,0xd);
    auVar2 = vpinsrb_avx(auVar2,0x18,0xe);
    auVar2 = vpinsrb_avx(auVar2,0x19,0xf);
    auVar3 = vpinsrb_avx(ZEXT116(2),3,1);
    auVar3 = vpinsrb_avx(auVar3,4,2);
    auVar3 = vpinsrb_avx(auVar3,5,3);
    auVar3 = vpinsrb_avx(auVar3,6,4);
    auVar3 = vpinsrb_avx(auVar3,7,5);
    auVar3 = vpinsrb_avx(auVar3,0,6);
    auVar3 = vpinsrb_avx(auVar3,1,7);
    auVar3 = vpinsrb_avx(auVar3,10,8);
    auVar3 = vpinsrb_avx(auVar3,0xb,9);
    auVar3 = vpinsrb_avx(auVar3,0xc,10);
    auVar3 = vpinsrb_avx(auVar3,0xd,0xb);
    auVar3 = vpinsrb_avx(auVar3,0xe,0xc);
    auVar3 = vpinsrb_avx(auVar3,0xf,0xd);
    auVar3 = vpinsrb_avx(auVar3,8,0xe);
    auVar3 = vpinsrb_avx(auVar3,9,0xf);
    auVar43._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
    auVar43._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
    local_a0._16_8_ = auVar43._16_8_;
    local_a0._24_8_ = auVar43._24_8_;
    auVar11._16_8_ = local_a0._16_8_;
    auVar11._0_16_ = auVar43._0_16_;
    auVar11._24_8_ = local_a0._24_8_;
    auVar4 = vpshufb_avx2(*pauVar28,auVar11);
    *(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0x1c) * 0x20) = auVar4;
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 + 0x10) * 0x20);
    uVar35 = *puVar27;
    uVar44 = puVar27[1];
    uVar45 = puVar27[2];
    uVar46 = puVar27[3];
    x_29[0]._1_1_ = in_stack_ffffffffffffe079;
    x_29[0]._0_1_ = in_stack_ffffffffffffe078;
    x_29[0]._2_1_ = in_stack_ffffffffffffe07a;
    x_29[0]._3_1_ = in_stack_ffffffffffffe07b;
    x_29[0]._4_1_ = in_stack_ffffffffffffe07c;
    x_29[0]._5_1_ = in_stack_ffffffffffffe07d;
    x_29[0]._6_1_ = in_stack_ffffffffffffe07e;
    x_29[0]._7_1_ = in_stack_ffffffffffffe07f;
    x_29[1]._0_1_ = in_stack_ffffffffffffe080;
    x_29[1]._1_1_ = in_stack_ffffffffffffe081;
    x_29[1]._2_1_ = in_stack_ffffffffffffe082;
    x_29[1]._3_1_ = in_stack_ffffffffffffe083;
    x_29[1]._4_1_ = in_stack_ffffffffffffe084;
    x_29[1]._5_1_ = in_stack_ffffffffffffe085;
    x_29[1]._6_1_ = in_stack_ffffffffffffe086;
    x_29[1]._7_1_ = in_stack_ffffffffffffe087;
    x_29[2]._0_1_ = in_stack_ffffffffffffe088;
    x_29[2]._1_1_ = in_stack_ffffffffffffe089;
    x_29[2]._2_1_ = in_stack_ffffffffffffe08a;
    x_29[2]._3_1_ = in_stack_ffffffffffffe08b;
    x_29[2]._4_1_ = in_stack_ffffffffffffe08c;
    x_29[2]._5_1_ = in_stack_ffffffffffffe08d;
    x_29[2]._6_1_ = in_stack_ffffffffffffe08e;
    x_29[2]._7_1_ = in_stack_ffffffffffffe08f;
    x_29[3]._0_1_ = in_stack_ffffffffffffe090;
    x_29[3]._1_1_ = in_stack_ffffffffffffe091;
    x_29[3]._2_1_ = in_stack_ffffffffffffe092;
    x_29[3]._3_1_ = in_stack_ffffffffffffe093;
    x_29[3]._4_1_ = in_stack_ffffffffffffe094;
    x_29[3]._5_1_ = in_stack_ffffffffffffe095;
    x_29[3]._6_1_ = in_stack_ffffffffffffe096;
    x_29[3]._7_1_ = in_stack_ffffffffffffe097;
    y_29[1]._0_1_ = 9;
    y_29[0] = 0x1213141516171011;
    y_29[1]._1_1_ = 8;
    y_29[1]._2_1_ = 2;
    y_29[1]._3_1_ = 0x19;
    y_29[1]._4_1_ = 0x18;
    y_29[1]._5_1_ = 0x1f;
    y_29[1]._6_1_ = 0x1e;
    y_29[1]._7_1_ = 0x1d;
    y_29[2]._0_1_ = 0x1c;
    y_29[2]._1_1_ = 0x1b;
    y_29[2]._2_1_ = 0x1a;
    y_29[2]._3_1_ = 0x11;
    y_29[2]._4_1_ = 0x10;
    y_29[2]._5_1_ = 0x17;
    y_29[2]._6_1_ = 0x16;
    y_29[2]._7_1_ = 0x15;
    y_29[3]._0_1_ = 0x14;
    y_29[3]._1_1_ = 0x13;
    y_29[3]._2_1_ = 0x12;
    y_29[3]._3_1_ = 9;
    y_29[3]._4_1_ = 8;
    y_29[3]._5_1_ = 2;
    y_29[3]._6_1_ = in_stack_ffffffffffffe076;
    y_29[3]._7_1_ = in_stack_ffffffffffffe077;
    local_a0 = auVar43;
    local_ea0 = auVar43._0_16_;
    auStack_e90 = auVar43._16_16_;
    f(x_29,y_29);
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 + 0x10) * 0x20);
    *puVar27 = uVar35;
    puVar27[1] = uVar44;
    puVar27[2] = uVar45;
    puVar27[3] = uVar46;
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 + 0x14) * 0x20);
    uVar35 = *puVar27;
    uVar44 = puVar27[1];
    uVar45 = puVar27[2];
    uVar46 = puVar27[3];
    x_30[0]._1_1_ = in_stack_ffffffffffffe079;
    x_30[0]._0_1_ = in_stack_ffffffffffffe078;
    x_30[0]._2_1_ = in_stack_ffffffffffffe07a;
    x_30[0]._3_1_ = in_stack_ffffffffffffe07b;
    x_30[0]._4_1_ = in_stack_ffffffffffffe07c;
    x_30[0]._5_1_ = in_stack_ffffffffffffe07d;
    x_30[0]._6_1_ = in_stack_ffffffffffffe07e;
    x_30[0]._7_1_ = in_stack_ffffffffffffe07f;
    x_30[1]._0_1_ = in_stack_ffffffffffffe080;
    x_30[1]._1_1_ = in_stack_ffffffffffffe081;
    x_30[1]._2_1_ = in_stack_ffffffffffffe082;
    x_30[1]._3_1_ = in_stack_ffffffffffffe083;
    x_30[1]._4_1_ = in_stack_ffffffffffffe084;
    x_30[1]._5_1_ = in_stack_ffffffffffffe085;
    x_30[1]._6_1_ = in_stack_ffffffffffffe086;
    x_30[1]._7_1_ = in_stack_ffffffffffffe087;
    x_30[2]._0_1_ = in_stack_ffffffffffffe088;
    x_30[2]._1_1_ = in_stack_ffffffffffffe089;
    x_30[2]._2_1_ = in_stack_ffffffffffffe08a;
    x_30[2]._3_1_ = in_stack_ffffffffffffe08b;
    x_30[2]._4_1_ = in_stack_ffffffffffffe08c;
    x_30[2]._5_1_ = in_stack_ffffffffffffe08d;
    x_30[2]._6_1_ = in_stack_ffffffffffffe08e;
    x_30[2]._7_1_ = in_stack_ffffffffffffe08f;
    x_30[3]._0_1_ = in_stack_ffffffffffffe090;
    x_30[3]._1_1_ = in_stack_ffffffffffffe091;
    x_30[3]._2_1_ = in_stack_ffffffffffffe092;
    x_30[3]._3_1_ = in_stack_ffffffffffffe093;
    x_30[3]._4_1_ = in_stack_ffffffffffffe094;
    x_30[3]._5_1_ = in_stack_ffffffffffffe095;
    x_30[3]._6_1_ = in_stack_ffffffffffffe096;
    x_30[3]._7_1_ = in_stack_ffffffffffffe097;
    y_30[0]._1_1_ = in_stack_ffffffffffffe059;
    y_30[0]._0_1_ = in_stack_ffffffffffffe058;
    y_30[0]._2_1_ = in_stack_ffffffffffffe05a;
    y_30[0]._3_1_ = in_stack_ffffffffffffe05b;
    y_30[0]._4_1_ = in_stack_ffffffffffffe05c;
    y_30[0]._5_1_ = in_stack_ffffffffffffe05d;
    y_30[0]._6_1_ = in_stack_ffffffffffffe05e;
    y_30[0]._7_1_ = in_stack_ffffffffffffe05f;
    y_30[1]._0_1_ = in_stack_ffffffffffffe060;
    y_30[1]._1_1_ = in_stack_ffffffffffffe061;
    y_30[1]._2_1_ = in_stack_ffffffffffffe062;
    y_30[1]._3_1_ = in_stack_ffffffffffffe063;
    y_30[1]._4_1_ = in_stack_ffffffffffffe064;
    y_30[1]._5_1_ = in_stack_ffffffffffffe065;
    y_30[1]._6_1_ = in_stack_ffffffffffffe066;
    y_30[1]._7_1_ = in_stack_ffffffffffffe067;
    y_30[2]._0_1_ = in_stack_ffffffffffffe068;
    y_30[2]._1_1_ = in_stack_ffffffffffffe069;
    y_30[2]._2_1_ = in_stack_ffffffffffffe06a;
    y_30[2]._3_1_ = in_stack_ffffffffffffe06b;
    y_30[2]._4_1_ = in_stack_ffffffffffffe06c;
    y_30[2]._5_1_ = in_stack_ffffffffffffe06d;
    y_30[2]._6_1_ = in_stack_ffffffffffffe06e;
    y_30[2]._7_1_ = in_stack_ffffffffffffe06f;
    y_30[3]._0_1_ = in_stack_ffffffffffffe070;
    y_30[3]._1_1_ = in_stack_ffffffffffffe071;
    y_30[3]._2_1_ = in_stack_ffffffffffffe072;
    y_30[3]._3_1_ = in_stack_ffffffffffffe073;
    y_30[3]._4_1_ = in_stack_ffffffffffffe074;
    y_30[3]._5_1_ = in_stack_ffffffffffffe075;
    y_30[3]._6_1_ = in_stack_ffffffffffffe076;
    y_30[3]._7_1_ = in_stack_ffffffffffffe077;
    f(x_30,y_30);
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 + 0x14) * 0x20);
    *puVar27 = uVar35;
    puVar27[1] = uVar44;
    puVar27[2] = uVar45;
    puVar27[3] = uVar46;
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 8) * 0x20);
    local_18a0 = *puVar26;
    uStack_1898 = puVar26[1];
    uStack_1890 = puVar26[2];
    uStack_1888 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 0x10) * 0x20);
    local_18c0 = *puVar26;
    uStack_18b8 = puVar26[1];
    uStack_18b0 = puVar26[2];
    uStack_18a8 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 8) * 0x20);
    *puVar26 = local_18a0 ^ local_18c0;
    puVar26[1] = uStack_1898 ^ uStack_18b8;
    puVar26[2] = uStack_1890 ^ uStack_18b0;
    puVar26[3] = uStack_1888 ^ uStack_18a8;
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 0xc) * 0x20);
    local_18e0 = *puVar26;
    uStack_18d8 = puVar26[1];
    uStack_18d0 = puVar26[2];
    uStack_18c8 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 0x14) * 0x20);
    local_1900 = *puVar26;
    uStack_18f8 = puVar26[1];
    uStack_18f0 = puVar26[2];
    uStack_18e8 = puVar26[3];
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 0xc) * 0x20);
    *puVar26 = local_18e0 ^ local_1900;
    puVar26[1] = uStack_18d8 ^ uStack_18f8;
    puVar26[2] = uStack_18d0 ^ uStack_18f0;
    puVar26[3] = uStack_18c8 ^ uStack_18e8;
    pauVar28 = (undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 8) * 0x20);
    local_840 = *(undefined8 *)*pauVar28;
    uStack_838 = *(undefined8 *)(*pauVar28 + 8);
    uStack_830 = *(undefined8 *)(*pauVar28 + 0x10);
    uStack_828 = *(undefined8 *)(*pauVar28 + 0x18);
    local_844 = 0x3f;
    local_1920 = vpsrlq_avx2(*pauVar28,ZEXT416(0x3f));
    pauVar28 = (undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 8) * 0x20);
    local_640 = *(undefined8 *)*pauVar28;
    uStack_638 = *(undefined8 *)(*pauVar28 + 8);
    uStack_630 = *(undefined8 *)(*pauVar28 + 0x10);
    uStack_628 = *(undefined8 *)(*pauVar28 + 0x18);
    pauVar29 = (undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 8) * 0x20);
    local_660 = *(undefined8 *)*pauVar29;
    uStack_658 = *(undefined8 *)(*pauVar29 + 8);
    uStack_650 = *(undefined8 *)(*pauVar29 + 0x10);
    uStack_648 = *(undefined8 *)(*pauVar29 + 0x18);
    local_1940 = vpaddq_avx2(*pauVar28,*pauVar29);
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 8) * 0x20);
    *puVar26 = local_1920._0_8_ ^ local_1940._0_8_;
    puVar26[1] = local_1920._8_8_ ^ local_1940._8_8_;
    puVar26[2] = local_1920._16_8_ ^ local_1940._16_8_;
    puVar26[3] = local_1920._24_8_ ^ local_1940._24_8_;
    pauVar28 = (undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0xc) * 0x20);
    local_880 = *(undefined8 *)*pauVar28;
    uStack_878 = *(undefined8 *)(*pauVar28 + 8);
    uStack_870 = *(undefined8 *)(*pauVar28 + 0x10);
    uStack_868 = *(undefined8 *)(*pauVar28 + 0x18);
    local_884 = 0x3f;
    local_1960 = vpsrlq_avx2(*pauVar28,ZEXT416(0x3f));
    pauVar28 = (undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0xc) * 0x20);
    local_680 = *(undefined8 *)*pauVar28;
    uStack_678 = *(undefined8 *)(*pauVar28 + 8);
    uStack_670 = *(undefined8 *)(*pauVar28 + 0x10);
    uStack_668 = *(undefined8 *)(*pauVar28 + 0x18);
    pauVar29 = (undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0xc) * 0x20);
    local_6a0 = *(undefined8 *)*pauVar29;
    uStack_698 = *(undefined8 *)(*pauVar29 + 8);
    uStack_690 = *(undefined8 *)(*pauVar29 + 0x10);
    uStack_688 = *(undefined8 *)(*pauVar29 + 0x18);
    local_1980 = vpaddq_avx2(*pauVar28,*pauVar29);
    puVar26 = (ulong *)(local_19c8 + (ulong)(local_1de4 + 0xc) * 0x20);
    *puVar26 = local_1960._0_8_ ^ local_1980._0_8_;
    puVar26[1] = local_1960._8_8_ ^ local_1980._8_8_;
    puVar26[2] = local_1960._16_8_ ^ local_1980._16_8_;
    puVar26[3] = local_1960._24_8_ ^ local_1980._24_8_;
    auVar4 = vpblendd_avx2(*(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 8) * 0x20),
                           *(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0xc) * 0x20),
                           0xcc);
    auVar5 = vpblendd_avx2(*(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0xc) * 0x20),
                           *(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 8) * 0x20),0xcc)
    ;
    auVar4 = vpshufd_avx2(auVar4,0x4e);
    *(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 8) * 0x20) = auVar4;
    auVar4 = vpshufd_avx2(auVar5,0x4e);
    *(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0xc) * 0x20) = auVar4;
    pauVar1 = (undefined1 (*) [24])(local_19c8 + (ulong)(local_1de4 + 0x10) * 0x20);
    auVar25 = *pauVar1;
    uVar35 = *(undefined8 *)pauVar1[1];
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 + 0x14) * 0x20);
    uVar44 = puVar27[1];
    uVar45 = puVar27[2];
    uVar46 = puVar27[3];
    puVar34 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 + 0x10) * 0x20);
    *puVar34 = *puVar27;
    puVar34[1] = uVar44;
    puVar34[2] = uVar45;
    puVar34[3] = uVar46;
    local_1e60 = auVar25._0_8_;
    uStack_1e58 = auVar25._8_8_;
    uStack_1e50 = auVar25._16_8_;
    puVar27 = (undefined8 *)(local_19c8 + (ulong)(local_1de4 + 0x14) * 0x20);
    *puVar27 = local_1e60;
    puVar27[1] = uStack_1e58;
    puVar27[2] = uStack_1e50;
    puVar27[3] = uVar35;
    auVar4 = vpblendd_avx2(*(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0x18) * 0x20),
                           *(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0x1c) * 0x20),
                           0xcc);
    auVar5 = vpblendd_avx2(*(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0x1c) * 0x20),
                           *(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0x18) * 0x20),
                           0xcc);
    auVar4 = vpshufd_avx2(auVar4,0x4e);
    *(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0x1c) * 0x20) = auVar4;
    auVar4 = vpshufd_avx2(auVar5,0x4e);
    *(undefined1 (*) [32])(local_19c8 + (ulong)(local_1de4 + 0x18) * 0x20) = auVar4;
  }
  for (local_1de4 = 0; local_1de4 < 0x20; local_1de4 = local_1de4 + 1) {
    puVar26 = (ulong *)(local_19c8 + (ulong)local_1de4 * 0x20);
    uVar31 = puVar26[1];
    uVar6 = puVar26[2];
    uVar7 = puVar26[3];
    uVar33 = (ulong)local_1de4;
    uVar8 = local_1de0[uVar33 * 4 + 1];
    uVar9 = local_1de0[uVar33 * 4 + 2];
    uVar10 = local_1de0[uVar33 * 4 + 3];
    puVar30 = (ulong *)(local_19c8 + (ulong)local_1de4 * 0x20);
    *puVar30 = *puVar26 ^ local_1de0[uVar33 * 4];
    puVar30[1] = uVar31 ^ uVar8;
    puVar30[2] = uVar6 ^ uVar9;
    puVar30[3] = uVar7 ^ uVar10;
    puVar27 = (undefined8 *)(local_1de0[0x81] + (ulong)local_1de4 * 0x20);
    puVar34 = (undefined8 *)(local_19c8 + (ulong)local_1de4 * 0x20);
    uVar35 = puVar34[1];
    uVar44 = puVar34[2];
    uVar45 = puVar34[3];
    *puVar27 = *puVar34;
    puVar27[1] = uVar35;
    puVar27[2] = uVar44;
    puVar27[3] = uVar45;
  }
  return;
}

Assistant:

static void fill_block(const block *prev_block, const block *ref_block,
                       block *next_block, int with_xor)
{
    block blockR, block_tmp;

    copy_block(&blockR, ref_block);
    xor_block(&blockR, prev_block);
    copy_block(&block_tmp, &blockR);
    if (with_xor) {
        xor_block(&block_tmp, next_block);
    }

    /* Apply Blake2 on columns of 64-bit words: (0,1,...,15) , then
    (16,17,..31)... finally (112,113,...127) */
    BLAKE2_ROUND_NOMSG1(blockR.v + 0 * 16);
    BLAKE2_ROUND_NOMSG1(blockR.v + 1 * 16);
    BLAKE2_ROUND_NOMSG1(blockR.v + 2 * 16);
    BLAKE2_ROUND_NOMSG1(blockR.v + 3 * 16);
    BLAKE2_ROUND_NOMSG1(blockR.v + 4 * 16);
    BLAKE2_ROUND_NOMSG1(blockR.v + 5 * 16);
    BLAKE2_ROUND_NOMSG1(blockR.v + 6 * 16);
    BLAKE2_ROUND_NOMSG1(blockR.v + 7 * 16);

    /* Apply Blake2 on rows of 64-bit words: (0,1,16,17,...112,113), then
    (2,3,18,19,...,114,115).. finally (14,15,30,31,...,126,127) */
    BLAKE2_ROUND_NOMSG2(blockR.v + 0 * 2);
    BLAKE2_ROUND_NOMSG2(blockR.v + 1 * 2);
    BLAKE2_ROUND_NOMSG2(blockR.v + 2 * 2);
    BLAKE2_ROUND_NOMSG2(blockR.v + 3 * 2);
    BLAKE2_ROUND_NOMSG2(blockR.v + 4 * 2);
    BLAKE2_ROUND_NOMSG2(blockR.v + 5 * 2);
    BLAKE2_ROUND_NOMSG2(blockR.v + 6 * 2);
    BLAKE2_ROUND_NOMSG2(blockR.v + 7 * 2);

    copy_block(next_block, &block_tmp);
    xor_block(next_block, &blockR);
}